

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [28];
  undefined4 uVar13;
  Primitive PVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  __int_type_conflict _Var18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  uint uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  bool bVar109;
  bool bVar110;
  bool bVar111;
  bool bVar112;
  bool bVar113;
  bool bVar114;
  bool bVar115;
  bool bVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [28];
  undefined1 auVar129 [12];
  undefined1 auVar130 [28];
  undefined1 auVar131 [28];
  undefined1 auVar132 [28];
  undefined1 auVar133 [28];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [24];
  uint uVar137;
  uint uVar138;
  ulong uVar139;
  uint uVar140;
  ulong uVar141;
  long lVar142;
  long lVar143;
  Geometry *pGVar144;
  float fVar145;
  float fVar165;
  float fVar168;
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar146;
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar151 [16];
  undefined1 auVar156 [32];
  undefined1 auVar152 [16];
  float fVar147;
  float fVar167;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  float fVar174;
  float fVar193;
  float fVar194;
  vint4 bi;
  undefined1 auVar180 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar184 [32];
  undefined1 auVar179 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar197;
  float fVar210;
  float fVar212;
  vint4 bi_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar198;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar208 [32];
  float fVar216;
  undefined1 auVar209 [32];
  float fVar217;
  float fVar230;
  float fVar232;
  vint4 ai_1;
  undefined1 auVar219 [16];
  float fVar233;
  undefined1 auVar220 [16];
  float fVar218;
  float fVar231;
  float fVar235;
  undefined1 auVar222 [16];
  undefined1 auVar221 [16];
  float fVar236;
  float fVar237;
  float fVar239;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar234;
  float fVar238;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar253;
  float fVar256;
  vint4 ai_2;
  undefined1 auVar243 [16];
  float fVar258;
  undefined1 auVar244 [16];
  float fVar254;
  undefined1 auVar246 [16];
  float fVar255;
  float fVar257;
  float fVar259;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  float fVar260;
  float fVar270;
  float fVar272;
  undefined1 auVar262 [16];
  float fVar261;
  float fVar271;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar279;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar280;
  float fVar287;
  float fVar288;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar289;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar290;
  float fVar291;
  undefined1 auVar286 [32];
  vint4 ai;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  float fVar302;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar307 [32];
  float fVar315;
  float fVar321;
  float fVar322;
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  float fVar323;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar324;
  float fVar332;
  float fVar334;
  undefined1 auVar326 [16];
  float fVar325;
  float fVar333;
  float fVar335;
  float fVar336;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  float fVar337;
  float fVar342;
  float fVar344;
  undefined1 auVar339 [16];
  float fVar345;
  float fVar346;
  float fVar348;
  float fVar349;
  undefined1 auVar340 [32];
  float fVar338;
  float fVar343;
  float fVar347;
  float fVar350;
  undefined1 auVar341 [32];
  float fVar351;
  float fVar359;
  undefined1 auVar352 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar360;
  float fVar364;
  float fVar365;
  undefined1 auVar361 [16];
  float fVar366;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar380;
  float fVar381;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  Precalculations *local_848;
  undefined1 local_840 [32];
  uint local_820;
  undefined4 uStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  RTCFilterFunctionNArguments local_7f0;
  undefined8 local_7c0;
  undefined1 auStack_7b8 [8];
  undefined1 auStack_7b0 [8];
  float fStack_7a8;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  undefined1 auStack_790 [8];
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined1 auStack_770 [8];
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  undefined1 auStack_750 [16];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 (*local_708) [16];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_670 [8];
  undefined8 uStack_668;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 local_650 [8];
  undefined8 uStack_648;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 auStack_630 [8];
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  LinearSpace3fa *local_550;
  Primitive *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  RTCHitN local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  uint local_300;
  uint local_2fc;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2a0 [32];
  float local_280 [4];
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar245 [16];
  undefined1 auVar353 [16];
  undefined1 auVar370 [16];
  undefined1 auVar382 [16];
  
  PVar14 = prim[1];
  uVar139 = (ulong)(byte)PVar14;
  lVar22 = uVar139 * 0x25;
  fVar338 = *(float *)(prim + lVar22 + 0x12);
  auVar180 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar180 = vinsertps_avx(auVar180,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar204 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar180 = vsubps_avx(auVar180,*(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar175._0_4_ = fVar338 * auVar180._0_4_;
  auVar175._4_4_ = fVar338 * auVar180._4_4_;
  auVar175._8_4_ = fVar338 * auVar180._8_4_;
  auVar175._12_4_ = fVar338 * auVar180._12_4_;
  auVar292._0_4_ = fVar338 * auVar204._0_4_;
  auVar292._4_4_ = fVar338 * auVar204._4_4_;
  auVar292._8_4_ = fVar338 * auVar204._8_4_;
  auVar292._12_4_ = fVar338 * auVar204._12_4_;
  auVar180 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 4 + 6)));
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 5 + 6)));
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 6 + 6)));
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0xf + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + 6)));
  auVar222 = vcvtdq2ps_avx(auVar222);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar139 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1a + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1b + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vshufps_avx(auVar292,auVar292,0);
  auVar29 = vshufps_avx(auVar292,auVar292,0x55);
  auVar30 = vshufps_avx(auVar292,auVar292,0xaa);
  fVar338 = auVar30._0_4_;
  fVar231 = auVar30._4_4_;
  fVar343 = auVar30._8_4_;
  fVar235 = auVar30._12_4_;
  fVar240 = auVar29._0_4_;
  fVar253 = auVar29._4_4_;
  fVar256 = auVar29._8_4_;
  fVar258 = auVar29._12_4_;
  fVar217 = auVar28._0_4_;
  fVar230 = auVar28._4_4_;
  fVar232 = auVar28._8_4_;
  fVar233 = auVar28._12_4_;
  auVar352._0_4_ = fVar217 * auVar180._0_4_ + fVar240 * auVar204._0_4_ + fVar338 * auVar205._0_4_;
  auVar352._4_4_ = fVar230 * auVar180._4_4_ + fVar253 * auVar204._4_4_ + fVar231 * auVar205._4_4_;
  auVar352._8_4_ = fVar232 * auVar180._8_4_ + fVar256 * auVar204._8_4_ + fVar343 * auVar205._8_4_;
  auVar352._12_4_ =
       fVar233 * auVar180._12_4_ + fVar258 * auVar204._12_4_ + fVar235 * auVar205._12_4_;
  auVar361._0_4_ = fVar217 * auVar222._0_4_ + fVar240 * auVar23._0_4_ + auVar24._0_4_ * fVar338;
  auVar361._4_4_ = fVar230 * auVar222._4_4_ + fVar253 * auVar23._4_4_ + auVar24._4_4_ * fVar231;
  auVar361._8_4_ = fVar232 * auVar222._8_4_ + fVar256 * auVar23._8_4_ + auVar24._8_4_ * fVar343;
  auVar361._12_4_ = fVar233 * auVar222._12_4_ + fVar258 * auVar23._12_4_ + auVar24._12_4_ * fVar235;
  auVar293._0_4_ = fVar217 * auVar25._0_4_ + fVar240 * auVar26._0_4_ + auVar27._0_4_ * fVar338;
  auVar293._4_4_ = fVar230 * auVar25._4_4_ + fVar253 * auVar26._4_4_ + auVar27._4_4_ * fVar231;
  auVar293._8_4_ = fVar232 * auVar25._8_4_ + fVar256 * auVar26._8_4_ + auVar27._8_4_ * fVar343;
  auVar293._12_4_ = fVar233 * auVar25._12_4_ + fVar258 * auVar26._12_4_ + auVar27._12_4_ * fVar235;
  auVar28 = vshufps_avx(auVar175,auVar175,0);
  auVar29 = vshufps_avx(auVar175,auVar175,0x55);
  auVar30 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar338 = auVar30._0_4_;
  fVar231 = auVar30._4_4_;
  fVar343 = auVar30._8_4_;
  fVar235 = auVar30._12_4_;
  fVar240 = auVar29._0_4_;
  fVar253 = auVar29._4_4_;
  fVar256 = auVar29._8_4_;
  fVar258 = auVar29._12_4_;
  fVar217 = auVar28._0_4_;
  fVar230 = auVar28._4_4_;
  fVar232 = auVar28._8_4_;
  fVar233 = auVar28._12_4_;
  auVar176._0_4_ = fVar217 * auVar180._0_4_ + fVar240 * auVar204._0_4_ + fVar338 * auVar205._0_4_;
  auVar176._4_4_ = fVar230 * auVar180._4_4_ + fVar253 * auVar204._4_4_ + fVar231 * auVar205._4_4_;
  auVar176._8_4_ = fVar232 * auVar180._8_4_ + fVar256 * auVar204._8_4_ + fVar343 * auVar205._8_4_;
  auVar176._12_4_ =
       fVar233 * auVar180._12_4_ + fVar258 * auVar204._12_4_ + fVar235 * auVar205._12_4_;
  auVar148._0_4_ = fVar217 * auVar222._0_4_ + auVar24._0_4_ * fVar338 + fVar240 * auVar23._0_4_;
  auVar148._4_4_ = fVar230 * auVar222._4_4_ + auVar24._4_4_ * fVar231 + fVar253 * auVar23._4_4_;
  auVar148._8_4_ = fVar232 * auVar222._8_4_ + auVar24._8_4_ * fVar343 + fVar256 * auVar23._8_4_;
  auVar148._12_4_ = fVar233 * auVar222._12_4_ + auVar24._12_4_ * fVar235 + fVar258 * auVar23._12_4_;
  auVar303._8_4_ = 0x7fffffff;
  auVar303._0_8_ = 0x7fffffff7fffffff;
  auVar303._12_4_ = 0x7fffffff;
  auVar180 = vandps_avx(auVar352,auVar303);
  auVar243._8_4_ = 0x219392ef;
  auVar243._0_8_ = 0x219392ef219392ef;
  auVar243._12_4_ = 0x219392ef;
  auVar180 = vcmpps_avx(auVar180,auVar243,1);
  auVar204 = vblendvps_avx(auVar352,auVar243,auVar180);
  auVar180 = vandps_avx(auVar361,auVar303);
  auVar180 = vcmpps_avx(auVar180,auVar243,1);
  auVar205 = vblendvps_avx(auVar361,auVar243,auVar180);
  auVar180 = vandps_avx(auVar303,auVar293);
  auVar180 = vcmpps_avx(auVar180,auVar243,1);
  auVar180 = vblendvps_avx(auVar293,auVar243,auVar180);
  auVar199._0_4_ = fVar217 * auVar25._0_4_ + fVar240 * auVar26._0_4_ + auVar27._0_4_ * fVar338;
  auVar199._4_4_ = fVar230 * auVar25._4_4_ + fVar253 * auVar26._4_4_ + auVar27._4_4_ * fVar231;
  auVar199._8_4_ = fVar232 * auVar25._8_4_ + fVar256 * auVar26._8_4_ + auVar27._8_4_ * fVar343;
  auVar199._12_4_ = fVar233 * auVar25._12_4_ + fVar258 * auVar26._12_4_ + auVar27._12_4_ * fVar235;
  auVar222 = vrcpps_avx(auVar204);
  fVar217 = auVar222._0_4_;
  auVar219._0_4_ = fVar217 * auVar204._0_4_;
  fVar230 = auVar222._4_4_;
  auVar219._4_4_ = fVar230 * auVar204._4_4_;
  fVar232 = auVar222._8_4_;
  auVar219._8_4_ = fVar232 * auVar204._8_4_;
  fVar233 = auVar222._12_4_;
  auVar219._12_4_ = fVar233 * auVar204._12_4_;
  auVar281._8_4_ = 0x3f800000;
  auVar281._0_8_ = &DAT_3f8000003f800000;
  auVar281._12_4_ = 0x3f800000;
  auVar204 = vsubps_avx(auVar281,auVar219);
  fVar217 = fVar217 + fVar217 * auVar204._0_4_;
  fVar230 = fVar230 + fVar230 * auVar204._4_4_;
  fVar232 = fVar232 + fVar232 * auVar204._8_4_;
  fVar233 = fVar233 + fVar233 * auVar204._12_4_;
  auVar204 = vrcpps_avx(auVar205);
  fVar240 = auVar204._0_4_;
  auVar262._0_4_ = fVar240 * auVar205._0_4_;
  fVar253 = auVar204._4_4_;
  auVar262._4_4_ = fVar253 * auVar205._4_4_;
  fVar256 = auVar204._8_4_;
  auVar262._8_4_ = fVar256 * auVar205._8_4_;
  fVar258 = auVar204._12_4_;
  auVar262._12_4_ = fVar258 * auVar205._12_4_;
  auVar204 = vsubps_avx(auVar281,auVar262);
  fVar240 = fVar240 + fVar240 * auVar204._0_4_;
  fVar253 = fVar253 + fVar253 * auVar204._4_4_;
  fVar256 = fVar256 + fVar256 * auVar204._8_4_;
  fVar258 = fVar258 + fVar258 * auVar204._12_4_;
  auVar204 = vrcpps_avx(auVar180);
  fVar260 = auVar204._0_4_;
  auVar294._0_4_ = fVar260 * auVar180._0_4_;
  fVar270 = auVar204._4_4_;
  auVar294._4_4_ = fVar270 * auVar180._4_4_;
  fVar272 = auVar204._8_4_;
  auVar294._8_4_ = fVar272 * auVar180._8_4_;
  fVar274 = auVar204._12_4_;
  auVar294._12_4_ = fVar274 * auVar180._12_4_;
  auVar180 = vsubps_avx(auVar281,auVar294);
  fVar260 = fVar260 + fVar260 * auVar180._0_4_;
  fVar270 = fVar270 + fVar270 * auVar180._4_4_;
  fVar272 = fVar272 + fVar272 * auVar180._8_4_;
  fVar274 = fVar274 + fVar274 * auVar180._12_4_;
  auVar180 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
                           *(float *)(prim + lVar22 + 0x1a)));
  auVar205 = vshufps_avx(auVar180,auVar180,0);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar139 * 7 + 6);
  auVar180 = vpmovsxwd_avx(auVar180);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar139 * 0xb + 6);
  auVar204 = vpmovsxwd_avx(auVar204);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar222 = vsubps_avx(auVar204,auVar180);
  fVar338 = auVar205._0_4_;
  fVar231 = auVar205._4_4_;
  fVar343 = auVar205._8_4_;
  fVar235 = auVar205._12_4_;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar139 * 9 + 6);
  auVar204 = vpmovsxwd_avx(auVar205);
  auVar295._0_4_ = auVar222._0_4_ * fVar338 + auVar180._0_4_;
  auVar295._4_4_ = auVar222._4_4_ * fVar231 + auVar180._4_4_;
  auVar295._8_4_ = auVar222._8_4_ * fVar343 + auVar180._8_4_;
  auVar295._12_4_ = auVar222._12_4_ * fVar235 + auVar180._12_4_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar139 * 0xd + 6);
  auVar205 = vpmovsxwd_avx(auVar222);
  auVar180 = vcvtdq2ps_avx(auVar204);
  auVar204 = vcvtdq2ps_avx(auVar205);
  auVar204 = vsubps_avx(auVar204,auVar180);
  auVar304._0_4_ = auVar204._0_4_ * fVar338 + auVar180._0_4_;
  auVar304._4_4_ = auVar204._4_4_ * fVar231 + auVar180._4_4_;
  auVar304._8_4_ = auVar204._8_4_ * fVar343 + auVar180._8_4_;
  auVar304._12_4_ = auVar204._12_4_ * fVar235 + auVar180._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar139 * 0x12 + 6);
  auVar180 = vpmovsxwd_avx(auVar23);
  uVar141 = (ulong)(uint)((int)(uVar139 * 5) << 2);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar139 * 2 + uVar141 + 6);
  auVar204 = vpmovsxwd_avx(auVar24);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar204 = vsubps_avx(auVar204,auVar180);
  auVar316._0_4_ = auVar204._0_4_ * fVar338 + auVar180._0_4_;
  auVar316._4_4_ = auVar204._4_4_ * fVar231 + auVar180._4_4_;
  auVar316._8_4_ = auVar204._8_4_ * fVar343 + auVar180._8_4_;
  auVar316._12_4_ = auVar204._12_4_ * fVar235 + auVar180._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar141 + 6);
  auVar180 = vpmovsxwd_avx(auVar25);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar139 * 0x18 + 6);
  auVar204 = vpmovsxwd_avx(auVar26);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar205 = vsubps_avx(auVar204,auVar180);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar139 * 0x1d + 6);
  auVar204 = vpmovsxwd_avx(auVar27);
  auVar326._0_4_ = auVar205._0_4_ * fVar338 + auVar180._0_4_;
  auVar326._4_4_ = auVar205._4_4_ * fVar231 + auVar180._4_4_;
  auVar326._8_4_ = auVar205._8_4_ * fVar343 + auVar180._8_4_;
  auVar326._12_4_ = auVar205._12_4_ * fVar235 + auVar180._12_4_;
  auVar180 = vcvtdq2ps_avx(auVar204);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar139 + (ulong)(byte)PVar14 * 0x20 + 6);
  auVar204 = vpmovsxwd_avx(auVar28);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar204 = vsubps_avx(auVar204,auVar180);
  auVar339._0_4_ = auVar204._0_4_ * fVar338 + auVar180._0_4_;
  auVar339._4_4_ = auVar204._4_4_ * fVar231 + auVar180._4_4_;
  auVar339._8_4_ = auVar204._8_4_ * fVar343 + auVar180._8_4_;
  auVar339._12_4_ = auVar204._12_4_ * fVar235 + auVar180._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar139) + 6);
  auVar180 = vpmovsxwd_avx(auVar29);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar139 * 0x23 + 6);
  auVar204 = vpmovsxwd_avx(auVar30);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar204 = vsubps_avx(auVar204,auVar180);
  auVar282._0_4_ = auVar180._0_4_ + auVar204._0_4_ * fVar338;
  auVar282._4_4_ = auVar180._4_4_ + auVar204._4_4_ * fVar231;
  auVar282._8_4_ = auVar180._8_4_ + auVar204._8_4_ * fVar343;
  auVar282._12_4_ = auVar180._12_4_ + auVar204._12_4_ * fVar235;
  auVar180 = vsubps_avx(auVar295,auVar176);
  auVar296._0_4_ = fVar217 * auVar180._0_4_;
  auVar296._4_4_ = fVar230 * auVar180._4_4_;
  auVar296._8_4_ = fVar232 * auVar180._8_4_;
  auVar296._12_4_ = fVar233 * auVar180._12_4_;
  auVar180 = vsubps_avx(auVar304,auVar176);
  auVar177._0_4_ = fVar217 * auVar180._0_4_;
  auVar177._4_4_ = fVar230 * auVar180._4_4_;
  auVar177._8_4_ = fVar232 * auVar180._8_4_;
  auVar177._12_4_ = fVar233 * auVar180._12_4_;
  auVar180 = vsubps_avx(auVar316,auVar148);
  auVar220._0_4_ = fVar240 * auVar180._0_4_;
  auVar220._4_4_ = fVar253 * auVar180._4_4_;
  auVar220._8_4_ = fVar256 * auVar180._8_4_;
  auVar220._12_4_ = fVar258 * auVar180._12_4_;
  auVar180 = vsubps_avx(auVar326,auVar148);
  auVar149._0_4_ = fVar240 * auVar180._0_4_;
  auVar149._4_4_ = fVar253 * auVar180._4_4_;
  auVar149._8_4_ = fVar256 * auVar180._8_4_;
  auVar149._12_4_ = fVar258 * auVar180._12_4_;
  auVar180 = vsubps_avx(auVar339,auVar199);
  auVar244._0_4_ = fVar260 * auVar180._0_4_;
  auVar244._4_4_ = fVar270 * auVar180._4_4_;
  auVar244._8_4_ = fVar272 * auVar180._8_4_;
  auVar244._12_4_ = fVar274 * auVar180._12_4_;
  auVar180 = vsubps_avx(auVar282,auVar199);
  auVar200._0_4_ = fVar260 * auVar180._0_4_;
  auVar200._4_4_ = fVar270 * auVar180._4_4_;
  auVar200._8_4_ = fVar272 * auVar180._8_4_;
  auVar200._12_4_ = fVar274 * auVar180._12_4_;
  auVar180 = vpminsd_avx(auVar296,auVar177);
  auVar204 = vpminsd_avx(auVar220,auVar149);
  auVar180 = vmaxps_avx(auVar180,auVar204);
  auVar204 = vpminsd_avx(auVar244,auVar200);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar305._4_4_ = uVar13;
  auVar305._0_4_ = uVar13;
  auVar305._8_4_ = uVar13;
  auVar305._12_4_ = uVar13;
  auVar204 = vmaxps_avx(auVar204,auVar305);
  auVar180 = vmaxps_avx(auVar180,auVar204);
  local_130._0_4_ = auVar180._0_4_ * 0.99999964;
  local_130._4_4_ = auVar180._4_4_ * 0.99999964;
  local_130._8_4_ = auVar180._8_4_ * 0.99999964;
  local_130._12_4_ = auVar180._12_4_ * 0.99999964;
  auVar180 = vpmaxsd_avx(auVar296,auVar177);
  auVar204 = vpmaxsd_avx(auVar220,auVar149);
  auVar180 = vminps_avx(auVar180,auVar204);
  auVar204 = vpmaxsd_avx(auVar244,auVar200);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar201._4_4_ = uVar13;
  auVar201._0_4_ = uVar13;
  auVar201._8_4_ = uVar13;
  auVar201._12_4_ = uVar13;
  auVar204 = vminps_avx(auVar204,auVar201);
  auVar180 = vminps_avx(auVar180,auVar204);
  auVar150._0_4_ = auVar180._0_4_ * 1.0000004;
  auVar150._4_4_ = auVar180._4_4_ * 1.0000004;
  auVar150._8_4_ = auVar180._8_4_ * 1.0000004;
  auVar150._12_4_ = auVar180._12_4_ * 1.0000004;
  auVar180 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar204 = vpcmpgtd_avx(auVar180,_DAT_01ff0cf0);
  auVar180 = vcmpps_avx(local_130,auVar150,2);
  auVar180 = vandps_avx(auVar180,auVar204);
  uVar137 = vmovmskps_avx(auVar180);
  if (uVar137 != 0) {
    uVar137 = uVar137 & 0xff;
    local_540 = mm_lookupmask_ps._16_8_;
    uStack_538 = mm_lookupmask_ps._24_8_;
    uStack_530 = mm_lookupmask_ps._16_8_;
    uStack_528 = mm_lookupmask_ps._24_8_;
    local_550 = pre->ray_space + k;
    local_708 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_848 = pre;
    local_548 = prim;
    do {
      lVar22 = 0;
      if (uVar137 != 0) {
        for (; (uVar137 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      uVar140 = *(uint *)(local_548 + 2);
      uVar15 = *(uint *)(local_548 + lVar22 * 4 + 6);
      pGVar144 = (context->scene->geometries).items[uVar140].ptr;
      uVar139 = (ulong)*(uint *)(*(long *)&pGVar144->field_0x58 +
                                (ulong)uVar15 *
                                pGVar144[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar338 = (pGVar144->time_range).lower;
      fVar338 = pGVar144->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar338) /
                ((pGVar144->time_range).upper - fVar338));
      auVar180 = vroundss_avx(ZEXT416((uint)fVar338),ZEXT416((uint)fVar338),9);
      auVar180 = vminss_avx(auVar180,ZEXT416((uint)(pGVar144->fnumTimeSegments + -1.0)));
      auVar180 = vmaxss_avx(ZEXT816(0) << 0x20,auVar180);
      fVar338 = fVar338 - auVar180._0_4_;
      _Var18 = pGVar144[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar143 = (long)(int)auVar180._0_4_ * 0x38;
      lVar22 = *(long *)(_Var18 + 0x10 + lVar143);
      lVar142 = *(long *)(_Var18 + 0x38 + lVar143);
      lVar19 = *(long *)(_Var18 + 0x48 + lVar143);
      auVar180 = vshufps_avx(ZEXT416((uint)fVar338),ZEXT416((uint)fVar338),0);
      pfVar1 = (float *)(lVar142 + uVar139 * lVar19);
      fVar231 = auVar180._0_4_;
      fVar343 = auVar180._4_4_;
      fVar235 = auVar180._8_4_;
      fVar217 = auVar180._12_4_;
      pfVar2 = (float *)(lVar142 + (uVar139 + 1) * lVar19);
      pfVar3 = (float *)(lVar142 + (uVar139 + 2) * lVar19);
      pfVar4 = (float *)(lVar142 + lVar19 * (uVar139 + 3));
      lVar142 = *(long *)(_Var18 + lVar143);
      auVar180 = vshufps_avx(ZEXT416((uint)(1.0 - fVar338)),ZEXT416((uint)(1.0 - fVar338)),0);
      pfVar5 = (float *)(lVar142 + lVar22 * uVar139);
      fVar338 = auVar180._0_4_;
      fVar230 = auVar180._4_4_;
      fVar232 = auVar180._8_4_;
      fVar233 = auVar180._12_4_;
      pfVar6 = (float *)(lVar142 + lVar22 * (uVar139 + 1));
      pfVar7 = (float *)(lVar142 + lVar22 * (uVar139 + 2));
      pfVar8 = (float *)(lVar142 + lVar22 * (uVar139 + 3));
      uVar16 = (uint)pGVar144[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar22 = (long)(int)uVar16 * 0x44;
      fVar241 = fVar231 * *pfVar1 + fVar338 * *pfVar5;
      fVar254 = fVar343 * pfVar1[1] + fVar230 * pfVar5[1];
      auVar245._0_8_ = CONCAT44(fVar254,fVar241);
      auVar245._8_4_ = fVar235 * pfVar1[2] + fVar232 * pfVar5[2];
      auVar245._12_4_ = fVar217 * pfVar1[3] + fVar233 * pfVar5[3];
      fVar367 = fVar338 * *pfVar6 + fVar231 * *pfVar2;
      fVar373 = fVar230 * pfVar6[1] + fVar343 * pfVar2[1];
      auVar370._0_8_ = CONCAT44(fVar373,fVar367);
      auVar370._8_4_ = fVar232 * pfVar6[2] + fVar235 * pfVar2[2];
      auVar370._12_4_ = fVar233 * pfVar6[3] + fVar217 * pfVar2[3];
      fVar380 = fVar338 * *pfVar7 + fVar231 * *pfVar3;
      fVar387 = fVar230 * pfVar7[1] + fVar343 * pfVar3[1];
      auVar382._0_8_ = CONCAT44(fVar387,fVar380);
      auVar382._8_4_ = fVar232 * pfVar7[2] + fVar235 * pfVar3[2];
      auVar382._12_4_ = fVar233 * pfVar7[3] + fVar217 * pfVar3[3];
      fVar351 = fVar338 * *pfVar8 + fVar231 * *pfVar4;
      fVar359 = fVar230 * pfVar8[1] + fVar343 * pfVar4[1];
      auVar353._0_8_ = CONCAT44(fVar359,fVar351);
      auVar353._8_4_ = fVar232 * pfVar8[2] + fVar235 * pfVar4[2];
      auVar353._12_4_ = fVar233 * pfVar8[3] + fVar217 * pfVar4[3];
      auVar180 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar222 = vinsertps_avx(auVar180,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar205 = vsubps_avx(auVar245,auVar222);
      auVar180 = vshufps_avx(auVar205,auVar205,0);
      auVar204 = vshufps_avx(auVar205,auVar205,0x55);
      auVar205 = vshufps_avx(auVar205,auVar205,0xaa);
      fVar338 = (local_550->vx).field_0.m128[0];
      fVar231 = (local_550->vx).field_0.m128[1];
      fVar343 = (local_550->vx).field_0.m128[2];
      fVar235 = (local_550->vx).field_0.m128[3];
      fVar217 = (local_550->vy).field_0.m128[0];
      fVar230 = (local_550->vy).field_0.m128[1];
      fVar232 = (local_550->vy).field_0.m128[2];
      fVar233 = (local_550->vy).field_0.m128[3];
      fVar240 = (local_550->vz).field_0.m128[0];
      fVar253 = (local_550->vz).field_0.m128[1];
      fVar256 = (local_550->vz).field_0.m128[2];
      fVar258 = (local_550->vz).field_0.m128[3];
      auVar221._0_8_ =
           CONCAT44(auVar180._4_4_ * fVar231 + auVar204._4_4_ * fVar230 + fVar253 * auVar205._4_4_,
                    auVar180._0_4_ * fVar338 + auVar204._0_4_ * fVar217 + fVar240 * auVar205._0_4_);
      auVar221._8_4_ =
           auVar180._8_4_ * fVar343 + auVar204._8_4_ * fVar232 + fVar256 * auVar205._8_4_;
      auVar221._12_4_ =
           auVar180._12_4_ * fVar235 + auVar204._12_4_ * fVar233 + fVar258 * auVar205._12_4_;
      auVar180 = vblendps_avx(auVar221,auVar245,8);
      auVar23 = vsubps_avx(auVar370,auVar222);
      auVar204 = vshufps_avx(auVar23,auVar23,0);
      auVar205 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar297._0_4_ = auVar204._0_4_ * fVar338 + auVar205._0_4_ * fVar217 + fVar240 * auVar23._0_4_
      ;
      auVar297._4_4_ = auVar204._4_4_ * fVar231 + auVar205._4_4_ * fVar230 + fVar253 * auVar23._4_4_
      ;
      auVar297._8_4_ = auVar204._8_4_ * fVar343 + auVar205._8_4_ * fVar232 + fVar256 * auVar23._8_4_
      ;
      auVar297._12_4_ =
           auVar204._12_4_ * fVar235 + auVar205._12_4_ * fVar233 + fVar258 * auVar23._12_4_;
      auVar204 = vblendps_avx(auVar297,auVar370,8);
      auVar24 = vsubps_avx(auVar382,auVar222);
      auVar205 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar306._0_4_ = auVar205._0_4_ * fVar338 + auVar23._0_4_ * fVar217 + auVar24._0_4_ * fVar240;
      auVar306._4_4_ = auVar205._4_4_ * fVar231 + auVar23._4_4_ * fVar230 + auVar24._4_4_ * fVar253;
      auVar306._8_4_ = auVar205._8_4_ * fVar343 + auVar23._8_4_ * fVar232 + auVar24._8_4_ * fVar256;
      auVar306._12_4_ =
           auVar205._12_4_ * fVar235 + auVar23._12_4_ * fVar233 + auVar24._12_4_ * fVar258;
      auVar205 = vblendps_avx(auVar306,auVar382,8);
      auVar24 = vsubps_avx(auVar353,auVar222);
      auVar222 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar178._0_4_ = auVar222._0_4_ * fVar338 + auVar23._0_4_ * fVar217 + fVar240 * auVar24._0_4_;
      auVar178._4_4_ = auVar222._4_4_ * fVar231 + auVar23._4_4_ * fVar230 + fVar253 * auVar24._4_4_;
      auVar178._8_4_ = auVar222._8_4_ * fVar343 + auVar23._8_4_ * fVar232 + fVar256 * auVar24._8_4_;
      auVar178._12_4_ =
           auVar222._12_4_ * fVar235 + auVar23._12_4_ * fVar233 + fVar258 * auVar24._12_4_;
      auVar222 = vblendps_avx(auVar178,auVar353,8);
      auVar246._8_4_ = 0x7fffffff;
      auVar246._0_8_ = 0x7fffffff7fffffff;
      auVar246._12_4_ = 0x7fffffff;
      auVar180 = vandps_avx(auVar180,auVar246);
      auVar204 = vandps_avx(auVar204,auVar246);
      auVar23 = vmaxps_avx(auVar180,auVar204);
      auVar180 = vandps_avx(auVar205,auVar246);
      auVar204 = vandps_avx(auVar222,auVar246);
      auVar180 = vmaxps_avx(auVar180,auVar204);
      auVar180 = vmaxps_avx(auVar23,auVar180);
      auVar204 = vmovshdup_avx(auVar180);
      auVar204 = vmaxss_avx(auVar204,auVar180);
      auVar180 = vshufpd_avx(auVar180,auVar180,1);
      auVar180 = vmaxss_avx(auVar180,auVar204);
      fVar338 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar22 + 0x908);
      fVar231 = *(float *)(catmullrom_basis0 + lVar22 + 0x90c);
      fVar343 = *(float *)(catmullrom_basis0 + lVar22 + 0x910);
      fVar235 = *(float *)(catmullrom_basis0 + lVar22 + 0x914);
      fVar217 = *(float *)(catmullrom_basis0 + lVar22 + 0x918);
      fVar230 = *(float *)(catmullrom_basis0 + lVar22 + 0x91c);
      fVar232 = *(float *)(catmullrom_basis0 + lVar22 + 0x920);
      auVar128 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar22 + 0x908);
      auVar204 = vshufps_avx(auVar306,auVar306,0);
      register0x00001250 = auVar204;
      _local_440 = auVar204;
      auVar205 = vshufps_avx(auVar306,auVar306,0x55);
      register0x00001290 = auVar205;
      _local_6a0 = auVar205;
      fVar272 = *(float *)(catmullrom_basis0 + lVar22 + 0xd8c);
      fVar274 = *(float *)(catmullrom_basis0 + lVar22 + 0xd90);
      fVar347 = *(float *)(catmullrom_basis0 + lVar22 + 0xd94);
      fVar346 = *(float *)(catmullrom_basis0 + lVar22 + 0xd98);
      fVar348 = *(float *)(catmullrom_basis0 + lVar22 + 0xd9c);
      fVar234 = *(float *)(catmullrom_basis0 + lVar22 + 0xda0);
      fVar350 = *(float *)(catmullrom_basis0 + lVar22 + 0xda4);
      auVar222 = vshufps_avx(auVar178,auVar178,0);
      register0x00001210 = auVar222;
      _local_4a0 = auVar222;
      fVar145 = auVar222._0_4_;
      fVar165 = auVar222._4_4_;
      fVar168 = auVar222._8_4_;
      fVar170 = auVar222._12_4_;
      fVar174 = auVar204._0_4_;
      fVar193 = auVar204._4_4_;
      fVar194 = auVar204._8_4_;
      fVar195 = auVar204._12_4_;
      auVar204 = vshufps_avx(auVar178,auVar178,0x55);
      register0x000014d0 = auVar204;
      _local_620 = auVar204;
      fVar337 = auVar204._0_4_;
      fVar342 = auVar204._4_4_;
      fVar344 = auVar204._8_4_;
      fVar345 = auVar204._12_4_;
      fVar197 = auVar205._0_4_;
      fVar210 = auVar205._4_4_;
      fVar212 = auVar205._8_4_;
      fVar214 = auVar205._12_4_;
      auVar204 = vshufps_avx(auVar382,auVar382,0xff);
      register0x00001450 = auVar204;
      _local_c0 = auVar204;
      auVar205 = vshufps_avx(auVar353,auVar353,0xff);
      register0x00001390 = auVar205;
      _local_e0 = auVar205;
      fVar280 = auVar205._0_4_;
      fVar287 = auVar205._4_4_;
      fVar288 = auVar205._8_4_;
      fVar289 = auVar205._12_4_;
      fVar315 = auVar204._0_4_;
      fVar321 = auVar204._4_4_;
      fVar322 = auVar204._8_4_;
      auVar205 = vshufps_avx(auVar297,auVar297,0);
      register0x00001310 = auVar205;
      _local_5c0 = auVar205;
      pauVar11 = (undefined1 (*) [16])(catmullrom_basis0 + lVar22 + 0x484);
      fVar233 = *(float *)*pauVar11;
      fVar240 = *(float *)(catmullrom_basis0 + lVar22 + 0x488);
      fVar253 = *(float *)(catmullrom_basis0 + lVar22 + 0x48c);
      auVar129 = *(undefined1 (*) [12])*pauVar11;
      fVar349 = *(float *)(catmullrom_basis0 + lVar22 + 0x490);
      fStack_170 = *(float *)(catmullrom_basis0 + lVar22 + 0x494);
      fStack_16c = *(float *)(catmullrom_basis0 + lVar22 + 0x498);
      fStack_168 = *(float *)(catmullrom_basis0 + lVar22 + 0x49c);
      fVar242 = auVar205._0_4_;
      fVar255 = auVar205._4_4_;
      fVar257 = auVar205._8_4_;
      fVar259 = auVar205._12_4_;
      auVar205 = vshufps_avx(auVar297,auVar297,0x55);
      register0x000015d0 = auVar205;
      _local_740 = auVar205;
      fVar381 = auVar205._0_4_;
      fVar388 = auVar205._4_4_;
      fVar389 = auVar205._8_4_;
      fVar390 = auVar205._12_4_;
      auVar205 = vshufps_avx(auVar370,auVar370,0xff);
      register0x00001590 = auVar205;
      _local_100 = auVar205;
      _local_180 = *pauVar11;
      auVar24 = _local_180;
      uStack_164 = *(undefined4 *)(catmullrom_basis0 + lVar22 + 0x4a0);
      fVar368 = auVar205._0_4_;
      fVar374 = auVar205._4_4_;
      fVar376 = auVar205._8_4_;
      fVar378 = auVar205._12_4_;
      auVar121._8_4_ = auVar221._8_4_;
      auVar121._0_8_ = auVar221._0_8_;
      auVar121._12_4_ = auVar221._12_4_;
      auVar205 = vshufps_avx(auVar121,auVar121,0);
      register0x00001350 = auVar205;
      _local_420 = auVar205;
      pauVar9 = (undefined1 (*) [32])(catmullrom_basis0 + lVar22);
      fVar256 = *(float *)*pauVar9;
      fVar258 = *(float *)(catmullrom_basis0 + lVar22 + 4);
      fVar260 = *(float *)(catmullrom_basis0 + lVar22 + 8);
      fVar270 = *(float *)(catmullrom_basis0 + lVar22 + 0xc);
      fVar302 = *(float *)(catmullrom_basis0 + lVar22 + 0x10);
      fVar236 = *(float *)(catmullrom_basis0 + lVar22 + 0x14);
      fVar276 = *(float *)(catmullrom_basis0 + lVar22 + 0x18);
      auVar130 = *(undefined1 (*) [28])*pauVar9;
      fVar261 = auVar205._0_4_;
      fVar271 = auVar205._4_4_;
      fVar273 = auVar205._8_4_;
      fVar275 = auVar205._12_4_;
      auVar298._0_4_ = fVar261 * fVar256 + fVar242 * fVar233 + fVar174 * fVar338 + fVar145 * fVar272
      ;
      auVar298._4_4_ = fVar271 * fVar258 + fVar255 * fVar240 + fVar193 * fVar231 + fVar165 * fVar274
      ;
      auVar298._8_4_ = fVar273 * fVar260 + fVar257 * fVar253 + fVar194 * fVar343 + fVar168 * fVar347
      ;
      auVar298._12_4_ =
           fVar275 * fVar270 + fVar259 * fVar349 + fVar195 * fVar235 + fVar170 * fVar346;
      auVar298._16_4_ =
           fVar261 * fVar302 + fVar242 * fStack_170 + fVar174 * fVar217 + fVar145 * fVar348;
      auVar298._20_4_ =
           fVar271 * fVar236 + fVar255 * fStack_16c + fVar193 * fVar230 + fVar165 * fVar234;
      auVar298._24_4_ =
           fVar273 * fVar276 + fVar257 * fStack_168 + fVar194 * fVar232 + fVar168 * fVar350;
      auVar298._28_4_ = fVar275 + fVar195 + fVar170 + 0.0;
      auVar205 = vshufps_avx(auVar121,auVar121,0x55);
      register0x00001290 = auVar205;
      _local_460 = auVar205;
      fVar198 = auVar205._0_4_;
      fVar211 = auVar205._4_4_;
      fVar213 = auVar205._8_4_;
      fVar215 = auVar205._12_4_;
      auVar354._0_4_ = fVar198 * fVar256 + fVar381 * fVar233 + fVar197 * fVar338 + fVar337 * fVar272
      ;
      auVar354._4_4_ = fVar211 * fVar258 + fVar388 * fVar240 + fVar210 * fVar231 + fVar342 * fVar274
      ;
      auVar354._8_4_ = fVar213 * fVar260 + fVar389 * fVar253 + fVar212 * fVar343 + fVar344 * fVar347
      ;
      auVar354._12_4_ =
           fVar215 * fVar270 + fVar390 * fVar349 + fVar214 * fVar235 + fVar345 * fVar346;
      auVar354._16_4_ =
           fVar198 * fVar302 + fVar381 * fStack_170 + fVar197 * fVar217 + fVar337 * fVar348;
      auVar354._20_4_ =
           fVar211 * fVar236 + fVar388 * fStack_16c + fVar210 * fVar230 + fVar342 * fVar234;
      auVar354._24_4_ =
           fVar213 * fVar276 + fVar389 * fStack_168 + fVar212 * fVar232 + fVar344 * fVar350;
      auVar354._28_4_ = fVar214 + 0.0 + 0.0 + 0.0;
      auVar205 = vpermilps_avx(auVar245,0xff);
      register0x00001490 = auVar205;
      _local_80 = auVar205;
      _local_1a0 = *pauVar9;
      auVar162 = _local_1a0;
      fVar324 = auVar205._0_4_;
      fVar332 = auVar205._4_4_;
      fVar334 = auVar205._8_4_;
      local_840._0_4_ =
           fVar368 * fVar233 + fVar315 * fVar338 + fVar280 * fVar272 + fVar324 * fVar256;
      local_840._4_4_ =
           fVar374 * fVar240 + fVar321 * fVar231 + fVar287 * fVar274 + fVar332 * fVar258;
      local_840._8_4_ =
           fVar376 * fVar253 + fVar322 * fVar343 + fVar288 * fVar347 + fVar334 * fVar260;
      local_840._12_4_ =
           fVar378 * fVar349 + auVar204._12_4_ * fVar235 + fVar289 * fVar346 +
           auVar205._12_4_ * fVar270;
      local_840._16_4_ =
           fVar368 * fStack_170 + fVar315 * fVar217 + fVar280 * fVar348 + fVar324 * fVar302;
      local_840._20_4_ =
           fVar374 * fStack_16c + fVar321 * fVar230 + fVar287 * fVar234 + fVar332 * fVar236;
      local_840._24_4_ =
           fVar376 * fStack_168 + fVar322 * fVar232 + fVar288 * fVar350 + fVar334 * fVar276;
      local_840._28_4_ = 0;
      fVar302 = *(float *)(catmullrom_basis1 + lVar22 + 0x908);
      fVar236 = *(float *)(catmullrom_basis1 + lVar22 + 0x90c);
      fVar276 = *(float *)(catmullrom_basis1 + lVar22 + 0x910);
      fVar309 = *(float *)(catmullrom_basis1 + lVar22 + 0x914);
      fVar311 = *(float *)(catmullrom_basis1 + lVar22 + 0x918);
      fVar238 = *(float *)(catmullrom_basis1 + lVar22 + 0x91c);
      fVar277 = *(float *)(catmullrom_basis1 + lVar22 + 0x920);
      fVar313 = *(float *)(catmullrom_basis1 + lVar22 + 0xd8c);
      fVar314 = *(float *)(catmullrom_basis1 + lVar22 + 0xd90);
      fVar239 = *(float *)(catmullrom_basis1 + lVar22 + 0xd94);
      fVar146 = *(float *)(catmullrom_basis1 + lVar22 + 0xd98);
      fVar166 = *(float *)(catmullrom_basis1 + lVar22 + 0xd9c);
      fVar169 = *(float *)(catmullrom_basis1 + lVar22 + 0xda0);
      fVar171 = *(float *)(catmullrom_basis1 + lVar22 + 0xda4);
      fVar196 = *(float *)(catmullrom_basis1 + lVar22 + 0x484);
      fVar172 = *(float *)(catmullrom_basis1 + lVar22 + 0x488);
      fVar173 = *(float *)(catmullrom_basis1 + lVar22 + 0x48c);
      fVar218 = *(float *)(catmullrom_basis1 + lVar22 + 0x490);
      fVar147 = *(float *)(catmullrom_basis1 + lVar22 + 0x494);
      fVar167 = *(float *)(catmullrom_basis1 + lVar22 + 0x498);
      fVar216 = *(float *)(catmullrom_basis1 + lVar22 + 0x49c);
      fVar290 = *(float *)(catmullrom_basis1 + lVar22);
      fVar237 = *(float *)(catmullrom_basis1 + lVar22 + 4);
      fVar291 = *(float *)(catmullrom_basis1 + lVar22 + 8);
      fVar279 = *(float *)(catmullrom_basis1 + lVar22 + 0xc);
      fVar308 = *(float *)(catmullrom_basis1 + lVar22 + 0x10);
      fVar310 = *(float *)(catmullrom_basis1 + lVar22 + 0x14);
      fVar312 = *(float *)(catmullrom_basis1 + lVar22 + 0x18);
      auVar247._0_4_ = fVar261 * fVar290 + fVar242 * fVar196 + fVar302 * fVar174 + fVar313 * fVar145
      ;
      auVar247._4_4_ = fVar271 * fVar237 + fVar255 * fVar172 + fVar236 * fVar193 + fVar314 * fVar165
      ;
      auVar247._8_4_ = fVar273 * fVar291 + fVar257 * fVar173 + fVar276 * fVar194 + fVar239 * fVar168
      ;
      auVar247._12_4_ =
           fVar275 * fVar279 + fVar259 * fVar218 + fVar309 * fVar195 + fVar146 * fVar170;
      auVar247._16_4_ =
           fVar261 * fVar308 + fVar242 * fVar147 + fVar311 * fVar174 + fVar166 * fVar145;
      auVar247._20_4_ =
           fVar271 * fVar310 + fVar255 * fVar167 + fVar238 * fVar193 + fVar169 * fVar165;
      auVar247._24_4_ =
           fVar273 * fVar312 + fVar257 * fVar216 + fVar277 * fVar194 + fVar171 * fVar168;
      auVar247._28_4_ = fVar378 + fVar275 + 0.0 + 0.0;
      auVar223._0_4_ = fVar198 * fVar290 + fVar381 * fVar196 + fVar197 * fVar302 + fVar337 * fVar313
      ;
      auVar223._4_4_ = fVar211 * fVar237 + fVar388 * fVar172 + fVar210 * fVar236 + fVar342 * fVar314
      ;
      auVar223._8_4_ = fVar213 * fVar291 + fVar389 * fVar173 + fVar212 * fVar276 + fVar344 * fVar239
      ;
      auVar223._12_4_ =
           fVar215 * fVar279 + fVar390 * fVar218 + fVar214 * fVar309 + fVar345 * fVar146;
      auVar223._16_4_ =
           fVar198 * fVar308 + fVar381 * fVar147 + fVar197 * fVar311 + fVar337 * fVar166;
      auVar223._20_4_ =
           fVar211 * fVar310 + fVar388 * fVar167 + fVar210 * fVar238 + fVar342 * fVar169;
      auVar223._24_4_ =
           fVar213 * fVar312 + fVar389 * fVar216 + fVar212 * fVar277 + fVar344 * fVar171;
      auVar223._28_4_ = fVar215 + fVar275 + 0.0 + 0.0;
      auVar317._0_4_ = fVar368 * fVar196 + fVar315 * fVar302 + fVar313 * fVar280 + fVar324 * fVar290
      ;
      auVar317._4_4_ = fVar374 * fVar172 + fVar321 * fVar236 + fVar314 * fVar287 + fVar332 * fVar237
      ;
      auVar317._8_4_ = fVar376 * fVar173 + fVar322 * fVar276 + fVar239 * fVar288 + fVar334 * fVar291
      ;
      auVar317._12_4_ =
           fVar378 * fVar218 + auVar204._12_4_ * fVar309 + fVar146 * fVar289 +
           auVar205._12_4_ * fVar279;
      auVar317._16_4_ =
           fVar368 * fVar147 + fVar315 * fVar311 + fVar166 * fVar280 + fVar324 * fVar308;
      auVar317._20_4_ =
           fVar374 * fVar167 + fVar321 * fVar238 + fVar169 * fVar287 + fVar332 * fVar310;
      auVar317._24_4_ =
           fVar376 * fVar216 + fVar322 * fVar277 + fVar171 * fVar288 + fVar334 * fVar312;
      auVar317._28_4_ = fVar289 + fVar275 + 0.0 + fVar215;
      auVar31 = vsubps_avx(auVar247,auVar298);
      auVar330 = vsubps_avx(auVar223,auVar354);
      fVar338 = auVar31._0_4_;
      fVar343 = auVar31._4_4_;
      auVar163._4_4_ = auVar354._4_4_ * fVar343;
      auVar163._0_4_ = auVar354._0_4_ * fVar338;
      fVar217 = auVar31._8_4_;
      auVar163._8_4_ = auVar354._8_4_ * fVar217;
      fVar232 = auVar31._12_4_;
      auVar163._12_4_ = auVar354._12_4_ * fVar232;
      fVar240 = auVar31._16_4_;
      auVar163._16_4_ = auVar354._16_4_ * fVar240;
      fVar256 = auVar31._20_4_;
      auVar163._20_4_ = auVar354._20_4_ * fVar256;
      fVar260 = auVar31._24_4_;
      auVar163._24_4_ = auVar354._24_4_ * fVar260;
      auVar163._28_4_ = fVar215;
      fVar231 = auVar330._0_4_;
      fVar235 = auVar330._4_4_;
      auVar160._4_4_ = auVar298._4_4_ * fVar235;
      auVar160._0_4_ = auVar298._0_4_ * fVar231;
      fVar230 = auVar330._8_4_;
      auVar160._8_4_ = auVar298._8_4_ * fVar230;
      fVar233 = auVar330._12_4_;
      auVar160._12_4_ = auVar298._12_4_ * fVar233;
      fVar253 = auVar330._16_4_;
      auVar160._16_4_ = auVar298._16_4_ * fVar253;
      fVar258 = auVar330._20_4_;
      auVar160._20_4_ = auVar298._20_4_ * fVar258;
      fVar270 = auVar330._24_4_;
      auVar160._24_4_ = auVar298._24_4_ * fVar270;
      auVar160._28_4_ = auVar223._28_4_;
      auVar160 = vsubps_avx(auVar163,auVar160);
      auVar163 = vmaxps_avx(local_840,auVar317);
      auVar267._4_4_ = auVar163._4_4_ * auVar163._4_4_ * (fVar343 * fVar343 + fVar235 * fVar235);
      auVar267._0_4_ = auVar163._0_4_ * auVar163._0_4_ * (fVar338 * fVar338 + fVar231 * fVar231);
      auVar267._8_4_ = auVar163._8_4_ * auVar163._8_4_ * (fVar217 * fVar217 + fVar230 * fVar230);
      auVar267._12_4_ = auVar163._12_4_ * auVar163._12_4_ * (fVar232 * fVar232 + fVar233 * fVar233);
      auVar267._16_4_ = auVar163._16_4_ * auVar163._16_4_ * (fVar240 * fVar240 + fVar253 * fVar253);
      auVar267._20_4_ = auVar163._20_4_ * auVar163._20_4_ * (fVar256 * fVar256 + fVar258 * fVar258);
      auVar267._24_4_ = auVar163._24_4_ * auVar163._24_4_ * (fVar260 * fVar260 + fVar270 * fVar270);
      auVar267._28_4_ = auVar330._28_4_ + auVar223._28_4_;
      auVar156._4_4_ = auVar160._4_4_ * auVar160._4_4_;
      auVar156._0_4_ = auVar160._0_4_ * auVar160._0_4_;
      auVar156._8_4_ = auVar160._8_4_ * auVar160._8_4_;
      auVar156._12_4_ = auVar160._12_4_ * auVar160._12_4_;
      auVar156._16_4_ = auVar160._16_4_ * auVar160._16_4_;
      auVar156._20_4_ = auVar160._20_4_ * auVar160._20_4_;
      auVar156._24_4_ = auVar160._24_4_ * auVar160._24_4_;
      auVar156._28_4_ = auVar160._28_4_;
      auVar163 = vcmpps_avx(auVar156,auVar267,2);
      auVar204 = ZEXT416((uint)(float)(int)uVar16);
      _local_480 = auVar204;
      auVar204 = vshufps_avx(auVar204,auVar204,0);
      auVar224._16_16_ = auVar204;
      auVar224._0_16_ = auVar204;
      auVar160 = vcmpps_avx(_DAT_02020f40,auVar224,1);
      auVar229 = ZEXT3264(auVar160);
      auVar122._8_4_ = auVar221._8_4_;
      auVar122._0_8_ = auVar221._0_8_;
      auVar122._12_4_ = auVar221._12_4_;
      auVar204 = vpermilps_avx(auVar122,0xaa);
      register0x00001490 = auVar204;
      _local_120 = auVar204;
      auVar205 = vpermilps_avx(auVar297,0xaa);
      register0x00001550 = auVar205;
      _local_160 = auVar205;
      auVar222 = vpermilps_avx(auVar306,0xaa);
      register0x00001590 = auVar222;
      _local_a0 = auVar222;
      auVar23 = vpermilps_avx(auVar178,0xaa);
      register0x00001310 = auVar23;
      _local_600 = auVar23;
      auVar252 = ZEXT3264(_local_600);
      auVar267 = auVar160 & auVar163;
      local_820 = *(uint *)(ray + k * 4 + 0x30);
      uStack_81c = 0;
      fStack_818 = 0.0;
      fStack_814 = 0.0;
      auVar180 = ZEXT416((uint)(auVar180._0_4_ * 4.7683716e-07));
      _local_5e0 = auVar180;
      uStack_868 = auVar245._8_8_;
      fVar338 = fVar242;
      fVar231 = fVar255;
      fVar343 = fVar257;
      fVar235 = fVar259;
      if ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar267 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar267 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar267 >> 0x7f,0) == '\0') &&
            (auVar267 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar267 >> 0xbf,0) == '\0') &&
          (auVar267 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar267[0x1f]) {
        auVar301 = ZEXT3264(_local_740);
      }
      else {
        auVar163 = vandps_avx(auVar163,auVar160);
        fVar325 = auVar204._0_4_;
        fVar333 = auVar204._4_4_;
        fVar335 = auVar204._8_4_;
        fVar336 = auVar204._12_4_;
        fVar360 = auVar205._0_4_;
        fVar364 = auVar205._4_4_;
        fVar365 = auVar205._8_4_;
        fVar366 = auVar205._12_4_;
        fVar369 = auVar222._0_4_;
        fVar375 = auVar222._4_4_;
        fVar377 = auVar222._8_4_;
        fVar379 = auVar222._12_4_;
        fVar217 = auVar23._0_4_;
        fVar230 = auVar23._4_4_;
        fVar232 = auVar23._8_4_;
        fVar233 = auVar23._12_4_;
        fVar240 = auVar160._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar22 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar22 + 0x4a0);
        local_1e0 = auVar31;
        local_1c0._0_4_ =
             fVar325 * fVar290 + fVar360 * fVar196 + fVar369 * fVar302 + fVar313 * fVar217;
        local_1c0._4_4_ =
             fVar333 * fVar237 + fVar364 * fVar172 + fVar375 * fVar236 + fVar314 * fVar230;
        fStack_1b8 = fVar335 * fVar291 + fVar365 * fVar173 + fVar377 * fVar276 + fVar239 * fVar232;
        fStack_1b4 = fVar336 * fVar279 + fVar366 * fVar218 + fVar379 * fVar309 + fVar146 * fVar233;
        fStack_1b0 = fVar325 * fVar308 + fVar360 * fVar147 + fVar369 * fVar311 + fVar166 * fVar217;
        fStack_1ac = fVar333 * fVar310 + fVar364 * fVar167 + fVar375 * fVar238 + fVar169 * fVar230;
        fStack_1a8 = fVar335 * fVar312 + fVar365 * fVar216 + fVar377 * fVar277 + fVar171 * fVar232;
        fStack_1a4 = auVar163._28_4_ + fVar240;
        local_1a0._0_4_ = auVar130._0_4_;
        local_1a0._4_4_ = auVar130._4_4_;
        fStack_198 = auVar130._8_4_;
        fStack_194 = auVar130._12_4_;
        fStack_190 = auVar130._16_4_;
        fStack_18c = auVar130._20_4_;
        fStack_188 = auVar130._24_4_;
        local_180._0_4_ = auVar129._0_4_;
        local_180._4_4_ = auVar129._4_4_;
        fStack_178 = auVar129._8_4_;
        local_6e0._0_4_ = auVar128._0_4_;
        local_6e0._4_4_ = auVar128._4_4_;
        uStack_6d8._0_4_ = auVar128._8_4_;
        uStack_6d8._4_4_ = auVar128._12_4_;
        fStack_6d0 = auVar128._16_4_;
        fStack_6cc = auVar128._20_4_;
        fStack_6c8 = auVar128._24_4_;
        local_6e0._0_4_ =
             fVar325 * (float)local_1a0._0_4_ +
             fVar360 * (float)local_180._0_4_ + fVar369 * (float)local_6e0._0_4_ + fVar217 * fVar272
        ;
        local_6e0._4_4_ =
             fVar333 * (float)local_1a0._4_4_ +
             fVar364 * (float)local_180._4_4_ + fVar375 * (float)local_6e0._4_4_ + fVar230 * fVar274
        ;
        uStack_6d8._0_4_ =
             fVar335 * fStack_198 +
             fVar365 * fStack_178 + fVar377 * (float)uStack_6d8 + fVar232 * fVar347;
        uStack_6d8._4_4_ =
             fVar336 * fStack_194 +
             fVar366 * fVar349 + fVar379 * uStack_6d8._4_4_ + fVar233 * fVar346;
        fStack_6d0 = fVar325 * fStack_190 +
                     fVar360 * fStack_170 + fVar369 * fStack_6d0 + fVar217 * fVar348;
        fStack_6cc = fVar333 * fStack_18c +
                     fVar364 * fStack_16c + fVar375 * fStack_6cc + fVar230 * fVar234;
        fStack_6c8 = fVar335 * fStack_188 +
                     fVar365 * fStack_168 + fVar377 * fStack_6c8 + fVar232 * fVar350;
        fStack_6c4 = fStack_1a4 + fVar240 + auVar163._28_4_ + auVar160._28_4_;
        fVar240 = *(float *)(catmullrom_basis0 + lVar22 + 0x1210);
        fVar253 = *(float *)(catmullrom_basis0 + lVar22 + 0x1214);
        fVar256 = *(float *)(catmullrom_basis0 + lVar22 + 0x1218);
        fVar258 = *(float *)(catmullrom_basis0 + lVar22 + 0x121c);
        fVar260 = *(float *)(catmullrom_basis0 + lVar22 + 0x1220);
        fVar270 = *(float *)(catmullrom_basis0 + lVar22 + 0x1224);
        fVar272 = *(float *)(catmullrom_basis0 + lVar22 + 0x1228);
        fVar274 = *(float *)(catmullrom_basis0 + lVar22 + 0x1694);
        fVar347 = *(float *)(catmullrom_basis0 + lVar22 + 0x1698);
        fVar346 = *(float *)(catmullrom_basis0 + lVar22 + 0x169c);
        fVar348 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a0);
        fVar234 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a4);
        fVar350 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a8);
        fVar349 = *(float *)(catmullrom_basis0 + lVar22 + 0x16ac);
        fVar302 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b18);
        fVar236 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b1c);
        fVar276 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b20);
        fVar309 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b24);
        fVar311 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b28);
        fVar238 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b2c);
        fVar277 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b30);
        fVar313 = *(float *)(catmullrom_basis0 + lVar22 + 0x1f9c);
        fVar314 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa0);
        fVar239 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa4);
        fVar146 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa8);
        fVar166 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fac);
        fVar169 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fb0);
        fVar171 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fb4);
        fVar278 = *(float *)(catmullrom_basis1 + lVar22 + 0x4a0) + 0.0;
        fVar196 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar22 + 0x1fb8);
        fVar323 = *(float *)(catmullrom_basis0 + lVar22 + 0x16b0) + fVar196;
        auVar383._0_4_ =
             fVar198 * fVar240 + fVar197 * fVar302 + fVar337 * fVar313 + fVar381 * fVar274;
        auVar383._4_4_ =
             fVar211 * fVar253 + fVar210 * fVar236 + fVar342 * fVar314 + fVar388 * fVar347;
        auVar383._8_4_ =
             fVar213 * fVar256 + fVar212 * fVar276 + fVar344 * fVar239 + fVar389 * fVar346;
        auVar383._12_4_ =
             fVar215 * fVar258 + fVar214 * fVar309 + fVar345 * fVar146 + fVar390 * fVar348;
        auVar383._16_4_ =
             fVar198 * fVar260 + fVar197 * fVar311 + fVar337 * fVar166 + fVar381 * fVar234;
        auVar383._20_4_ =
             fVar211 * fVar270 + fVar210 * fVar238 + fVar342 * fVar169 + fVar388 * fVar350;
        auVar383._24_4_ =
             fVar213 * fVar272 + fVar212 * fVar277 + fVar344 * fVar171 + fVar389 * fVar349;
        auVar383._28_4_ = fVar196 + fVar278 + 0.0;
        auVar263._0_4_ =
             fVar360 * fVar274 + fVar369 * fVar302 + fVar217 * fVar313 + fVar325 * fVar240;
        auVar263._4_4_ =
             fVar364 * fVar347 + fVar375 * fVar236 + fVar230 * fVar314 + fVar333 * fVar253;
        auVar263._8_4_ =
             fVar365 * fVar346 + fVar377 * fVar276 + fVar232 * fVar239 + fVar335 * fVar256;
        auVar263._12_4_ =
             fVar366 * fVar348 + fVar379 * fVar309 + fVar233 * fVar146 + fVar336 * fVar258;
        auVar263._16_4_ =
             fVar360 * fVar234 + fVar369 * fVar311 + fVar217 * fVar166 + fVar325 * fVar260;
        auVar263._20_4_ =
             fVar364 * fVar350 + fVar375 * fVar238 + fVar230 * fVar169 + fVar333 * fVar270;
        auVar263._24_4_ =
             fVar365 * fVar349 + fVar377 * fVar277 + fVar232 * fVar171 + fVar335 * fVar272;
        auVar263._28_4_ = fVar323 + *(float *)(catmullrom_basis0 + lVar22 + 0x122c);
        fVar196 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b18);
        fVar172 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b1c);
        fVar173 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b20);
        fVar218 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b24);
        fVar147 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b28);
        fVar167 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b2c);
        fVar216 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b30);
        fVar290 = *(float *)(catmullrom_basis1 + lVar22 + 0x1f9c);
        fVar237 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa0);
        fVar291 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa4);
        fVar279 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa8);
        fVar308 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fac);
        fVar310 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fb0);
        fVar312 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fb4);
        fVar280 = *(float *)(catmullrom_basis1 + lVar22 + 0x1694);
        fVar287 = *(float *)(catmullrom_basis1 + lVar22 + 0x1698);
        fVar288 = *(float *)(catmullrom_basis1 + lVar22 + 0x169c);
        fVar289 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a0);
        fVar315 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a4);
        fVar321 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a8);
        fVar322 = *(float *)(catmullrom_basis1 + lVar22 + 0x16ac);
        fVar324 = *(float *)(catmullrom_basis1 + lVar22 + 0x1210);
        fVar332 = *(float *)(catmullrom_basis1 + lVar22 + 0x1214);
        fVar334 = *(float *)(catmullrom_basis1 + lVar22 + 0x1218);
        fVar368 = *(float *)(catmullrom_basis1 + lVar22 + 0x121c);
        fVar374 = *(float *)(catmullrom_basis1 + lVar22 + 0x1220);
        fVar376 = *(float *)(catmullrom_basis1 + lVar22 + 0x1224);
        fVar378 = *(float *)(catmullrom_basis1 + lVar22 + 0x1228);
        auVar283._0_4_ =
             fVar324 * fVar261 + fVar242 * fVar280 + fVar174 * fVar196 + fVar145 * fVar290;
        auVar283._4_4_ =
             fVar332 * fVar271 + fVar255 * fVar287 + fVar193 * fVar172 + fVar165 * fVar237;
        auVar283._8_4_ =
             fVar334 * fVar273 + fVar257 * fVar288 + fVar194 * fVar173 + fVar168 * fVar291;
        auVar283._12_4_ =
             fVar368 * fVar275 + fVar259 * fVar289 + fVar195 * fVar218 + fVar170 * fVar279;
        auVar283._16_4_ =
             fVar374 * fVar261 + fVar242 * fVar315 + fVar174 * fVar147 + fVar145 * fVar308;
        auVar283._20_4_ =
             fVar376 * fVar271 + fVar255 * fVar321 + fVar193 * fVar167 + fVar165 * fVar310;
        auVar283._24_4_ =
             fVar378 * fVar273 + fVar257 * fVar322 + fVar194 * fVar216 + fVar168 * fVar312;
        auVar283._28_4_ = fVar336 + fVar336 + fVar323 + fVar170;
        auVar318._0_4_ =
             fVar198 * fVar324 + fVar381 * fVar280 + fVar197 * fVar196 + fVar337 * fVar290;
        auVar318._4_4_ =
             fVar211 * fVar332 + fVar388 * fVar287 + fVar210 * fVar172 + fVar342 * fVar237;
        auVar318._8_4_ =
             fVar213 * fVar334 + fVar389 * fVar288 + fVar212 * fVar173 + fVar344 * fVar291;
        auVar318._12_4_ =
             fVar215 * fVar368 + fVar390 * fVar289 + fVar214 * fVar218 + fVar345 * fVar279;
        auVar318._16_4_ =
             fVar198 * fVar374 + fVar381 * fVar315 + fVar197 * fVar147 + fVar337 * fVar308;
        auVar318._20_4_ =
             fVar211 * fVar376 + fVar388 * fVar321 + fVar210 * fVar167 + fVar342 * fVar310;
        auVar318._24_4_ =
             fVar213 * fVar378 + fVar389 * fVar322 + fVar212 * fVar216 + fVar344 * fVar312;
        auVar318._28_4_ = fVar336 + fVar336 + fVar336 + fVar323;
        auVar208._0_4_ =
             fVar325 * fVar324 + fVar360 * fVar280 + fVar369 * fVar196 + fVar290 * fVar217;
        auVar208._4_4_ =
             fVar333 * fVar332 + fVar364 * fVar287 + fVar375 * fVar172 + fVar237 * fVar230;
        auVar208._8_4_ =
             fVar335 * fVar334 + fVar365 * fVar288 + fVar377 * fVar173 + fVar291 * fVar232;
        auVar208._12_4_ =
             fVar336 * fVar368 + fVar366 * fVar289 + fVar379 * fVar218 + fVar279 * fVar233;
        auVar208._16_4_ =
             fVar325 * fVar374 + fVar360 * fVar315 + fVar369 * fVar147 + fVar308 * fVar217;
        auVar208._20_4_ =
             fVar333 * fVar376 + fVar364 * fVar321 + fVar375 * fVar167 + fVar310 * fVar230;
        auVar208._24_4_ =
             fVar335 * fVar378 + fVar365 * fVar322 + fVar377 * fVar216 + fVar312 * fVar232;
        auVar208._28_4_ =
             *(float *)(catmullrom_basis1 + lVar22 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar22 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar22 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar22 + 0x1fb8);
        auVar248._8_4_ = 0x7fffffff;
        auVar248._0_8_ = 0x7fffffff7fffffff;
        auVar248._12_4_ = 0x7fffffff;
        auVar248._16_4_ = 0x7fffffff;
        auVar248._20_4_ = 0x7fffffff;
        auVar248._24_4_ = 0x7fffffff;
        auVar248._28_4_ = 0x7fffffff;
        auVar125._4_4_ =
             fVar271 * fVar253 + fVar255 * fVar347 + fVar193 * fVar236 + fVar165 * fVar314;
        auVar125._0_4_ =
             fVar261 * fVar240 + fVar242 * fVar274 + fVar174 * fVar302 + fVar145 * fVar313;
        auVar125._8_4_ =
             fVar273 * fVar256 + fVar257 * fVar346 + fVar194 * fVar276 + fVar168 * fVar239;
        auVar125._12_4_ =
             fVar275 * fVar258 + fVar259 * fVar348 + fVar195 * fVar309 + fVar170 * fVar146;
        auVar125._16_4_ =
             fVar261 * fVar260 + fVar242 * fVar234 + fVar174 * fVar311 + fVar145 * fVar166;
        auVar125._20_4_ =
             fVar271 * fVar270 + fVar255 * fVar350 + fVar193 * fVar238 + fVar165 * fVar169;
        auVar125._24_4_ =
             fVar273 * fVar272 + fVar257 * fVar349 + fVar194 * fVar277 + fVar168 * fVar171;
        auVar125._28_4_ =
             *(float *)(catmullrom_basis0 + lVar22 + 0x16b0) +
             *(float *)(catmullrom_basis0 + lVar22 + 0x1fb8) + fVar278;
        auVar160 = vandps_avx(auVar125,auVar248);
        auVar267 = vandps_avx(auVar383,auVar248);
        auVar267 = vmaxps_avx(auVar160,auVar267);
        auVar160 = vandps_avx(auVar263,auVar248);
        auVar160 = vmaxps_avx(auVar267,auVar160);
        auVar180 = vpermilps_avx(auVar180,0);
        auVar264._16_16_ = auVar180;
        auVar264._0_16_ = auVar180;
        auVar160 = vcmpps_avx(auVar160,auVar264,1);
        auVar156 = vblendvps_avx(auVar125,auVar31,auVar160);
        auVar224 = vblendvps_avx(auVar383,auVar330,auVar160);
        auVar160 = vandps_avx(auVar283,auVar248);
        auVar267 = vandps_avx(auVar318,auVar248);
        auVar35 = vmaxps_avx(auVar160,auVar267);
        auVar160 = vandps_avx(auVar208,auVar248);
        auVar160 = vmaxps_avx(auVar35,auVar160);
        auVar35 = vcmpps_avx(auVar160,auVar264,1);
        auVar160 = vblendvps_avx(auVar283,auVar31,auVar35);
        auVar31 = vblendvps_avx(auVar318,auVar330,auVar35);
        fVar146 = auVar156._0_4_;
        fVar166 = auVar156._4_4_;
        fVar169 = auVar156._8_4_;
        fVar171 = auVar156._12_4_;
        fVar196 = auVar156._16_4_;
        fVar172 = auVar156._20_4_;
        fVar173 = auVar156._24_4_;
        fVar279 = -auVar156._28_4_;
        fVar218 = auVar160._0_4_;
        fVar147 = auVar160._4_4_;
        fVar167 = auVar160._8_4_;
        fVar216 = auVar160._12_4_;
        fVar290 = auVar160._16_4_;
        fVar237 = auVar160._20_4_;
        fVar291 = auVar160._24_4_;
        fVar217 = auVar224._0_4_;
        fVar240 = auVar224._4_4_;
        fVar260 = auVar224._8_4_;
        fVar347 = auVar224._12_4_;
        fVar350 = auVar224._16_4_;
        fVar276 = auVar224._20_4_;
        fVar277 = auVar224._24_4_;
        auVar153._0_4_ = fVar217 * fVar217 + fVar146 * fVar146;
        auVar153._4_4_ = fVar240 * fVar240 + fVar166 * fVar166;
        auVar153._8_4_ = fVar260 * fVar260 + fVar169 * fVar169;
        auVar153._12_4_ = fVar347 * fVar347 + fVar171 * fVar171;
        auVar153._16_4_ = fVar350 * fVar350 + fVar196 * fVar196;
        auVar153._20_4_ = fVar276 * fVar276 + fVar172 * fVar172;
        auVar153._24_4_ = fVar277 * fVar277 + fVar173 * fVar173;
        auVar153._28_4_ = auVar318._28_4_ + auVar156._28_4_;
        auVar330 = vrsqrtps_avx(auVar153);
        fVar230 = auVar330._0_4_;
        fVar232 = auVar330._4_4_;
        auVar35._4_4_ = fVar232 * 1.5;
        auVar35._0_4_ = fVar230 * 1.5;
        fVar233 = auVar330._8_4_;
        auVar35._8_4_ = fVar233 * 1.5;
        fVar253 = auVar330._12_4_;
        auVar35._12_4_ = fVar253 * 1.5;
        fVar256 = auVar330._16_4_;
        auVar35._16_4_ = fVar256 * 1.5;
        fVar258 = auVar330._20_4_;
        auVar35._20_4_ = fVar258 * 1.5;
        fVar270 = auVar330._24_4_;
        fStack_6e4 = auVar267._28_4_;
        auVar35._24_4_ = fVar270 * 1.5;
        auVar35._28_4_ = fStack_6e4;
        auVar330._4_4_ = fVar232 * fVar232 * fVar232 * auVar153._4_4_ * 0.5;
        auVar330._0_4_ = fVar230 * fVar230 * fVar230 * auVar153._0_4_ * 0.5;
        auVar330._8_4_ = fVar233 * fVar233 * fVar233 * auVar153._8_4_ * 0.5;
        auVar330._12_4_ = fVar253 * fVar253 * fVar253 * auVar153._12_4_ * 0.5;
        auVar330._16_4_ = fVar256 * fVar256 * fVar256 * auVar153._16_4_ * 0.5;
        auVar330._20_4_ = fVar258 * fVar258 * fVar258 * auVar153._20_4_ * 0.5;
        auVar330._24_4_ = fVar270 * fVar270 * fVar270 * auVar153._24_4_ * 0.5;
        auVar330._28_4_ = auVar153._28_4_;
        auVar330 = vsubps_avx(auVar35,auVar330);
        fVar230 = auVar330._0_4_;
        fVar253 = auVar330._4_4_;
        fVar270 = auVar330._8_4_;
        fVar346 = auVar330._12_4_;
        fVar349 = auVar330._16_4_;
        fVar309 = auVar330._20_4_;
        fVar313 = auVar330._24_4_;
        fVar232 = auVar31._0_4_;
        fVar256 = auVar31._4_4_;
        fVar272 = auVar31._8_4_;
        fVar348 = auVar31._12_4_;
        fVar302 = auVar31._16_4_;
        fVar311 = auVar31._20_4_;
        fVar314 = auVar31._24_4_;
        auVar154._0_4_ = fVar232 * fVar232 + fVar218 * fVar218;
        auVar154._4_4_ = fVar256 * fVar256 + fVar147 * fVar147;
        auVar154._8_4_ = fVar272 * fVar272 + fVar167 * fVar167;
        auVar154._12_4_ = fVar348 * fVar348 + fVar216 * fVar216;
        auVar154._16_4_ = fVar302 * fVar302 + fVar290 * fVar290;
        auVar154._20_4_ = fVar311 * fVar311 + fVar237 * fVar237;
        auVar154._24_4_ = fVar314 * fVar314 + fVar291 * fVar291;
        auVar154._28_4_ = auVar160._28_4_ + auVar330._28_4_;
        auVar160 = vrsqrtps_avx(auVar154);
        fVar233 = auVar160._0_4_;
        fVar258 = auVar160._4_4_;
        auVar36._4_4_ = fVar258 * 1.5;
        auVar36._0_4_ = fVar233 * 1.5;
        fVar274 = auVar160._8_4_;
        auVar36._8_4_ = fVar274 * 1.5;
        fVar234 = auVar160._12_4_;
        auVar36._12_4_ = fVar234 * 1.5;
        fVar236 = auVar160._16_4_;
        auVar36._16_4_ = fVar236 * 1.5;
        fVar238 = auVar160._20_4_;
        auVar36._20_4_ = fVar238 * 1.5;
        fVar239 = auVar160._24_4_;
        auVar36._24_4_ = fVar239 * 1.5;
        auVar36._28_4_ = fStack_6e4;
        auVar37._4_4_ = fVar258 * fVar258 * fVar258 * auVar154._4_4_ * 0.5;
        auVar37._0_4_ = fVar233 * fVar233 * fVar233 * auVar154._0_4_ * 0.5;
        auVar37._8_4_ = fVar274 * fVar274 * fVar274 * auVar154._8_4_ * 0.5;
        auVar37._12_4_ = fVar234 * fVar234 * fVar234 * auVar154._12_4_ * 0.5;
        auVar37._16_4_ = fVar236 * fVar236 * fVar236 * auVar154._16_4_ * 0.5;
        auVar37._20_4_ = fVar238 * fVar238 * fVar238 * auVar154._20_4_ * 0.5;
        auVar37._24_4_ = fVar239 * fVar239 * fVar239 * auVar154._24_4_ * 0.5;
        auVar37._28_4_ = auVar154._28_4_;
        auVar160 = vsubps_avx(auVar36,auVar37);
        fVar233 = auVar160._0_4_;
        fVar258 = auVar160._4_4_;
        fVar274 = auVar160._8_4_;
        fVar234 = auVar160._12_4_;
        fVar236 = auVar160._16_4_;
        fVar238 = auVar160._20_4_;
        fVar239 = auVar160._24_4_;
        local_700 = (float)local_840._0_4_ * fVar217 * fVar230;
        fStack_6fc = local_840._4_4_ * fVar240 * fVar253;
        auVar32._4_4_ = fStack_6fc;
        auVar32._0_4_ = local_700;
        fStack_6f8 = local_840._8_4_ * fVar260 * fVar270;
        auVar32._8_4_ = fStack_6f8;
        fStack_6f4 = local_840._12_4_ * fVar347 * fVar346;
        auVar32._12_4_ = fStack_6f4;
        fStack_6f0 = local_840._16_4_ * fVar350 * fVar349;
        auVar32._16_4_ = fStack_6f0;
        fStack_6ec = local_840._20_4_ * fVar276 * fVar309;
        auVar32._20_4_ = fStack_6ec;
        fStack_6e8 = local_840._24_4_ * fVar277 * fVar313;
        auVar32._24_4_ = fStack_6e8;
        auVar32._28_4_ = fStack_6e4;
        local_700 = local_700 + auVar298._0_4_;
        fStack_6fc = fStack_6fc + auVar298._4_4_;
        fStack_6f8 = fStack_6f8 + auVar298._8_4_;
        fStack_6f4 = fStack_6f4 + auVar298._12_4_;
        fStack_6f0 = fStack_6f0 + auVar298._16_4_;
        fStack_6ec = fStack_6ec + auVar298._20_4_;
        fStack_6e8 = fStack_6e8 + auVar298._24_4_;
        fStack_6e4 = fStack_6e4 + auVar298._28_4_;
        fVar217 = (float)local_840._0_4_ * fVar230 * -fVar146;
        fVar240 = local_840._4_4_ * fVar253 * -fVar166;
        auVar33._4_4_ = fVar240;
        auVar33._0_4_ = fVar217;
        fVar260 = local_840._8_4_ * fVar270 * -fVar169;
        auVar33._8_4_ = fVar260;
        fVar347 = local_840._12_4_ * fVar346 * -fVar171;
        auVar33._12_4_ = fVar347;
        fVar350 = local_840._16_4_ * fVar349 * -fVar196;
        auVar33._16_4_ = fVar350;
        fVar276 = local_840._20_4_ * fVar309 * -fVar172;
        auVar33._20_4_ = fVar276;
        fVar277 = local_840._24_4_ * fVar313 * -fVar173;
        auVar33._24_4_ = fVar277;
        auVar33._28_4_ = fVar279;
        local_5a0._4_4_ = auVar354._4_4_ + fVar240;
        local_5a0._0_4_ = auVar354._0_4_ + fVar217;
        fStack_598 = auVar354._8_4_ + fVar260;
        fStack_594 = auVar354._12_4_ + fVar347;
        fStack_590 = auVar354._16_4_ + fVar350;
        fStack_58c = auVar354._20_4_ + fVar276;
        fStack_588 = auVar354._24_4_ + fVar277;
        fStack_584 = auVar354._28_4_ + fVar279;
        fVar217 = fVar230 * 0.0 * (float)local_840._0_4_;
        fVar230 = fVar253 * 0.0 * local_840._4_4_;
        auVar34._4_4_ = fVar230;
        auVar34._0_4_ = fVar217;
        fVar240 = fVar270 * 0.0 * local_840._8_4_;
        auVar34._8_4_ = fVar240;
        fVar253 = fVar346 * 0.0 * local_840._12_4_;
        auVar34._12_4_ = fVar253;
        fVar260 = fVar349 * 0.0 * local_840._16_4_;
        auVar34._16_4_ = fVar260;
        fVar270 = fVar309 * 0.0 * local_840._20_4_;
        auVar34._20_4_ = fVar270;
        fVar347 = fVar313 * 0.0 * local_840._24_4_;
        auVar34._24_4_ = fVar347;
        auVar34._28_4_ = fVar366;
        auVar284._0_4_ = (float)local_6e0._0_4_ + fVar217;
        auVar284._4_4_ = (float)local_6e0._4_4_ + fVar230;
        auVar284._8_4_ = (float)uStack_6d8 + fVar240;
        auVar284._12_4_ = uStack_6d8._4_4_ + fVar253;
        auVar284._16_4_ = fStack_6d0 + fVar260;
        auVar284._20_4_ = fStack_6cc + fVar270;
        auVar284._24_4_ = fStack_6c8 + fVar347;
        auVar284._28_4_ = fStack_6c4 + fVar366;
        fVar217 = auVar317._0_4_ * fVar232 * fVar233;
        fVar230 = auVar317._4_4_ * fVar256 * fVar258;
        auVar38._4_4_ = fVar230;
        auVar38._0_4_ = fVar217;
        fVar232 = auVar317._8_4_ * fVar272 * fVar274;
        auVar38._8_4_ = fVar232;
        fVar240 = auVar317._12_4_ * fVar348 * fVar234;
        auVar38._12_4_ = fVar240;
        fVar253 = auVar317._16_4_ * fVar302 * fVar236;
        auVar38._16_4_ = fVar253;
        fVar256 = auVar317._20_4_ * fVar311 * fVar238;
        auVar38._20_4_ = fVar256;
        fVar260 = auVar317._24_4_ * fVar314 * fVar239;
        auVar38._24_4_ = fVar260;
        auVar38._28_4_ = auVar31._28_4_;
        auVar298 = vsubps_avx(auVar298,auVar32);
        auVar327._0_4_ = auVar247._0_4_ + fVar217;
        auVar327._4_4_ = auVar247._4_4_ + fVar230;
        auVar327._8_4_ = auVar247._8_4_ + fVar232;
        auVar327._12_4_ = auVar247._12_4_ + fVar240;
        auVar327._16_4_ = auVar247._16_4_ + fVar253;
        auVar327._20_4_ = auVar247._20_4_ + fVar256;
        auVar327._24_4_ = auVar247._24_4_ + fVar260;
        auVar327._28_4_ = auVar247._28_4_ + auVar31._28_4_;
        fVar217 = auVar317._0_4_ * fVar233 * -fVar218;
        fVar230 = auVar317._4_4_ * fVar258 * -fVar147;
        auVar31._4_4_ = fVar230;
        auVar31._0_4_ = fVar217;
        fVar232 = auVar317._8_4_ * fVar274 * -fVar167;
        auVar31._8_4_ = fVar232;
        fVar240 = auVar317._12_4_ * fVar234 * -fVar216;
        auVar31._12_4_ = fVar240;
        fVar253 = auVar317._16_4_ * fVar236 * -fVar290;
        auVar31._16_4_ = fVar253;
        fVar256 = auVar317._20_4_ * fVar238 * -fVar237;
        auVar31._20_4_ = fVar256;
        fVar260 = auVar317._24_4_ * fVar239 * -fVar291;
        auVar31._24_4_ = fVar260;
        auVar31._28_4_ = fVar379;
        auVar354 = vsubps_avx(auVar354,auVar33);
        auVar340._0_4_ = fVar217 + auVar223._0_4_;
        auVar340._4_4_ = fVar230 + auVar223._4_4_;
        auVar340._8_4_ = fVar232 + auVar223._8_4_;
        auVar340._12_4_ = fVar240 + auVar223._12_4_;
        auVar340._16_4_ = fVar253 + auVar223._16_4_;
        auVar340._20_4_ = fVar256 + auVar223._20_4_;
        auVar340._24_4_ = fVar260 + auVar223._24_4_;
        auVar340._28_4_ = fVar379 + auVar223._28_4_;
        fVar217 = fVar233 * 0.0 * auVar317._0_4_;
        fVar230 = fVar258 * 0.0 * auVar317._4_4_;
        auVar39._4_4_ = fVar230;
        auVar39._0_4_ = fVar217;
        fVar232 = fVar274 * 0.0 * auVar317._8_4_;
        auVar39._8_4_ = fVar232;
        fVar233 = fVar234 * 0.0 * auVar317._12_4_;
        auVar39._12_4_ = fVar233;
        fVar240 = fVar236 * 0.0 * auVar317._16_4_;
        auVar39._16_4_ = fVar240;
        fVar253 = fVar238 * 0.0 * auVar317._20_4_;
        auVar39._20_4_ = fVar253;
        fVar256 = fVar239 * 0.0 * auVar317._24_4_;
        auVar39._24_4_ = fVar256;
        auVar39._28_4_ = fVar279;
        auVar36 = vsubps_avx(_local_6e0,auVar34);
        auVar384._0_4_ = (float)local_1c0._0_4_ + fVar217;
        auVar384._4_4_ = (float)local_1c0._4_4_ + fVar230;
        auVar384._8_4_ = fStack_1b8 + fVar232;
        auVar384._12_4_ = fStack_1b4 + fVar233;
        auVar384._16_4_ = fStack_1b0 + fVar240;
        auVar384._20_4_ = fStack_1ac + fVar253;
        auVar384._24_4_ = fStack_1a8 + fVar256;
        auVar384._28_4_ = fStack_1a4 + fVar279;
        auVar160 = vsubps_avx(auVar247,auVar38);
        auVar31 = vsubps_avx(auVar223,auVar31);
        auVar330 = vsubps_avx(_local_1c0,auVar39);
        auVar267 = vsubps_avx(auVar340,auVar354);
        auVar156 = vsubps_avx(auVar384,auVar36);
        auVar40._4_4_ = auVar36._4_4_ * auVar267._4_4_;
        auVar40._0_4_ = auVar36._0_4_ * auVar267._0_4_;
        auVar40._8_4_ = auVar36._8_4_ * auVar267._8_4_;
        auVar40._12_4_ = auVar36._12_4_ * auVar267._12_4_;
        auVar40._16_4_ = auVar36._16_4_ * auVar267._16_4_;
        auVar40._20_4_ = auVar36._20_4_ * auVar267._20_4_;
        auVar40._24_4_ = auVar36._24_4_ * auVar267._24_4_;
        auVar40._28_4_ = fVar379;
        auVar41._4_4_ = auVar354._4_4_ * auVar156._4_4_;
        auVar41._0_4_ = auVar354._0_4_ * auVar156._0_4_;
        auVar41._8_4_ = auVar354._8_4_ * auVar156._8_4_;
        auVar41._12_4_ = auVar354._12_4_ * auVar156._12_4_;
        auVar41._16_4_ = auVar354._16_4_ * auVar156._16_4_;
        auVar41._20_4_ = auVar354._20_4_ * auVar156._20_4_;
        auVar41._24_4_ = auVar354._24_4_ * auVar156._24_4_;
        auVar41._28_4_ = auVar223._28_4_;
        auVar224 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar298._4_4_ * auVar156._4_4_;
        auVar42._0_4_ = auVar298._0_4_ * auVar156._0_4_;
        auVar42._8_4_ = auVar298._8_4_ * auVar156._8_4_;
        auVar42._12_4_ = auVar298._12_4_ * auVar156._12_4_;
        auVar42._16_4_ = auVar298._16_4_ * auVar156._16_4_;
        auVar42._20_4_ = auVar298._20_4_ * auVar156._20_4_;
        auVar42._24_4_ = auVar298._24_4_ * auVar156._24_4_;
        auVar42._28_4_ = auVar156._28_4_;
        auVar35 = vsubps_avx(auVar327,auVar298);
        auVar43._4_4_ = auVar36._4_4_ * auVar35._4_4_;
        auVar43._0_4_ = auVar36._0_4_ * auVar35._0_4_;
        auVar43._8_4_ = auVar36._8_4_ * auVar35._8_4_;
        auVar43._12_4_ = auVar36._12_4_ * auVar35._12_4_;
        auVar43._16_4_ = auVar36._16_4_ * auVar35._16_4_;
        auVar43._20_4_ = auVar36._20_4_ * auVar35._20_4_;
        auVar43._24_4_ = auVar36._24_4_ * auVar35._24_4_;
        auVar43._28_4_ = auVar247._28_4_;
        auVar37 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar35._4_4_ * auVar354._4_4_;
        auVar44._0_4_ = auVar35._0_4_ * auVar354._0_4_;
        auVar44._8_4_ = auVar35._8_4_ * auVar354._8_4_;
        auVar44._12_4_ = auVar35._12_4_ * auVar354._12_4_;
        auVar44._16_4_ = auVar35._16_4_ * auVar354._16_4_;
        auVar44._20_4_ = auVar35._20_4_ * auVar354._20_4_;
        auVar44._24_4_ = auVar35._24_4_ * auVar354._24_4_;
        auVar44._28_4_ = auVar156._28_4_;
        auVar45._4_4_ = auVar298._4_4_ * auVar267._4_4_;
        auVar45._0_4_ = auVar298._0_4_ * auVar267._0_4_;
        auVar45._8_4_ = auVar298._8_4_ * auVar267._8_4_;
        auVar45._12_4_ = auVar298._12_4_ * auVar267._12_4_;
        auVar45._16_4_ = auVar298._16_4_ * auVar267._16_4_;
        auVar45._20_4_ = auVar298._20_4_ * auVar267._20_4_;
        auVar45._24_4_ = auVar298._24_4_ * auVar267._24_4_;
        auVar45._28_4_ = auVar267._28_4_;
        auVar267 = vsubps_avx(auVar45,auVar44);
        auVar155._0_4_ = auVar224._0_4_ * 0.0 + auVar267._0_4_ + auVar37._0_4_ * 0.0;
        auVar155._4_4_ = auVar224._4_4_ * 0.0 + auVar267._4_4_ + auVar37._4_4_ * 0.0;
        auVar155._8_4_ = auVar224._8_4_ * 0.0 + auVar267._8_4_ + auVar37._8_4_ * 0.0;
        auVar155._12_4_ = auVar224._12_4_ * 0.0 + auVar267._12_4_ + auVar37._12_4_ * 0.0;
        auVar155._16_4_ = auVar224._16_4_ * 0.0 + auVar267._16_4_ + auVar37._16_4_ * 0.0;
        auVar155._20_4_ = auVar224._20_4_ * 0.0 + auVar267._20_4_ + auVar37._20_4_ * 0.0;
        auVar155._24_4_ = auVar224._24_4_ * 0.0 + auVar267._24_4_ + auVar37._24_4_ * 0.0;
        auVar155._28_4_ = auVar267._28_4_ + auVar267._28_4_ + auVar37._28_4_;
        auVar35 = vcmpps_avx(auVar155,ZEXT432(0) << 0x20,2);
        auVar126._4_4_ = fStack_6fc;
        auVar126._0_4_ = local_700;
        auVar126._8_4_ = fStack_6f8;
        auVar126._12_4_ = fStack_6f4;
        auVar126._16_4_ = fStack_6f0;
        auVar126._20_4_ = fStack_6ec;
        auVar126._24_4_ = fStack_6e8;
        auVar126._28_4_ = fStack_6e4;
        auVar160 = vblendvps_avx(auVar160,auVar126,auVar35);
        auVar31 = vblendvps_avx(auVar31,_local_5a0,auVar35);
        auVar330 = vblendvps_avx(auVar330,auVar284,auVar35);
        auVar267 = vblendvps_avx(auVar298,auVar327,auVar35);
        auVar156 = vblendvps_avx(auVar354,auVar340,auVar35);
        auVar224 = vblendvps_avx(auVar36,auVar384,auVar35);
        auVar298 = vblendvps_avx(auVar327,auVar298,auVar35);
        auVar354 = vblendvps_avx(auVar340,auVar354,auVar35);
        _local_760 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
        auStack_750 = auVar163._16_16_;
        auVar163 = vblendvps_avx(auVar384,auVar36,auVar35);
        auVar298 = vsubps_avx(auVar298,auVar160);
        auVar36 = vsubps_avx(auVar354,auVar31);
        auVar37 = vsubps_avx(auVar163,auVar330);
        auVar163 = vsubps_avx(auVar31,auVar156);
        fVar217 = auVar36._0_4_;
        fVar218 = auVar330._0_4_;
        fVar253 = auVar36._4_4_;
        fVar147 = auVar330._4_4_;
        auVar46._4_4_ = fVar147 * fVar253;
        auVar46._0_4_ = fVar218 * fVar217;
        fVar272 = auVar36._8_4_;
        fVar167 = auVar330._8_4_;
        auVar46._8_4_ = fVar167 * fVar272;
        fVar234 = auVar36._12_4_;
        fVar216 = auVar330._12_4_;
        auVar46._12_4_ = fVar216 * fVar234;
        fVar276 = auVar36._16_4_;
        fVar290 = auVar330._16_4_;
        auVar46._16_4_ = fVar290 * fVar276;
        fVar313 = auVar36._20_4_;
        fVar237 = auVar330._20_4_;
        auVar46._20_4_ = fVar237 * fVar313;
        fVar169 = auVar36._24_4_;
        fVar291 = auVar330._24_4_;
        auVar46._24_4_ = fVar291 * fVar169;
        auVar46._28_4_ = auVar354._28_4_;
        fVar230 = auVar31._0_4_;
        fVar170 = auVar37._0_4_;
        fVar256 = auVar31._4_4_;
        fVar174 = auVar37._4_4_;
        auVar47._4_4_ = fVar174 * fVar256;
        auVar47._0_4_ = fVar170 * fVar230;
        fVar274 = auVar31._8_4_;
        fVar193 = auVar37._8_4_;
        auVar47._8_4_ = fVar193 * fVar274;
        fVar350 = auVar31._12_4_;
        fVar194 = auVar37._12_4_;
        auVar47._12_4_ = fVar194 * fVar350;
        fVar309 = auVar31._16_4_;
        fVar195 = auVar37._16_4_;
        auVar47._16_4_ = fVar195 * fVar309;
        fVar314 = auVar31._20_4_;
        fVar197 = auVar37._20_4_;
        auVar47._20_4_ = fVar197 * fVar314;
        fVar171 = auVar31._24_4_;
        fVar198 = auVar37._24_4_;
        auVar47._24_4_ = fVar198 * fVar171;
        auVar47._28_4_ = auVar340._28_4_;
        auVar354 = vsubps_avx(auVar47,auVar46);
        fVar232 = auVar160._0_4_;
        fVar258 = auVar160._4_4_;
        auVar48._4_4_ = fVar174 * fVar258;
        auVar48._0_4_ = fVar170 * fVar232;
        fVar347 = auVar160._8_4_;
        auVar48._8_4_ = fVar193 * fVar347;
        fVar349 = auVar160._12_4_;
        auVar48._12_4_ = fVar194 * fVar349;
        fVar311 = auVar160._16_4_;
        auVar48._16_4_ = fVar195 * fVar311;
        fVar239 = auVar160._20_4_;
        auVar48._20_4_ = fVar197 * fVar239;
        fVar196 = auVar160._24_4_;
        auVar48._24_4_ = fVar198 * fVar196;
        auVar48._28_4_ = auVar340._28_4_;
        fVar233 = auVar298._0_4_;
        auVar371._0_4_ = fVar218 * fVar233;
        fVar260 = auVar298._4_4_;
        auVar371._4_4_ = fVar147 * fVar260;
        fVar346 = auVar298._8_4_;
        auVar371._8_4_ = fVar167 * fVar346;
        fVar302 = auVar298._12_4_;
        auVar371._12_4_ = fVar216 * fVar302;
        fVar238 = auVar298._16_4_;
        auVar371._16_4_ = fVar290 * fVar238;
        fVar146 = auVar298._20_4_;
        auVar371._20_4_ = fVar237 * fVar146;
        fVar172 = auVar298._24_4_;
        auVar371._24_4_ = fVar291 * fVar172;
        auVar371._28_4_ = 0;
        auVar32 = vsubps_avx(auVar371,auVar48);
        auVar49._4_4_ = fVar256 * fVar260;
        auVar49._0_4_ = fVar230 * fVar233;
        auVar49._8_4_ = fVar274 * fVar346;
        auVar49._12_4_ = fVar350 * fVar302;
        auVar49._16_4_ = fVar309 * fVar238;
        auVar49._20_4_ = fVar314 * fVar146;
        auVar49._24_4_ = fVar171 * fVar172;
        auVar49._28_4_ = auVar340._28_4_;
        auVar50._4_4_ = fVar258 * fVar253;
        auVar50._0_4_ = fVar232 * fVar217;
        auVar50._8_4_ = fVar347 * fVar272;
        auVar50._12_4_ = fVar349 * fVar234;
        auVar50._16_4_ = fVar311 * fVar276;
        auVar50._20_4_ = fVar239 * fVar313;
        auVar50._24_4_ = fVar196 * fVar169;
        auVar50._28_4_ = auVar384._28_4_;
        auVar33 = vsubps_avx(auVar50,auVar49);
        auVar34 = vsubps_avx(auVar330,auVar224);
        fVar240 = auVar33._28_4_ + auVar32._28_4_;
        auVar184._0_4_ = auVar33._0_4_ + auVar32._0_4_ * 0.0 + auVar354._0_4_ * 0.0;
        auVar184._4_4_ = auVar33._4_4_ + auVar32._4_4_ * 0.0 + auVar354._4_4_ * 0.0;
        auVar184._8_4_ = auVar33._8_4_ + auVar32._8_4_ * 0.0 + auVar354._8_4_ * 0.0;
        auVar184._12_4_ = auVar33._12_4_ + auVar32._12_4_ * 0.0 + auVar354._12_4_ * 0.0;
        auVar184._16_4_ = auVar33._16_4_ + auVar32._16_4_ * 0.0 + auVar354._16_4_ * 0.0;
        auVar184._20_4_ = auVar33._20_4_ + auVar32._20_4_ * 0.0 + auVar354._20_4_ * 0.0;
        auVar184._24_4_ = auVar33._24_4_ + auVar32._24_4_ * 0.0 + auVar354._24_4_ * 0.0;
        auVar184._28_4_ = fVar240 + auVar354._28_4_;
        fVar279 = auVar163._0_4_;
        fVar308 = auVar163._4_4_;
        auVar51._4_4_ = fVar308 * auVar224._4_4_;
        auVar51._0_4_ = fVar279 * auVar224._0_4_;
        fVar310 = auVar163._8_4_;
        auVar51._8_4_ = fVar310 * auVar224._8_4_;
        fVar312 = auVar163._12_4_;
        auVar51._12_4_ = fVar312 * auVar224._12_4_;
        fVar145 = auVar163._16_4_;
        auVar51._16_4_ = fVar145 * auVar224._16_4_;
        fVar165 = auVar163._20_4_;
        auVar51._20_4_ = fVar165 * auVar224._20_4_;
        fVar168 = auVar163._24_4_;
        auVar51._24_4_ = fVar168 * auVar224._24_4_;
        auVar51._28_4_ = fVar240;
        fVar240 = auVar34._0_4_;
        fVar270 = auVar34._4_4_;
        auVar52._4_4_ = auVar156._4_4_ * fVar270;
        auVar52._0_4_ = auVar156._0_4_ * fVar240;
        fVar348 = auVar34._8_4_;
        auVar52._8_4_ = auVar156._8_4_ * fVar348;
        fVar236 = auVar34._12_4_;
        auVar52._12_4_ = auVar156._12_4_ * fVar236;
        fVar277 = auVar34._16_4_;
        auVar52._16_4_ = auVar156._16_4_ * fVar277;
        fVar166 = auVar34._20_4_;
        auVar52._20_4_ = auVar156._20_4_ * fVar166;
        fVar173 = auVar34._24_4_;
        auVar52._24_4_ = auVar156._24_4_ * fVar173;
        auVar52._28_4_ = auVar33._28_4_;
        auVar163 = vsubps_avx(auVar52,auVar51);
        auVar32 = vsubps_avx(auVar160,auVar267);
        fVar210 = auVar32._0_4_;
        fVar211 = auVar32._4_4_;
        auVar53._4_4_ = fVar211 * auVar224._4_4_;
        auVar53._0_4_ = fVar210 * auVar224._0_4_;
        fVar212 = auVar32._8_4_;
        auVar53._8_4_ = fVar212 * auVar224._8_4_;
        fVar213 = auVar32._12_4_;
        auVar53._12_4_ = fVar213 * auVar224._12_4_;
        fVar214 = auVar32._16_4_;
        auVar53._16_4_ = fVar214 * auVar224._16_4_;
        fVar215 = auVar32._20_4_;
        auVar53._20_4_ = fVar215 * auVar224._20_4_;
        fVar261 = auVar32._24_4_;
        auVar53._24_4_ = fVar261 * auVar224._24_4_;
        auVar53._28_4_ = auVar224._28_4_;
        auVar54._4_4_ = auVar267._4_4_ * fVar270;
        auVar54._0_4_ = auVar267._0_4_ * fVar240;
        auVar54._8_4_ = auVar267._8_4_ * fVar348;
        auVar54._12_4_ = auVar267._12_4_ * fVar236;
        auVar54._16_4_ = auVar267._16_4_ * fVar277;
        auVar54._20_4_ = auVar267._20_4_ * fVar166;
        auVar54._24_4_ = auVar267._24_4_ * fVar173;
        auVar54._28_4_ = auVar354._28_4_;
        auVar354 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar156._4_4_ * fVar211;
        auVar55._0_4_ = auVar156._0_4_ * fVar210;
        auVar55._8_4_ = auVar156._8_4_ * fVar212;
        auVar55._12_4_ = auVar156._12_4_ * fVar213;
        auVar55._16_4_ = auVar156._16_4_ * fVar214;
        auVar55._20_4_ = auVar156._20_4_ * fVar215;
        auVar55._24_4_ = auVar156._24_4_ * fVar261;
        auVar55._28_4_ = auVar224._28_4_;
        auVar56._4_4_ = auVar267._4_4_ * fVar308;
        auVar56._0_4_ = auVar267._0_4_ * fVar279;
        auVar56._8_4_ = auVar267._8_4_ * fVar310;
        auVar56._12_4_ = auVar267._12_4_ * fVar312;
        auVar56._16_4_ = auVar267._16_4_ * fVar145;
        auVar56._20_4_ = auVar267._20_4_ * fVar165;
        auVar56._24_4_ = auVar267._24_4_ * fVar168;
        auVar56._28_4_ = auVar267._28_4_;
        auVar267 = vsubps_avx(auVar56,auVar55);
        auVar164 = ZEXT864(0) << 0x20;
        auVar249._0_4_ = auVar163._0_4_ * 0.0 + auVar267._0_4_ + auVar354._0_4_ * 0.0;
        auVar249._4_4_ = auVar163._4_4_ * 0.0 + auVar267._4_4_ + auVar354._4_4_ * 0.0;
        auVar249._8_4_ = auVar163._8_4_ * 0.0 + auVar267._8_4_ + auVar354._8_4_ * 0.0;
        auVar249._12_4_ = auVar163._12_4_ * 0.0 + auVar267._12_4_ + auVar354._12_4_ * 0.0;
        auVar249._16_4_ = auVar163._16_4_ * 0.0 + auVar267._16_4_ + auVar354._16_4_ * 0.0;
        auVar249._20_4_ = auVar163._20_4_ * 0.0 + auVar267._20_4_ + auVar354._20_4_ * 0.0;
        auVar249._24_4_ = auVar163._24_4_ * 0.0 + auVar267._24_4_ + auVar354._24_4_ * 0.0;
        auVar249._28_4_ = auVar267._28_4_ + auVar267._28_4_ + auVar354._28_4_;
        auVar163 = vmaxps_avx(auVar184,auVar249);
        auVar163 = vcmpps_avx(auVar163,ZEXT832(0) << 0x20,2);
        auVar180 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
        auVar180 = vpand_avx(auVar180,_local_760);
        auVar204 = vpmovsxwd_avx(auVar180);
        auVar205 = vpunpckhwd_avx(auVar180,auVar180);
        auVar225._16_16_ = auVar205;
        auVar225._0_16_ = auVar204;
        if ((((((((auVar225 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar225 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar225 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar225 >> 0x7f,0) == '\0') &&
              (auVar225 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar205 >> 0x3f,0) == '\0') &&
            (auVar225 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar205[0xf]) {
LAB_01080bc0:
          auVar331 = ZEXT3264(local_520);
          auVar386 = ZEXT3264(local_500);
          auVar252 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar229 = ZEXT3264(auVar225);
        }
        else {
          auVar57._4_4_ = fVar270 * fVar253;
          auVar57._0_4_ = fVar240 * fVar217;
          auVar57._8_4_ = fVar348 * fVar272;
          auVar57._12_4_ = fVar236 * fVar234;
          auVar57._16_4_ = fVar277 * fVar276;
          auVar57._20_4_ = fVar166 * fVar313;
          auVar57._24_4_ = fVar173 * fVar169;
          auVar57._28_4_ = auVar205._12_4_;
          auVar355._0_4_ = fVar279 * fVar170;
          auVar355._4_4_ = fVar308 * fVar174;
          auVar355._8_4_ = fVar310 * fVar193;
          auVar355._12_4_ = fVar312 * fVar194;
          auVar355._16_4_ = fVar145 * fVar195;
          auVar355._20_4_ = fVar165 * fVar197;
          auVar355._24_4_ = fVar168 * fVar198;
          auVar355._28_4_ = 0;
          auVar163 = vsubps_avx(auVar355,auVar57);
          auVar58._4_4_ = fVar211 * fVar174;
          auVar58._0_4_ = fVar210 * fVar170;
          auVar58._8_4_ = fVar212 * fVar193;
          auVar58._12_4_ = fVar213 * fVar194;
          auVar58._16_4_ = fVar214 * fVar195;
          auVar58._20_4_ = fVar215 * fVar197;
          auVar58._24_4_ = fVar261 * fVar198;
          auVar58._28_4_ = auVar37._28_4_;
          auVar59._4_4_ = fVar270 * fVar260;
          auVar59._0_4_ = fVar240 * fVar233;
          auVar59._8_4_ = fVar348 * fVar346;
          auVar59._12_4_ = fVar236 * fVar302;
          auVar59._16_4_ = fVar277 * fVar238;
          auVar59._20_4_ = fVar166 * fVar146;
          auVar59._24_4_ = fVar173 * fVar172;
          auVar59._28_4_ = auVar34._28_4_;
          auVar156 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar308 * fVar260;
          auVar60._0_4_ = fVar279 * fVar233;
          auVar60._8_4_ = fVar310 * fVar346;
          auVar60._12_4_ = fVar312 * fVar302;
          auVar60._16_4_ = fVar145 * fVar238;
          auVar60._20_4_ = fVar165 * fVar146;
          auVar60._24_4_ = fVar168 * fVar172;
          auVar60._28_4_ = auVar184._28_4_;
          auVar61._4_4_ = fVar211 * fVar253;
          auVar61._0_4_ = fVar210 * fVar217;
          auVar61._8_4_ = fVar212 * fVar272;
          auVar61._12_4_ = fVar213 * fVar234;
          auVar61._16_4_ = fVar214 * fVar276;
          auVar61._20_4_ = fVar215 * fVar313;
          auVar61._24_4_ = fVar261 * fVar169;
          auVar61._28_4_ = auVar36._28_4_;
          auVar224 = vsubps_avx(auVar61,auVar60);
          auVar299._0_4_ = auVar163._0_4_ * 0.0 + auVar224._0_4_ + auVar156._0_4_ * 0.0;
          auVar299._4_4_ = auVar163._4_4_ * 0.0 + auVar224._4_4_ + auVar156._4_4_ * 0.0;
          auVar299._8_4_ = auVar163._8_4_ * 0.0 + auVar224._8_4_ + auVar156._8_4_ * 0.0;
          auVar299._12_4_ = auVar163._12_4_ * 0.0 + auVar224._12_4_ + auVar156._12_4_ * 0.0;
          auVar299._16_4_ = auVar163._16_4_ * 0.0 + auVar224._16_4_ + auVar156._16_4_ * 0.0;
          auVar299._20_4_ = auVar163._20_4_ * 0.0 + auVar224._20_4_ + auVar156._20_4_ * 0.0;
          auVar299._24_4_ = auVar163._24_4_ * 0.0 + auVar224._24_4_ + auVar156._24_4_ * 0.0;
          auVar299._28_4_ = auVar36._28_4_ + auVar224._28_4_ + auVar184._28_4_;
          auVar267 = vrcpps_avx(auVar299);
          fVar217 = auVar267._0_4_;
          fVar233 = auVar267._4_4_;
          auVar62._4_4_ = auVar299._4_4_ * fVar233;
          auVar62._0_4_ = auVar299._0_4_ * fVar217;
          fVar240 = auVar267._8_4_;
          auVar62._8_4_ = auVar299._8_4_ * fVar240;
          fVar253 = auVar267._12_4_;
          auVar62._12_4_ = auVar299._12_4_ * fVar253;
          fVar260 = auVar267._16_4_;
          auVar62._16_4_ = auVar299._16_4_ * fVar260;
          fVar270 = auVar267._20_4_;
          auVar62._20_4_ = auVar299._20_4_ * fVar270;
          fVar272 = auVar267._24_4_;
          auVar62._24_4_ = auVar299._24_4_ * fVar272;
          auVar62._28_4_ = auVar34._28_4_;
          auVar356._8_4_ = 0x3f800000;
          auVar356._0_8_ = &DAT_3f8000003f800000;
          auVar356._12_4_ = 0x3f800000;
          auVar356._16_4_ = 0x3f800000;
          auVar356._20_4_ = 0x3f800000;
          auVar356._24_4_ = 0x3f800000;
          auVar356._28_4_ = 0x3f800000;
          auVar354 = vsubps_avx(auVar356,auVar62);
          fVar217 = auVar354._0_4_ * fVar217 + fVar217;
          fVar233 = auVar354._4_4_ * fVar233 + fVar233;
          fVar240 = auVar354._8_4_ * fVar240 + fVar240;
          fVar253 = auVar354._12_4_ * fVar253 + fVar253;
          fVar260 = auVar354._16_4_ * fVar260 + fVar260;
          fVar270 = auVar354._20_4_ * fVar270 + fVar270;
          fVar272 = auVar354._24_4_ * fVar272 + fVar272;
          auVar63._4_4_ =
               (auVar163._4_4_ * fVar258 + auVar156._4_4_ * fVar256 + auVar224._4_4_ * fVar147) *
               fVar233;
          auVar63._0_4_ =
               (auVar163._0_4_ * fVar232 + auVar156._0_4_ * fVar230 + auVar224._0_4_ * fVar218) *
               fVar217;
          auVar63._8_4_ =
               (auVar163._8_4_ * fVar347 + auVar156._8_4_ * fVar274 + auVar224._8_4_ * fVar167) *
               fVar240;
          auVar63._12_4_ =
               (auVar163._12_4_ * fVar349 + auVar156._12_4_ * fVar350 + auVar224._12_4_ * fVar216) *
               fVar253;
          auVar63._16_4_ =
               (auVar163._16_4_ * fVar311 + auVar156._16_4_ * fVar309 + auVar224._16_4_ * fVar290) *
               fVar260;
          auVar63._20_4_ =
               (auVar163._20_4_ * fVar239 + auVar156._20_4_ * fVar314 + auVar224._20_4_ * fVar237) *
               fVar270;
          auVar63._24_4_ =
               (auVar163._24_4_ * fVar196 + auVar156._24_4_ * fVar171 + auVar224._24_4_ * fVar291) *
               fVar272;
          auVar63._28_4_ = auVar160._28_4_ + auVar298._28_4_ + auVar330._28_4_;
          auVar204 = vpermilps_avx(ZEXT416(local_820),0);
          auVar226._16_16_ = auVar204;
          auVar226._0_16_ = auVar204;
          auVar163 = vcmpps_avx(auVar226,auVar63,2);
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar265._4_4_ = uVar13;
          auVar265._0_4_ = uVar13;
          auVar265._8_4_ = uVar13;
          auVar265._12_4_ = uVar13;
          auVar265._16_4_ = uVar13;
          auVar265._20_4_ = uVar13;
          auVar265._24_4_ = uVar13;
          auVar265._28_4_ = uVar13;
          auVar330 = vcmpps_avx(auVar63,auVar265,2);
          auVar163 = vandps_avx(auVar330,auVar163);
          auVar204 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
          auVar180 = vpand_avx(auVar180,auVar204);
          auVar204 = vpmovsxwd_avx(auVar180);
          auVar205 = vpshufd_avx(auVar180,0xee);
          auVar205 = vpmovsxwd_avx(auVar205);
          auVar225._16_16_ = auVar205;
          auVar225._0_16_ = auVar204;
          auVar386 = ZEXT3264(local_500);
          auVar331 = ZEXT3264(local_520);
          if ((((((((auVar225 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar225 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar225 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar225 >> 0x7f,0) == '\0') &&
                (auVar225 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar205 >> 0x3f,0) == '\0') &&
              (auVar225 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar205[0xf]) goto LAB_01080bc0;
          auVar163 = vcmpps_avx(ZEXT832(0) << 0x20,auVar299,4);
          auVar204 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
          auVar180 = vpand_avx(auVar180,auVar204);
          auVar204 = vpmovsxwd_avx(auVar180);
          auVar180 = vpunpckhwd_avx(auVar180,auVar180);
          auVar229 = ZEXT1664(auVar180);
          auVar285._16_16_ = auVar180;
          auVar285._0_16_ = auVar204;
          auVar252 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          if ((((((((auVar285 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar285 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar285 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar285 >> 0x7f,0) != '\0') ||
                (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar180 >> 0x3f,0) != '\0') ||
              (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar180[0xf] < '\0') {
            auVar227._0_4_ = auVar184._0_4_ * fVar217;
            auVar227._4_4_ = auVar184._4_4_ * fVar233;
            auVar227._8_4_ = auVar184._8_4_ * fVar240;
            auVar227._12_4_ = auVar184._12_4_ * fVar253;
            auVar227._16_4_ = auVar184._16_4_ * fVar260;
            auVar227._20_4_ = auVar184._20_4_ * fVar270;
            auVar227._24_4_ = auVar184._24_4_ * fVar272;
            auVar227._28_4_ = 0;
            auVar64._4_4_ = auVar249._4_4_ * fVar233;
            auVar64._0_4_ = auVar249._0_4_ * fVar217;
            auVar64._8_4_ = auVar249._8_4_ * fVar240;
            auVar64._12_4_ = auVar249._12_4_ * fVar253;
            auVar64._16_4_ = auVar249._16_4_ * fVar260;
            auVar64._20_4_ = auVar249._20_4_ * fVar270;
            auVar64._24_4_ = auVar249._24_4_ * fVar272;
            auVar64._28_4_ = auVar354._28_4_ + auVar267._28_4_;
            auVar266._8_4_ = 0x3f800000;
            auVar266._0_8_ = &DAT_3f8000003f800000;
            auVar266._12_4_ = 0x3f800000;
            auVar266._16_4_ = 0x3f800000;
            auVar266._20_4_ = 0x3f800000;
            auVar266._24_4_ = 0x3f800000;
            auVar266._28_4_ = 0x3f800000;
            auVar163 = vsubps_avx(auVar266,auVar227);
            auVar163 = vblendvps_avx(auVar163,auVar227,auVar35);
            auVar386 = ZEXT3264(auVar163);
            auVar163 = vsubps_avx(auVar266,auVar64);
            auVar229 = ZEXT3264(auVar163);
            _local_200 = vblendvps_avx(auVar163,auVar64,auVar35);
            auVar252 = ZEXT3264(auVar285);
            auVar331 = ZEXT3264(auVar63);
          }
        }
        local_520 = auVar331._0_32_;
        local_500 = auVar386._0_32_;
        auVar267 = auVar252._0_32_;
        auVar301 = ZEXT3264(_local_740);
        auVar163 = local_500;
        auVar330 = local_520;
        _local_670 = auVar353;
        _local_660 = auVar382;
        _local_650 = auVar370;
        if ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar267 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar267 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar267 >> 0x7f,0) == '\0') &&
              (auVar252 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar267 >> 0xbf,0) == '\0') &&
            (auVar252 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar252[0x1f]) {
LAB_0107f6e9:
          local_520 = auVar330;
          local_500 = auVar163;
          auVar252 = ZEXT3264(_local_600);
          auVar353 = _local_670;
          auVar382 = _local_660;
          auVar370 = _local_650;
        }
        else {
          auVar156 = vsubps_avx(auVar317,local_840);
          fVar230 = (float)local_840._0_4_ + auVar386._0_4_ * auVar156._0_4_;
          fVar232 = local_840._4_4_ + auVar386._4_4_ * auVar156._4_4_;
          fVar233 = local_840._8_4_ + auVar386._8_4_ * auVar156._8_4_;
          fVar240 = local_840._12_4_ + auVar386._12_4_ * auVar156._12_4_;
          fVar253 = local_840._16_4_ + auVar386._16_4_ * auVar156._16_4_;
          fVar256 = local_840._20_4_ + auVar386._20_4_ * auVar156._20_4_;
          fVar258 = local_840._24_4_ + auVar386._24_4_ * auVar156._24_4_;
          fVar260 = auVar156._28_4_ + 0.0;
          fVar217 = *(float *)((long)local_848->ray_space + k * 4 + -0x10);
          auVar65._4_4_ = (fVar232 + fVar232) * fVar217;
          auVar65._0_4_ = (fVar230 + fVar230) * fVar217;
          auVar65._8_4_ = (fVar233 + fVar233) * fVar217;
          auVar65._12_4_ = (fVar240 + fVar240) * fVar217;
          auVar65._16_4_ = (fVar253 + fVar253) * fVar217;
          auVar65._20_4_ = (fVar256 + fVar256) * fVar217;
          auVar65._24_4_ = (fVar258 + fVar258) * fVar217;
          auVar65._28_4_ = fVar260 + fVar260;
          auVar156 = vcmpps_avx(local_520,auVar65,6);
          auVar224 = auVar267 & auVar156;
          auVar252 = ZEXT3264(_local_600);
          if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar224 >> 0x7f,0) != '\0') ||
                (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar224 >> 0xbf,0) != '\0') ||
              (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar224[0x1f] < '\0') {
            local_2a0 = vandps_avx(auVar156,auVar267);
            local_200._0_4_ = (float)local_200._0_4_ + (float)local_200._0_4_ + -1.0;
            local_200._4_4_ = (float)local_200._4_4_ + (float)local_200._4_4_ + -1.0;
            uStack_1f8._0_4_ = (float)uStack_1f8 + (float)uStack_1f8 + -1.0;
            uStack_1f8._4_4_ = uStack_1f8._4_4_ + uStack_1f8._4_4_ + -1.0;
            uStack_1f0._0_4_ = (float)uStack_1f0 + (float)uStack_1f0 + -1.0;
            uStack_1f0._4_4_ = uStack_1f0._4_4_ + uStack_1f0._4_4_ + -1.0;
            uStack_1e8._0_4_ = (float)uStack_1e8 + (float)uStack_1e8 + -1.0;
            uStack_1e8._4_4_ = uStack_1e8._4_4_ + uStack_1e8._4_4_ + -1.0;
            local_360 = local_500;
            auVar136 = _local_200;
            auVar267 = _local_200;
            local_340 = (float)local_200._0_4_;
            fStack_33c = (float)local_200._4_4_;
            fStack_338 = (float)uStack_1f8;
            fStack_334 = uStack_1f8._4_4_;
            fStack_330 = (float)uStack_1f0;
            fStack_32c = uStack_1f0._4_4_;
            fStack_328 = (float)uStack_1e8;
            fStack_324 = uStack_1e8._4_4_;
            local_320 = local_520;
            local_300 = 0;
            local_2fc = uVar16;
            local_2f0 = auVar245._0_8_;
            uStack_2e8 = uStack_868;
            uStack_648 = auVar370._8_8_;
            local_2e0 = auVar370._0_8_;
            uStack_2d8 = uStack_648;
            uStack_658 = auVar382._8_8_;
            local_2d0 = auVar382._0_8_;
            uStack_2c8 = uStack_658;
            uStack_668 = auVar353._8_8_;
            local_2c0 = auVar353._0_8_;
            uStack_2b8 = uStack_668;
            if ((pGVar144->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar202._0_4_ = 1.0 / (float)(int)uVar16;
              auVar202._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar180 = vshufps_avx(auVar202,auVar202,0);
              local_280[0] = auVar180._0_4_ * (auVar386._0_4_ + 0.0);
              local_280[1] = auVar180._4_4_ * (auVar386._4_4_ + 1.0);
              local_280[2] = auVar180._8_4_ * (auVar386._8_4_ + 2.0);
              local_280[3] = auVar180._12_4_ * (auVar386._12_4_ + 3.0);
              fStack_270 = auVar180._0_4_ * (auVar386._16_4_ + 4.0);
              fStack_26c = auVar180._4_4_ * (auVar386._20_4_ + 5.0);
              fStack_268 = auVar180._8_4_ * (auVar386._24_4_ + 6.0);
              fStack_264 = auVar386._28_4_ + 7.0;
              uStack_1f0 = auVar136._16_8_;
              uStack_1e8 = auVar267._24_8_;
              local_260 = local_200;
              uStack_258 = uStack_1f8;
              uStack_250 = uStack_1f0;
              uStack_248 = uStack_1e8;
              local_240 = local_520;
              auVar185._8_4_ = 0x7f800000;
              auVar185._0_8_ = 0x7f8000007f800000;
              auVar185._12_4_ = 0x7f800000;
              auVar185._16_4_ = 0x7f800000;
              auVar185._20_4_ = 0x7f800000;
              auVar185._24_4_ = 0x7f800000;
              auVar185._28_4_ = 0x7f800000;
              auVar156 = vblendvps_avx(auVar185,local_520,local_2a0);
              auVar224 = vshufps_avx(auVar156,auVar156,0xb1);
              auVar224 = vminps_avx(auVar156,auVar224);
              auVar298 = vshufpd_avx(auVar224,auVar224,5);
              auVar224 = vminps_avx(auVar224,auVar298);
              auVar298 = vperm2f128_avx(auVar224,auVar224,1);
              auVar224 = vminps_avx(auVar224,auVar298);
              auVar224 = vcmpps_avx(auVar156,auVar224,0);
              auVar298 = local_2a0 & auVar224;
              auVar156 = local_2a0;
              if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar298 >> 0x7f,0) != '\0') ||
                    (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar298 >> 0xbf,0) != '\0') ||
                  (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar298[0x1f] < '\0') {
                auVar156 = vandps_avx(auVar224,local_2a0);
              }
              uVar138 = vmovmskps_avx(auVar156);
              uVar21 = 0;
              if (uVar138 != 0) {
                for (; (uVar138 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar139 = (ulong)uVar21;
              _local_200 = auVar267;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar144->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar217 = local_280[uVar139];
                fVar232 = 1.0 - fVar217;
                fVar230 = fVar217 * 3.0;
                auVar180 = ZEXT416((uint)((fVar232 * -2.0 * fVar217 + fVar217 * fVar217) * 0.5));
                auVar180 = vshufps_avx(auVar180,auVar180,0);
                auVar204 = ZEXT416((uint)(((fVar232 + fVar232) * (fVar230 + 2.0) +
                                          fVar232 * fVar232 * -3.0) * 0.5));
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar205 = ZEXT416((uint)(((fVar217 + fVar217) * (fVar230 + -5.0) +
                                          fVar217 * fVar230) * 0.5));
                auVar205 = vshufps_avx(auVar205,auVar205,0);
                uVar13 = *(undefined4 *)((long)&local_260 + uVar139 * 4);
                auVar222 = ZEXT416((uint)((fVar217 * (fVar232 + fVar232) - fVar232 * fVar232) * 0.5)
                                  );
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar179._0_4_ =
                     auVar222._0_4_ * fVar241 +
                     auVar205._0_4_ * fVar367 + auVar180._0_4_ * fVar351 + auVar204._0_4_ * fVar380;
                auVar179._4_4_ =
                     auVar222._4_4_ * fVar254 +
                     auVar205._4_4_ * fVar373 + auVar180._4_4_ * fVar359 + auVar204._4_4_ * fVar387;
                auVar179._8_4_ =
                     auVar222._8_4_ * auVar245._8_4_ +
                     auVar205._8_4_ * auVar370._8_4_ +
                     auVar180._8_4_ * auVar353._8_4_ + auVar204._8_4_ * auVar382._8_4_;
                auVar179._12_4_ =
                     auVar222._12_4_ * auVar245._12_4_ +
                     auVar205._12_4_ * auVar370._12_4_ +
                     auVar180._12_4_ * auVar353._12_4_ + auVar204._12_4_ * auVar382._12_4_;
                auVar229 = ZEXT464(*(uint *)(local_240 + uVar139 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_240 + uVar139 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar179._0_4_;
                uVar17 = vextractps_avx(auVar179,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar17;
                uVar17 = vextractps_avx(auVar179,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar17;
                *(float *)(ray + k * 4 + 0xf0) = fVar217;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar13;
                *(uint *)(ray + k * 4 + 0x110) = uVar15;
                *(uint *)(ray + k * 4 + 0x120) = uVar140;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_7a0 = vshufps_avx(ZEXT416(uVar140),ZEXT416(uVar140),0);
                _auStack_790 = auVar317._16_16_;
                _local_780 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
                _auStack_770 = auVar160._16_16_;
                _auStack_7b0 = auVar31._16_16_;
                auStack_7b8 = (undefined1  [8])uStack_648;
                local_7c0 = (Geometry *)auVar370._0_8_;
                _auStack_6b0 = auVar247._16_16_;
                uStack_6b8 = uStack_658;
                local_6c0 = (undefined1  [8])auVar382._0_8_;
                _auStack_630 = auVar223._16_16_;
                uStack_638 = uStack_668;
                local_640 = (undefined1  [8])auVar353._0_8_;
                _local_6e0 = *local_708;
                local_580 = local_2a0;
                _local_1a0 = auVar162;
                _local_180 = auVar24;
                do {
                  local_760._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_3c0 = local_280[uVar139];
                  local_3b0 = *(undefined4 *)((long)&local_260 + uVar139 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_240 + uVar139 * 4);
                  fVar230 = 1.0 - local_3c0;
                  fVar217 = local_3c0 * 3.0;
                  auVar180 = ZEXT416((uint)((fVar230 * -2.0 * local_3c0 + local_3c0 * local_3c0) *
                                           0.5));
                  auVar180 = vshufps_avx(auVar180,auVar180,0);
                  auVar204 = ZEXT416((uint)(((fVar230 + fVar230) * (fVar217 + 2.0) +
                                            fVar230 * fVar230 * -3.0) * 0.5));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar205 = ZEXT416((uint)(((local_3c0 + local_3c0) * (fVar217 + -5.0) +
                                            local_3c0 * fVar217) * 0.5));
                  auVar205 = vshufps_avx(auVar205,auVar205,0);
                  local_7f0.context = context->user;
                  auVar222 = ZEXT416((uint)((local_3c0 * (fVar230 + fVar230) - fVar230 * fVar230) *
                                           0.5));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar207._0_4_ =
                       auVar222._0_4_ * fVar241 +
                       auVar205._0_4_ * (float)local_7c0 +
                       auVar180._0_4_ * (float)local_640._0_4_ +
                       auVar204._0_4_ * (float)local_6c0._0_4_;
                  auVar207._4_4_ =
                       auVar222._4_4_ * fVar254 +
                       auVar205._4_4_ * local_7c0._4_4_ +
                       auVar180._4_4_ * (float)local_640._4_4_ +
                       auVar204._4_4_ * (float)local_6c0._4_4_;
                  auVar207._8_4_ =
                       auVar222._8_4_ * auVar245._8_4_ +
                       auVar205._8_4_ * (float)auStack_7b8._0_4_ +
                       auVar180._8_4_ * (float)uStack_638 + auVar204._8_4_ * (float)uStack_6b8;
                  auVar207._12_4_ =
                       auVar222._12_4_ * auVar245._12_4_ +
                       auVar205._12_4_ * (float)auStack_7b8._4_4_ +
                       auVar180._12_4_ * uStack_638._4_4_ + auVar204._12_4_ * uStack_6b8._4_4_;
                  auVar180 = vshufps_avx(auVar207,auVar207,0);
                  local_3f0[0] = (RTCHitN)auVar180[0];
                  local_3f0[1] = (RTCHitN)auVar180[1];
                  local_3f0[2] = (RTCHitN)auVar180[2];
                  local_3f0[3] = (RTCHitN)auVar180[3];
                  local_3f0[4] = (RTCHitN)auVar180[4];
                  local_3f0[5] = (RTCHitN)auVar180[5];
                  local_3f0[6] = (RTCHitN)auVar180[6];
                  local_3f0[7] = (RTCHitN)auVar180[7];
                  local_3f0[8] = (RTCHitN)auVar180[8];
                  local_3f0[9] = (RTCHitN)auVar180[9];
                  local_3f0[10] = (RTCHitN)auVar180[10];
                  local_3f0[0xb] = (RTCHitN)auVar180[0xb];
                  local_3f0[0xc] = (RTCHitN)auVar180[0xc];
                  local_3f0[0xd] = (RTCHitN)auVar180[0xd];
                  local_3f0[0xe] = (RTCHitN)auVar180[0xe];
                  local_3f0[0xf] = (RTCHitN)auVar180[0xf];
                  local_3e0 = vshufps_avx(auVar207,auVar207,0x55);
                  local_3d0 = vshufps_avx(auVar207,auVar207,0xaa);
                  fStack_3bc = local_3c0;
                  fStack_3b8 = local_3c0;
                  fStack_3b4 = local_3c0;
                  uStack_3ac = local_3b0;
                  uStack_3a8 = local_3b0;
                  uStack_3a4 = local_3b0;
                  local_3a0 = local_780;
                  uStack_398 = uStack_778;
                  local_390 = local_7a0;
                  uStack_388 = uStack_798;
                  vcmpps_avx(auVar164._0_32_,auVar164._0_32_,0xf);
                  uStack_37c = (local_7f0.context)->instID[0];
                  local_380 = uStack_37c;
                  uStack_378 = uStack_37c;
                  uStack_374 = uStack_37c;
                  uStack_370 = (local_7f0.context)->instPrimID[0];
                  uStack_36c = uStack_370;
                  uStack_368 = uStack_370;
                  uStack_364 = uStack_370;
                  local_860 = local_6e0;
                  uStack_858 = uStack_6d8;
                  local_7f0.valid = (int *)&local_860;
                  local_7f0.geometryUserPtr = pGVar144->userPtr;
                  local_7f0.hit = local_3f0;
                  local_7f0.N = 4;
                  auVar180 = vpcmpeqd_avx(local_3e0,local_3e0);
                  local_840._0_8_ = uVar139;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar144->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar144->intersectionFilterN)(&local_7f0);
                    auVar331 = ZEXT3264(local_520);
                    auVar386 = ZEXT3264(local_500);
                    auVar180 = vpcmpeqd_avx(auVar180,auVar180);
                    auVar164 = ZEXT1664(ZEXT816(0) << 0x40);
                    uVar139 = local_840._0_8_;
                    fVar242 = (float)local_5c0._0_4_;
                    fVar255 = (float)local_5c0._4_4_;
                    fVar257 = fStack_5b8;
                    fVar259 = fStack_5b4;
                    fVar338 = fStack_5b0;
                    fVar231 = fStack_5ac;
                    fVar343 = fStack_5a8;
                    fVar235 = fStack_5a4;
                  }
                  auVar229 = ZEXT1664(auVar180);
                  auVar119._8_8_ = uStack_858;
                  auVar119._0_8_ = local_860;
                  if (auVar119 == (undefined1  [16])0x0) {
                    auVar204 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar204 = auVar204 ^ auVar180;
                    auVar301 = ZEXT3264(_local_740);
                  }
                  else {
                    p_Var20 = context->args->filter;
                    if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar144->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var20)(&local_7f0);
                      auVar331 = ZEXT3264(local_520);
                      auVar386 = ZEXT3264(local_500);
                      auVar180 = vpcmpeqd_avx(auVar180,auVar180);
                      auVar229 = ZEXT1664(auVar180);
                      auVar164 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar139 = local_840._0_8_;
                      fVar242 = (float)local_5c0._0_4_;
                      fVar255 = (float)local_5c0._4_4_;
                      fVar257 = fStack_5b8;
                      fVar259 = fStack_5b4;
                      fVar338 = fStack_5b0;
                      fVar231 = fStack_5ac;
                      fVar343 = fStack_5a8;
                      fVar235 = fStack_5a4;
                    }
                    auVar120._8_8_ = uStack_858;
                    auVar120._0_8_ = local_860;
                    auVar180 = vpcmpeqd_avx(auVar120,_DAT_01feba10);
                    auVar204 = auVar180 ^ auVar229._0_16_;
                    auVar301 = ZEXT3264(_local_740);
                    if (auVar120 != (undefined1  [16])0x0) {
                      auVar180 = auVar180 ^ auVar229._0_16_;
                      auVar205 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])local_7f0.hit);
                      *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar205;
                      auVar205 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar205;
                      auVar205 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar205;
                      auVar205 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar205;
                      auVar205 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar205;
                      auVar205 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar205;
                      auVar205 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar205;
                      auVar205 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar205;
                      auVar180 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar180;
                    }
                  }
                  auVar330 = auVar331._0_32_;
                  auVar183._8_8_ = 0x100000001;
                  auVar183._0_8_ = 0x100000001;
                  if ((auVar183 & auVar204) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_760._0_4_;
                  }
                  *(undefined4 *)(local_580 + uVar139 * 4) = 0;
                  uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar162._4_4_ = uVar13;
                  auVar162._0_4_ = uVar13;
                  auVar162._8_4_ = uVar13;
                  auVar162._12_4_ = uVar13;
                  auVar162._16_4_ = uVar13;
                  auVar162._20_4_ = uVar13;
                  auVar162._24_4_ = uVar13;
                  auVar162._28_4_ = uVar13;
                  auVar163 = vcmpps_avx(auVar330,auVar162,2);
                  auVar160 = vandps_avx(auVar163,local_580);
                  local_580 = local_580 & auVar163;
                  bVar115 = (local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar116 = (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar114 = (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar113 = SUB321(local_580 >> 0x7f,0) != '\0';
                  bVar112 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar111 = SUB321(local_580 >> 0xbf,0) != '\0';
                  bVar110 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar109 = local_580[0x1f] < '\0';
                  if (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111) ||
                      bVar110) || bVar109) {
                    auVar192._8_4_ = 0x7f800000;
                    auVar192._0_8_ = 0x7f8000007f800000;
                    auVar192._12_4_ = 0x7f800000;
                    auVar192._16_4_ = 0x7f800000;
                    auVar192._20_4_ = 0x7f800000;
                    auVar192._24_4_ = 0x7f800000;
                    auVar192._28_4_ = 0x7f800000;
                    auVar163 = vblendvps_avx(auVar192,auVar330,auVar160);
                    auVar31 = vshufps_avx(auVar163,auVar163,0xb1);
                    auVar31 = vminps_avx(auVar163,auVar31);
                    auVar267 = vshufpd_avx(auVar31,auVar31,5);
                    auVar31 = vminps_avx(auVar31,auVar267);
                    auVar267 = vperm2f128_avx(auVar31,auVar31,1);
                    auVar229 = ZEXT3264(auVar267);
                    auVar31 = vminps_avx(auVar31,auVar267);
                    auVar31 = vcmpps_avx(auVar163,auVar31,0);
                    auVar267 = auVar160 & auVar31;
                    auVar163 = auVar160;
                    if ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar267 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar267 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar267 >> 0x7f,0) != '\0') ||
                          (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar267 >> 0xbf,0) != '\0') ||
                        (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar267[0x1f] < '\0') {
                      auVar163 = vandps_avx(auVar31,auVar160);
                    }
                    uVar138 = vmovmskps_avx(auVar163);
                    uVar21 = 0;
                    if (uVar138 != 0) {
                      for (; (uVar138 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar139 = (ulong)uVar21;
                  }
                  auVar163 = auVar386._0_32_;
                  local_580 = auVar160;
                } while (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111)
                         || bVar110) || bVar109);
              }
              goto LAB_0107f6e9;
            }
          }
        }
      }
      _local_650 = auVar370;
      _local_660 = auVar382;
      _local_670 = auVar353;
      if (8 < (int)uVar16) {
        _local_600 = auVar252._0_32_;
        _local_180 = vpshufd_avx(ZEXT416(uVar16),0);
        auVar180 = vshufps_avx(_local_5e0,_local_5e0,0);
        register0x00001210 = auVar180;
        _local_1a0 = auVar180;
        auVar123._4_4_ = uStack_81c;
        auVar123._0_4_ = local_820;
        auVar123._8_4_ = fStack_818;
        auVar123._12_4_ = fStack_814;
        auVar180 = vpermilps_avx(auVar123,0);
        register0x00001210 = auVar180;
        _local_1c0 = auVar180;
        auVar152._0_4_ = 1.0 / (float)local_480._0_4_;
        auVar152._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar180 = vshufps_avx(auVar152,auVar152,0);
        _fStack_470 = auVar180;
        _local_480 = auVar180;
        auVar180 = vshufps_avx(ZEXT416(uVar140),ZEXT416(uVar140),0);
        local_1e0._0_16_ = auVar180;
        local_140 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
        auVar164 = ZEXT1664(local_140);
        lVar142 = 8;
        fVar217 = (float)local_620._0_4_;
        fVar230 = (float)local_620._4_4_;
        fVar232 = fStack_618;
        fVar233 = fStack_614;
        fVar240 = fStack_610;
        fVar253 = fStack_60c;
        fVar256 = fStack_608;
        fVar258 = fStack_604;
        do {
          pauVar10 = (undefined1 (*) [28])(catmullrom_basis0 + lVar142 * 4 + lVar22);
          fVar260 = *(float *)*pauVar10;
          fVar270 = *(float *)(*pauVar10 + 4);
          fVar272 = *(float *)(*pauVar10 + 8);
          fVar274 = *(float *)(*pauVar10 + 0xc);
          fVar347 = *(float *)(*pauVar10 + 0x10);
          fVar346 = *(float *)(*pauVar10 + 0x14);
          fVar348 = *(float *)(*pauVar10 + 0x18);
          auVar132 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar22 + 0x22307f0 + lVar142 * 4);
          fVar234 = *(float *)*pauVar10;
          fVar350 = *(float *)(*pauVar10 + 4);
          fVar349 = *(float *)(*pauVar10 + 8);
          fVar302 = *(float *)(*pauVar10 + 0xc);
          fVar236 = *(float *)(*pauVar10 + 0x10);
          fVar276 = *(float *)(*pauVar10 + 0x14);
          fVar309 = *(float *)(*pauVar10 + 0x18);
          auVar131 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar22 + 0x2230c74 + lVar142 * 4);
          fVar311 = *(float *)*pauVar10;
          fVar238 = *(float *)(*pauVar10 + 4);
          fVar277 = *(float *)(*pauVar10 + 8);
          fVar313 = *(float *)(*pauVar10 + 0xc);
          fVar314 = *(float *)(*pauVar10 + 0x10);
          fVar239 = *(float *)(*pauVar10 + 0x14);
          fVar146 = *(float *)(*pauVar10 + 0x18);
          auVar130 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar22 + 0x22310f8 + lVar142 * 4);
          fVar166 = *(float *)*pauVar10;
          fVar169 = *(float *)(*pauVar10 + 4);
          fVar171 = *(float *)(*pauVar10 + 8);
          fVar196 = *(float *)(*pauVar10 + 0xc);
          fVar172 = *(float *)(*pauVar10 + 0x10);
          fVar173 = *(float *)(*pauVar10 + 0x14);
          fVar218 = *(float *)(*pauVar10 + 0x18);
          auVar128 = *pauVar10;
          fVar290 = auVar229._28_4_;
          fVar216 = fVar290 + *(float *)pauVar10[1];
          fStack_804 = fVar290 + fVar290 + auVar164._28_4_;
          local_5e0._0_4_ =
               (float)local_420._0_4_ * fVar260 +
               fVar242 * fVar234 +
               (float)local_440._0_4_ * fVar311 + (float)local_4a0._0_4_ * fVar166;
          local_5e0._4_4_ =
               (float)local_420._4_4_ * fVar270 +
               fVar255 * fVar350 +
               (float)local_440._4_4_ * fVar238 + (float)local_4a0._4_4_ * fVar169;
          fStack_5d8 = fStack_418 * fVar272 +
                       fVar257 * fVar349 + fStack_438 * fVar277 + fStack_498 * fVar171;
          fStack_5d4 = fStack_414 * fVar274 +
                       fVar259 * fVar302 + fStack_434 * fVar313 + fStack_494 * fVar196;
          register0x00001450 =
               fStack_410 * fVar347 +
               fVar338 * fVar236 + fStack_430 * fVar314 + fStack_490 * fVar172;
          register0x00001454 =
               fStack_40c * fVar346 +
               fVar231 * fVar276 + fStack_42c * fVar239 + fStack_48c * fVar173;
          register0x00001458 =
               fStack_408 * fVar348 +
               fVar343 * fVar309 + fStack_428 * fVar146 + fStack_488 * fVar218;
          register0x0000145c = fVar216 + fStack_804;
          auVar228._0_4_ =
               (float)local_460._0_4_ * fVar260 +
               fVar234 * auVar301._0_4_ + (float)local_6a0._0_4_ * fVar311 + fVar217 * fVar166;
          auVar228._4_4_ =
               (float)local_460._4_4_ * fVar270 +
               fVar350 * auVar301._4_4_ + (float)local_6a0._4_4_ * fVar238 + fVar230 * fVar169;
          auVar228._8_4_ =
               fStack_458 * fVar272 +
               fVar349 * auVar301._8_4_ + fStack_698 * fVar277 + fVar232 * fVar171;
          auVar228._12_4_ =
               fStack_454 * fVar274 +
               fVar302 * auVar301._12_4_ + fStack_694 * fVar313 + fVar233 * fVar196;
          auVar228._16_4_ =
               fStack_450 * fVar347 +
               fVar236 * auVar301._16_4_ + fStack_690 * fVar314 + fVar240 * fVar172;
          auVar228._20_4_ =
               fStack_44c * fVar346 +
               fVar276 * auVar301._20_4_ + fStack_68c * fVar239 + fVar253 * fVar173;
          auVar228._24_4_ =
               fStack_448 * fVar348 +
               fVar309 * auVar301._24_4_ + fStack_688 * fVar146 + fVar256 * fVar218;
          auVar228._28_4_ = fStack_804 + fVar290 + fVar290 + auVar252._28_4_;
          auVar229 = ZEXT3264(auVar228);
          fVar147 = fVar234 * (float)local_100._0_4_ +
                    fVar311 * (float)local_c0._0_4_ + fVar166 * (float)local_e0._0_4_ +
                    (float)local_80._0_4_ * fVar260;
          fVar167 = fVar350 * (float)local_100._4_4_ +
                    fVar238 * (float)local_c0._4_4_ + fVar169 * (float)local_e0._4_4_ +
                    (float)local_80._4_4_ * fVar270;
          fStack_818 = fVar349 * fStack_f8 + fVar277 * fStack_b8 + fVar171 * fStack_d8 +
                       fStack_78 * fVar272;
          fStack_814 = fVar302 * fStack_f4 + fVar313 * fStack_b4 + fVar196 * fStack_d4 +
                       fStack_74 * fVar274;
          fStack_810 = fVar236 * fStack_f0 + fVar314 * fStack_b0 + fVar172 * fStack_d0 +
                       fStack_70 * fVar347;
          fStack_80c = fVar276 * fStack_ec + fVar239 * fStack_ac + fVar173 * fStack_cc +
                       fStack_6c * fVar346;
          fStack_808 = fVar309 * fStack_e8 + fVar146 * fStack_a8 + fVar218 * fStack_c8 +
                       fStack_68 * fVar348;
          fStack_804 = fVar290 + fVar216 + fStack_804;
          pauVar10 = (undefined1 (*) [28])(catmullrom_basis1 + lVar142 * 4 + lVar22);
          fVar260 = *(float *)*pauVar10;
          fVar270 = *(float *)(*pauVar10 + 4);
          fVar272 = *(float *)(*pauVar10 + 8);
          fVar274 = *(float *)(*pauVar10 + 0xc);
          fVar347 = *(float *)(*pauVar10 + 0x10);
          fVar346 = *(float *)(*pauVar10 + 0x14);
          fVar348 = *(float *)(*pauVar10 + 0x18);
          auVar135 = *pauVar10;
          pauVar12 = (undefined1 (*) [28])(lVar22 + 0x2232c10 + lVar142 * 4);
          fVar234 = *(float *)*pauVar12;
          fVar350 = *(float *)(*pauVar12 + 4);
          fVar349 = *(float *)(*pauVar12 + 8);
          fVar302 = *(float *)(*pauVar12 + 0xc);
          fVar236 = *(float *)(*pauVar12 + 0x10);
          fVar276 = *(float *)(*pauVar12 + 0x14);
          fVar309 = *(float *)(*pauVar12 + 0x18);
          auVar134 = *pauVar12;
          pauVar12 = (undefined1 (*) [28])(lVar22 + 0x2233094 + lVar142 * 4);
          fVar311 = *(float *)*pauVar12;
          fVar238 = *(float *)(*pauVar12 + 4);
          fVar277 = *(float *)(*pauVar12 + 8);
          fVar313 = *(float *)(*pauVar12 + 0xc);
          fVar314 = *(float *)(*pauVar12 + 0x10);
          fVar239 = *(float *)(*pauVar12 + 0x14);
          fVar146 = *(float *)(*pauVar12 + 0x18);
          auVar133 = *pauVar12;
          pfVar1 = (float *)(lVar22 + 0x2233518 + lVar142 * 4);
          fVar166 = *pfVar1;
          fVar169 = pfVar1[1];
          fVar171 = pfVar1[2];
          fVar196 = pfVar1[3];
          fVar172 = pfVar1[4];
          fVar173 = pfVar1[5];
          fVar218 = pfVar1[6];
          fVar237 = auVar301._28_4_;
          fVar290 = fVar237 + pfVar1[7];
          fVar216 = fVar237 + fVar237 + fVar258;
          auVar372._0_4_ =
               (float)local_420._0_4_ * fVar260 +
               fVar242 * fVar234 +
               (float)local_440._0_4_ * fVar311 + (float)local_4a0._0_4_ * fVar166;
          auVar372._4_4_ =
               (float)local_420._4_4_ * fVar270 +
               fVar255 * fVar350 +
               (float)local_440._4_4_ * fVar238 + (float)local_4a0._4_4_ * fVar169;
          auVar372._8_4_ =
               fStack_418 * fVar272 +
               fVar257 * fVar349 + fStack_438 * fVar277 + fStack_498 * fVar171;
          auVar372._12_4_ =
               fStack_414 * fVar274 +
               fVar259 * fVar302 + fStack_434 * fVar313 + fStack_494 * fVar196;
          auVar372._16_4_ =
               fStack_410 * fVar347 +
               fVar338 * fVar236 + fStack_430 * fVar314 + fStack_490 * fVar172;
          auVar372._20_4_ =
               fStack_40c * fVar346 +
               fVar231 * fVar276 + fStack_42c * fVar239 + fStack_48c * fVar173;
          auVar372._24_4_ =
               fStack_408 * fVar348 +
               fVar343 * fVar309 + fStack_428 * fVar146 + fStack_488 * fVar218;
          auVar372._28_4_ = fVar290 + fVar216;
          auVar268._0_4_ =
               (float)local_460._0_4_ * fVar260 +
               auVar301._0_4_ * fVar234 + (float)local_6a0._0_4_ * fVar311 + fVar217 * fVar166;
          auVar268._4_4_ =
               (float)local_460._4_4_ * fVar270 +
               auVar301._4_4_ * fVar350 + (float)local_6a0._4_4_ * fVar238 + fVar230 * fVar169;
          auVar268._8_4_ =
               fStack_458 * fVar272 +
               auVar301._8_4_ * fVar349 + fStack_698 * fVar277 + fVar232 * fVar171;
          auVar268._12_4_ =
               fStack_454 * fVar274 +
               auVar301._12_4_ * fVar302 + fStack_694 * fVar313 + fVar233 * fVar196;
          auVar268._16_4_ =
               fStack_450 * fVar347 +
               auVar301._16_4_ * fVar236 + fStack_690 * fVar314 + fVar240 * fVar172;
          auVar268._20_4_ =
               fStack_44c * fVar346 +
               auVar301._20_4_ * fVar276 + fStack_68c * fVar239 + fVar253 * fVar173;
          auVar268._24_4_ =
               fStack_448 * fVar348 +
               auVar301._24_4_ * fVar309 + fStack_688 * fVar146 + fVar256 * fVar218;
          auVar268._28_4_ = fVar216 + fVar237 + fVar237 + fVar258;
          auVar300._0_4_ =
               fVar234 * (float)local_100._0_4_ +
               fVar311 * (float)local_c0._0_4_ + fVar166 * (float)local_e0._0_4_ +
               fVar260 * (float)local_80._0_4_;
          auVar300._4_4_ =
               fVar350 * (float)local_100._4_4_ +
               fVar238 * (float)local_c0._4_4_ + fVar169 * (float)local_e0._4_4_ +
               fVar270 * (float)local_80._4_4_;
          auVar300._8_4_ =
               fVar349 * fStack_f8 + fVar277 * fStack_b8 + fVar171 * fStack_d8 + fVar272 * fStack_78
          ;
          auVar300._12_4_ =
               fVar302 * fStack_f4 + fVar313 * fStack_b4 + fVar196 * fStack_d4 + fVar274 * fStack_74
          ;
          auVar300._16_4_ =
               fVar236 * fStack_f0 + fVar314 * fStack_b0 + fVar172 * fStack_d0 + fVar347 * fStack_70
          ;
          auVar300._20_4_ =
               fVar276 * fStack_ec + fVar239 * fStack_ac + fVar173 * fStack_cc + fVar346 * fStack_6c
          ;
          auVar300._24_4_ =
               fVar309 * fStack_e8 + fVar146 * fStack_a8 + fVar218 * fStack_c8 + fVar348 * fStack_68
          ;
          auVar300._28_4_ = fVar237 + fVar290 + fVar216;
          auVar160 = vsubps_avx(auVar372,_local_5e0);
          auVar31 = vsubps_avx(auVar268,auVar228);
          fVar258 = auVar160._0_4_;
          fVar260 = auVar160._4_4_;
          auVar66._4_4_ = fVar260 * auVar228._4_4_;
          auVar66._0_4_ = fVar258 * auVar228._0_4_;
          fVar270 = auVar160._8_4_;
          auVar66._8_4_ = fVar270 * auVar228._8_4_;
          fVar272 = auVar160._12_4_;
          auVar66._12_4_ = fVar272 * auVar228._12_4_;
          fVar274 = auVar160._16_4_;
          auVar66._16_4_ = fVar274 * auVar228._16_4_;
          fVar347 = auVar160._20_4_;
          auVar66._20_4_ = fVar347 * auVar228._20_4_;
          fVar346 = auVar160._24_4_;
          auVar66._24_4_ = fVar346 * auVar228._24_4_;
          auVar66._28_4_ = fVar216;
          fVar217 = auVar31._0_4_;
          fVar230 = auVar31._4_4_;
          auVar67._4_4_ = (float)local_5e0._4_4_ * fVar230;
          auVar67._0_4_ = (float)local_5e0._0_4_ * fVar217;
          fVar232 = auVar31._8_4_;
          auVar67._8_4_ = fStack_5d8 * fVar232;
          fVar233 = auVar31._12_4_;
          auVar67._12_4_ = fStack_5d4 * fVar233;
          fVar240 = auVar31._16_4_;
          auVar67._16_4_ = register0x00001450 * fVar240;
          fVar253 = auVar31._20_4_;
          auVar67._20_4_ = register0x00001454 * fVar253;
          fVar256 = auVar31._24_4_;
          auVar67._24_4_ = register0x00001458 * fVar256;
          auVar67._28_4_ = auVar268._28_4_;
          auVar330 = vsubps_avx(auVar66,auVar67);
          auVar124._4_4_ = fVar167;
          auVar124._0_4_ = fVar147;
          auVar124._8_4_ = fStack_818;
          auVar124._12_4_ = fStack_814;
          auVar124._16_4_ = fStack_810;
          auVar124._20_4_ = fStack_80c;
          auVar124._24_4_ = fStack_808;
          auVar124._28_4_ = fStack_804;
          auVar164 = ZEXT3264(auVar124);
          auVar163 = vmaxps_avx(auVar124,auVar300);
          auVar68._4_4_ = auVar163._4_4_ * auVar163._4_4_ * (fVar260 * fVar260 + fVar230 * fVar230);
          auVar68._0_4_ = auVar163._0_4_ * auVar163._0_4_ * (fVar258 * fVar258 + fVar217 * fVar217);
          auVar68._8_4_ = auVar163._8_4_ * auVar163._8_4_ * (fVar270 * fVar270 + fVar232 * fVar232);
          auVar68._12_4_ =
               auVar163._12_4_ * auVar163._12_4_ * (fVar272 * fVar272 + fVar233 * fVar233);
          auVar68._16_4_ =
               auVar163._16_4_ * auVar163._16_4_ * (fVar274 * fVar274 + fVar240 * fVar240);
          auVar68._20_4_ =
               auVar163._20_4_ * auVar163._20_4_ * (fVar347 * fVar347 + fVar253 * fVar253);
          auVar68._24_4_ =
               auVar163._24_4_ * auVar163._24_4_ * (fVar346 * fVar346 + fVar256 * fVar256);
          auVar68._28_4_ = fVar290 + auVar268._28_4_;
          auVar69._4_4_ = auVar330._4_4_ * auVar330._4_4_;
          auVar69._0_4_ = auVar330._0_4_ * auVar330._0_4_;
          auVar69._8_4_ = auVar330._8_4_ * auVar330._8_4_;
          auVar69._12_4_ = auVar330._12_4_ * auVar330._12_4_;
          auVar69._16_4_ = auVar330._16_4_ * auVar330._16_4_;
          auVar69._20_4_ = auVar330._20_4_ * auVar330._20_4_;
          auVar69._24_4_ = auVar330._24_4_ * auVar330._24_4_;
          auVar69._28_4_ = auVar330._28_4_;
          auVar252 = ZEXT3264(auVar69);
          auVar163 = vcmpps_avx(auVar69,auVar68,2);
          local_300 = (uint)lVar142;
          auVar204 = vpshufd_avx(ZEXT416(local_300),0);
          auVar180 = vpor_avx(auVar204,_DAT_01ff0cf0);
          auVar204 = vpor_avx(auVar204,_DAT_02020ea0);
          auVar180 = vpcmpgtd_avx(_local_180,auVar180);
          auVar204 = vpcmpgtd_avx(_local_180,auVar204);
          auVar209._16_16_ = auVar204;
          auVar209._0_16_ = auVar180;
          auVar330 = auVar209 & auVar163;
          fVar217 = (float)local_620._0_4_;
          fVar230 = (float)local_620._4_4_;
          fVar232 = fStack_618;
          fVar233 = fStack_614;
          fVar240 = fStack_610;
          fVar253 = fStack_60c;
          fVar256 = fStack_608;
          fVar258 = fStack_604;
          if ((((((((auVar330 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar330 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar330 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar330 >> 0x7f,0) == '\0') &&
                (auVar330 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar330 >> 0xbf,0) == '\0') &&
              (auVar330 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar330[0x1f]) {
            auVar301 = ZEXT3264(auVar301._0_32_);
          }
          else {
            local_5a0._0_4_ = auVar135._0_4_;
            local_5a0._4_4_ = auVar135._4_4_;
            fStack_598 = auVar135._8_4_;
            fStack_594 = auVar135._12_4_;
            fStack_590 = auVar135._16_4_;
            fStack_58c = auVar135._20_4_;
            fStack_588 = auVar135._24_4_;
            local_640._0_4_ = auVar134._0_4_;
            local_640._4_4_ = auVar134._4_4_;
            uStack_638._0_4_ = auVar134._8_4_;
            uStack_638._4_4_ = auVar134._12_4_;
            auStack_630._0_4_ = auVar134._16_4_;
            auStack_630._4_4_ = auVar134._20_4_;
            fStack_628 = auVar134._24_4_;
            local_6e0._0_4_ = auVar133._0_4_;
            local_6e0._4_4_ = auVar133._4_4_;
            uStack_6d8._0_4_ = auVar133._8_4_;
            uStack_6d8._4_4_ = auVar133._12_4_;
            fStack_6d0 = auVar133._16_4_;
            fStack_6cc = auVar133._20_4_;
            fStack_6c8 = auVar133._24_4_;
            local_700 = (float)local_5a0._0_4_ * (float)local_120._0_4_ +
                        (float)local_160._0_4_ * (float)local_640._0_4_ +
                        (float)local_a0._0_4_ * (float)local_6e0._0_4_ +
                        (float)local_600._0_4_ * fVar166;
            fStack_6fc = (float)local_5a0._4_4_ * (float)local_120._4_4_ +
                         (float)local_160._4_4_ * (float)local_640._4_4_ +
                         (float)local_a0._4_4_ * (float)local_6e0._4_4_ +
                         (float)local_600._4_4_ * fVar169;
            fStack_6f8 = fStack_598 * fStack_118 +
                         fStack_158 * (float)uStack_638 +
                         fStack_98 * (float)uStack_6d8 + fStack_5f8 * fVar171;
            fStack_6f4 = fStack_594 * fStack_114 +
                         fStack_154 * uStack_638._4_4_ +
                         fStack_94 * uStack_6d8._4_4_ + fStack_5f4 * fVar196;
            fStack_6f0 = fStack_590 * fStack_110 +
                         fStack_150 * (float)auStack_630._0_4_ +
                         fStack_90 * fStack_6d0 + fStack_5f0 * fVar172;
            fStack_6ec = fStack_58c * fStack_10c +
                         fStack_14c * (float)auStack_630._4_4_ +
                         fStack_8c * fStack_6cc + fStack_5ec * fVar173;
            fStack_6e8 = fStack_588 * fStack_108 +
                         fStack_148 * fStack_628 + fStack_88 * fStack_6c8 + fStack_5e8 * fVar218;
            fStack_6e4 = register0x0000145c + *(float *)pauVar10[1] + fVar237 + 0.0;
            local_780._0_4_ = auVar131._0_4_;
            local_780._4_4_ = auVar131._4_4_;
            uStack_778._0_4_ = auVar131._8_4_;
            uStack_778._4_4_ = auVar131._12_4_;
            auStack_770._0_4_ = auVar131._16_4_;
            auStack_770._4_4_ = auVar131._20_4_;
            fStack_768 = auVar131._24_4_;
            local_7c0._0_4_ = auVar130._0_4_;
            local_7c0._4_4_ = auVar130._4_4_;
            auStack_7b8._0_4_ = auVar130._8_4_;
            auStack_7b8._4_4_ = auVar130._12_4_;
            auStack_7b0._0_4_ = auVar130._16_4_;
            auStack_7b0._4_4_ = auVar130._20_4_;
            fStack_7a8 = auVar130._24_4_;
            local_6c0._0_4_ = auVar128._0_4_;
            local_6c0._4_4_ = auVar128._4_4_;
            uStack_6b8._0_4_ = auVar128._8_4_;
            uStack_6b8._4_4_ = auVar128._12_4_;
            auStack_6b0._0_4_ = auVar128._16_4_;
            auStack_6b0._4_4_ = auVar128._20_4_;
            fStack_6a8 = auVar128._24_4_;
            pfVar1 = (float *)(lVar22 + 0x2231e84 + lVar142 * 4);
            fVar260 = *pfVar1;
            fVar270 = pfVar1[1];
            fVar272 = pfVar1[2];
            fVar274 = pfVar1[3];
            fVar347 = pfVar1[4];
            fVar346 = pfVar1[5];
            fVar348 = pfVar1[6];
            pfVar2 = (float *)(lVar22 + 0x2232308 + lVar142 * 4);
            fVar234 = *pfVar2;
            fVar350 = pfVar2[1];
            fVar349 = pfVar2[2];
            fVar302 = pfVar2[3];
            fVar236 = pfVar2[4];
            fVar276 = pfVar2[5];
            fVar309 = pfVar2[6];
            pfVar3 = (float *)(lVar22 + 0x2231a00 + lVar142 * 4);
            fVar311 = *pfVar3;
            fVar238 = pfVar3[1];
            fVar277 = pfVar3[2];
            fVar313 = pfVar3[3];
            fVar314 = pfVar3[4];
            fVar239 = pfVar3[5];
            fVar146 = pfVar3[6];
            fVar216 = pfVar1[7] + pfVar2[7];
            fVar290 = pfVar2[7] + auVar372._28_4_ + 0.0;
            fVar291 = auVar372._28_4_ + fStack_444 + auVar372._28_4_ + 0.0;
            pfVar1 = (float *)(lVar22 + 0x223157c + lVar142 * 4);
            fVar166 = *pfVar1;
            fVar169 = pfVar1[1];
            fVar171 = pfVar1[2];
            fVar196 = pfVar1[3];
            fVar172 = pfVar1[4];
            fVar173 = pfVar1[5];
            fVar218 = pfVar1[6];
            local_5a0._4_4_ =
                 fVar169 * (float)local_420._4_4_ +
                 fVar255 * fVar238 +
                 (float)local_440._4_4_ * fVar270 + (float)local_4a0._4_4_ * fVar350;
            local_5a0._0_4_ =
                 fVar166 * (float)local_420._0_4_ +
                 fVar242 * fVar311 +
                 (float)local_440._0_4_ * fVar260 + (float)local_4a0._0_4_ * fVar234;
            fStack_598 = fVar171 * fStack_418 +
                         fVar257 * fVar277 + fStack_438 * fVar272 + fStack_498 * fVar349;
            fStack_594 = fVar196 * fStack_414 +
                         fVar259 * fVar313 + fStack_434 * fVar274 + fStack_494 * fVar302;
            fStack_590 = fVar172 * fStack_410 +
                         fVar338 * fVar314 + fStack_430 * fVar347 + fStack_490 * fVar236;
            fStack_58c = fVar173 * fStack_40c +
                         fVar231 * fVar239 + fStack_42c * fVar346 + fStack_48c * fVar276;
            fStack_588 = fVar218 * fStack_408 +
                         fVar343 * fVar146 + fStack_428 * fVar348 + fStack_488 * fVar309;
            fStack_584 = fVar216 + fVar290;
            auVar186._0_4_ =
                 fVar166 * (float)local_460._0_4_ +
                 fVar260 * (float)local_6a0._0_4_ + (float)local_620._0_4_ * fVar234 +
                 fVar311 * (float)local_740._0_4_;
            auVar186._4_4_ =
                 fVar169 * (float)local_460._4_4_ +
                 fVar270 * (float)local_6a0._4_4_ + (float)local_620._4_4_ * fVar350 +
                 fVar238 * (float)local_740._4_4_;
            auVar186._8_4_ =
                 fVar171 * fStack_458 +
                 fVar272 * fStack_698 + fStack_618 * fVar349 + fVar277 * fStack_738;
            auVar186._12_4_ =
                 fVar196 * fStack_454 +
                 fVar274 * fStack_694 + fStack_614 * fVar302 + fVar313 * fStack_734;
            auVar186._16_4_ =
                 fVar172 * fStack_450 +
                 fVar347 * fStack_690 + fStack_610 * fVar236 + fVar314 * fStack_730;
            auVar186._20_4_ =
                 fVar173 * fStack_44c +
                 fVar346 * fStack_68c + fStack_60c * fVar276 + fVar239 * fStack_72c;
            auVar186._24_4_ =
                 fVar218 * fStack_448 +
                 fVar348 * fStack_688 + fStack_608 * fVar309 + fVar146 * fStack_728;
            auVar186._28_4_ = fVar290 + fVar291;
            auVar362._0_4_ =
                 fVar311 * (float)local_160._0_4_ +
                 (float)local_a0._0_4_ * fVar260 + (float)local_600._0_4_ * fVar234 +
                 fVar166 * (float)local_120._0_4_;
            auVar362._4_4_ =
                 fVar238 * (float)local_160._4_4_ +
                 (float)local_a0._4_4_ * fVar270 + (float)local_600._4_4_ * fVar350 +
                 fVar169 * (float)local_120._4_4_;
            auVar362._8_4_ =
                 fVar277 * fStack_158 + fStack_98 * fVar272 + fStack_5f8 * fVar349 +
                 fVar171 * fStack_118;
            auVar362._12_4_ =
                 fVar313 * fStack_154 + fStack_94 * fVar274 + fStack_5f4 * fVar302 +
                 fVar196 * fStack_114;
            auVar362._16_4_ =
                 fVar314 * fStack_150 + fStack_90 * fVar347 + fStack_5f0 * fVar236 +
                 fVar172 * fStack_110;
            auVar362._20_4_ =
                 fVar239 * fStack_14c + fStack_8c * fVar346 + fStack_5ec * fVar276 +
                 fVar173 * fStack_10c;
            auVar362._24_4_ =
                 fVar146 * fStack_148 + fStack_88 * fVar348 + fStack_5e8 * fVar309 +
                 fVar218 * fStack_108;
            auVar362._28_4_ = pfVar3[7] + fVar216 + fVar291;
            pfVar1 = (float *)(lVar22 + 0x22342a4 + lVar142 * 4);
            fVar260 = *pfVar1;
            fVar270 = pfVar1[1];
            fVar272 = pfVar1[2];
            fVar274 = pfVar1[3];
            fVar347 = pfVar1[4];
            fVar346 = pfVar1[5];
            fVar348 = pfVar1[6];
            pfVar2 = (float *)(lVar22 + 0x2234728 + lVar142 * 4);
            fVar234 = *pfVar2;
            fVar350 = pfVar2[1];
            fVar349 = pfVar2[2];
            fVar302 = pfVar2[3];
            fVar236 = pfVar2[4];
            fVar276 = pfVar2[5];
            fVar309 = pfVar2[6];
            pfVar3 = (float *)(lVar22 + 0x2233e20 + lVar142 * 4);
            fVar311 = *pfVar3;
            fVar238 = pfVar3[1];
            fVar277 = pfVar3[2];
            fVar313 = pfVar3[3];
            fVar314 = pfVar3[4];
            fVar239 = pfVar3[5];
            fVar146 = pfVar3[6];
            pfVar4 = (float *)(lVar22 + 0x223399c + lVar142 * 4);
            fVar166 = *pfVar4;
            fVar169 = pfVar4[1];
            fVar171 = pfVar4[2];
            fVar196 = pfVar4[3];
            fVar172 = pfVar4[4];
            fVar173 = pfVar4[5];
            fVar218 = pfVar4[6];
            auVar319._0_4_ =
                 fVar166 * (float)local_420._0_4_ +
                 fVar242 * fVar311 +
                 (float)local_440._0_4_ * fVar260 + (float)local_4a0._0_4_ * fVar234;
            auVar319._4_4_ =
                 fVar169 * (float)local_420._4_4_ +
                 fVar255 * fVar238 +
                 (float)local_440._4_4_ * fVar270 + (float)local_4a0._4_4_ * fVar350;
            auVar319._8_4_ =
                 fVar171 * fStack_418 +
                 fVar257 * fVar277 + fStack_438 * fVar272 + fStack_498 * fVar349;
            auVar319._12_4_ =
                 fVar196 * fStack_414 +
                 fVar259 * fVar313 + fStack_434 * fVar274 + fStack_494 * fVar302;
            auVar319._16_4_ =
                 fVar172 * fStack_410 +
                 fVar338 * fVar314 + fStack_430 * fVar347 + fStack_490 * fVar236;
            auVar319._20_4_ =
                 fVar173 * fStack_40c +
                 fVar231 * fVar239 + fStack_42c * fVar346 + fStack_48c * fVar276;
            auVar319._24_4_ =
                 fVar218 * fStack_408 +
                 fVar343 * fVar146 + fStack_428 * fVar348 + fStack_488 * fVar309;
            auVar319._28_4_ = fVar235 + fVar235 + fStack_424 + fStack_484;
            auVar357._0_4_ =
                 fVar166 * (float)local_460._0_4_ +
                 fVar311 * (float)local_740._0_4_ +
                 fVar260 * (float)local_6a0._0_4_ + fVar234 * (float)local_620._0_4_;
            auVar357._4_4_ =
                 fVar169 * (float)local_460._4_4_ +
                 fVar238 * (float)local_740._4_4_ +
                 fVar270 * (float)local_6a0._4_4_ + fVar350 * (float)local_620._4_4_;
            auVar357._8_4_ =
                 fVar171 * fStack_458 +
                 fVar277 * fStack_738 + fVar272 * fStack_698 + fVar349 * fStack_618;
            auVar357._12_4_ =
                 fVar196 * fStack_454 +
                 fVar313 * fStack_734 + fVar274 * fStack_694 + fVar302 * fStack_614;
            auVar357._16_4_ =
                 fVar172 * fStack_450 +
                 fVar314 * fStack_730 + fVar347 * fStack_690 + fVar236 * fStack_610;
            auVar357._20_4_ =
                 fVar173 * fStack_44c +
                 fVar239 * fStack_72c + fVar346 * fStack_68c + fVar276 * fStack_60c;
            auVar357._24_4_ =
                 fVar218 * fStack_448 +
                 fVar146 * fStack_728 + fVar348 * fStack_688 + fVar309 * fStack_608;
            auVar357._28_4_ = fVar235 + fVar235 + auVar163._28_4_ + fStack_484;
            auVar269._8_4_ = 0x7fffffff;
            auVar269._0_8_ = 0x7fffffff7fffffff;
            auVar269._12_4_ = 0x7fffffff;
            auVar269._16_4_ = 0x7fffffff;
            auVar269._20_4_ = 0x7fffffff;
            auVar269._24_4_ = 0x7fffffff;
            auVar269._28_4_ = 0x7fffffff;
            auVar330 = vandps_avx(_local_5a0,auVar269);
            auVar267 = vandps_avx(auVar186,auVar269);
            auVar267 = vmaxps_avx(auVar330,auVar267);
            auVar330 = vandps_avx(auVar362,auVar269);
            auVar267 = vmaxps_avx(auVar267,auVar330);
            auVar267 = vcmpps_avx(auVar267,_local_1a0,1);
            auVar156 = vblendvps_avx(_local_5a0,auVar160,auVar267);
            auVar157._0_4_ =
                 fVar166 * (float)local_120._0_4_ +
                 fVar311 * (float)local_160._0_4_ +
                 fVar234 * (float)local_600._0_4_ + (float)local_a0._0_4_ * fVar260;
            auVar157._4_4_ =
                 fVar169 * (float)local_120._4_4_ +
                 fVar238 * (float)local_160._4_4_ +
                 fVar350 * (float)local_600._4_4_ + (float)local_a0._4_4_ * fVar270;
            auVar157._8_4_ =
                 fVar171 * fStack_118 +
                 fVar277 * fStack_158 + fVar349 * fStack_5f8 + fStack_98 * fVar272;
            auVar157._12_4_ =
                 fVar196 * fStack_114 +
                 fVar313 * fStack_154 + fVar302 * fStack_5f4 + fStack_94 * fVar274;
            auVar157._16_4_ =
                 fVar172 * fStack_110 +
                 fVar314 * fStack_150 + fVar236 * fStack_5f0 + fStack_90 * fVar347;
            auVar157._20_4_ =
                 fVar173 * fStack_10c +
                 fVar239 * fStack_14c + fVar276 * fStack_5ec + fStack_8c * fVar346;
            auVar157._24_4_ =
                 fVar218 * fStack_108 +
                 fVar146 * fStack_148 + fVar309 * fStack_5e8 + fStack_88 * fVar348;
            auVar157._28_4_ = auVar330._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar162 = vblendvps_avx(auVar186,auVar31,auVar267);
            auVar330 = vandps_avx(auVar319,auVar269);
            auVar267 = vandps_avx(auVar357,auVar269);
            auVar223 = vmaxps_avx(auVar330,auVar267);
            auVar330 = vandps_avx(auVar157,auVar269);
            auVar330 = vmaxps_avx(auVar223,auVar330);
            local_7a0._0_4_ = auVar132._0_4_;
            local_7a0._4_4_ = auVar132._4_4_;
            uStack_798._0_4_ = auVar132._8_4_;
            uStack_798._4_4_ = auVar132._12_4_;
            auStack_790._0_4_ = auVar132._16_4_;
            auStack_790._4_4_ = auVar132._20_4_;
            fStack_788 = auVar132._24_4_;
            auVar267 = vcmpps_avx(auVar330,_local_1a0,1);
            auVar330 = vblendvps_avx(auVar319,auVar160,auVar267);
            auVar158._0_4_ =
                 (float)local_120._0_4_ * (float)local_7a0._0_4_ +
                 (float)local_160._0_4_ * (float)local_780._0_4_ +
                 (float)local_a0._0_4_ * (float)local_7c0 +
                 (float)local_600._0_4_ * (float)local_6c0._0_4_;
            auVar158._4_4_ =
                 (float)local_120._4_4_ * (float)local_7a0._4_4_ +
                 (float)local_160._4_4_ * (float)local_780._4_4_ +
                 (float)local_a0._4_4_ * local_7c0._4_4_ +
                 (float)local_600._4_4_ * (float)local_6c0._4_4_;
            auVar158._8_4_ =
                 fStack_118 * (float)uStack_798 +
                 fStack_158 * (float)uStack_778 +
                 fStack_98 * (float)auStack_7b8._0_4_ + fStack_5f8 * (float)uStack_6b8;
            auVar158._12_4_ =
                 fStack_114 * uStack_798._4_4_ +
                 fStack_154 * uStack_778._4_4_ +
                 fStack_94 * (float)auStack_7b8._4_4_ + fStack_5f4 * uStack_6b8._4_4_;
            auVar158._16_4_ =
                 fStack_110 * (float)auStack_790._0_4_ +
                 fStack_150 * (float)auStack_770._0_4_ +
                 fStack_90 * (float)auStack_7b0._0_4_ + fStack_5f0 * (float)auStack_6b0._0_4_;
            auVar158._20_4_ =
                 fStack_10c * (float)auStack_790._4_4_ +
                 fStack_14c * (float)auStack_770._4_4_ +
                 fStack_8c * (float)auStack_7b0._4_4_ + fStack_5ec * (float)auStack_6b0._4_4_;
            auVar158._24_4_ =
                 fStack_108 * fStack_788 +
                 fStack_148 * fStack_768 + fStack_88 * fStack_7a8 + fStack_5e8 * fStack_6a8;
            auVar158._28_4_ = auVar223._28_4_ + fStack_6e4 + fVar237 + 0.0;
            auVar267 = vblendvps_avx(auVar357,auVar31,auVar267);
            fVar291 = auVar156._0_4_;
            fVar279 = auVar156._4_4_;
            fVar308 = auVar156._8_4_;
            fVar310 = auVar156._12_4_;
            fVar312 = auVar156._16_4_;
            fVar242 = auVar156._20_4_;
            fVar255 = auVar156._24_4_;
            fVar257 = auVar156._28_4_;
            fVar302 = auVar330._0_4_;
            fVar276 = auVar330._4_4_;
            fVar311 = auVar330._8_4_;
            fVar277 = auVar330._12_4_;
            fVar314 = auVar330._16_4_;
            fVar146 = auVar330._20_4_;
            fVar169 = auVar330._24_4_;
            fVar338 = auVar162._0_4_;
            fVar343 = auVar162._4_4_;
            fVar260 = auVar162._8_4_;
            fVar272 = auVar162._12_4_;
            fVar347 = auVar162._16_4_;
            fVar348 = auVar162._20_4_;
            fVar350 = auVar162._24_4_;
            auVar328._0_4_ = fVar338 * fVar338 + fVar291 * fVar291;
            auVar328._4_4_ = fVar343 * fVar343 + fVar279 * fVar279;
            auVar328._8_4_ = fVar260 * fVar260 + fVar308 * fVar308;
            auVar328._12_4_ = fVar272 * fVar272 + fVar310 * fVar310;
            auVar328._16_4_ = fVar347 * fVar347 + fVar312 * fVar312;
            auVar328._20_4_ = fVar348 * fVar348 + fVar242 * fVar242;
            auVar328._24_4_ = fVar350 * fVar350 + fVar255 * fVar255;
            auVar328._28_4_ = auVar160._28_4_ + auVar31._28_4_;
            auVar160 = vrsqrtps_avx(auVar328);
            fVar231 = auVar160._0_4_;
            fVar235 = auVar160._4_4_;
            auVar70._4_4_ = fVar235 * 1.5;
            auVar70._0_4_ = fVar231 * 1.5;
            fVar270 = auVar160._8_4_;
            auVar70._8_4_ = fVar270 * 1.5;
            fVar274 = auVar160._12_4_;
            auVar70._12_4_ = fVar274 * 1.5;
            fVar346 = auVar160._16_4_;
            auVar70._16_4_ = fVar346 * 1.5;
            fVar234 = auVar160._20_4_;
            auVar70._20_4_ = fVar234 * 1.5;
            fVar349 = auVar160._24_4_;
            auVar70._24_4_ = fVar349 * 1.5;
            auVar70._28_4_ = auVar357._28_4_;
            auVar71._4_4_ = fVar235 * fVar235 * fVar235 * auVar328._4_4_ * 0.5;
            auVar71._0_4_ = fVar231 * fVar231 * fVar231 * auVar328._0_4_ * 0.5;
            auVar71._8_4_ = fVar270 * fVar270 * fVar270 * auVar328._8_4_ * 0.5;
            auVar71._12_4_ = fVar274 * fVar274 * fVar274 * auVar328._12_4_ * 0.5;
            auVar71._16_4_ = fVar346 * fVar346 * fVar346 * auVar328._16_4_ * 0.5;
            auVar71._20_4_ = fVar234 * fVar234 * fVar234 * auVar328._20_4_ * 0.5;
            auVar71._24_4_ = fVar349 * fVar349 * fVar349 * auVar328._24_4_ * 0.5;
            auVar71._28_4_ = auVar328._28_4_;
            auVar31 = vsubps_avx(auVar70,auVar71);
            fVar196 = auVar31._0_4_;
            fVar172 = auVar31._4_4_;
            fVar173 = auVar31._8_4_;
            fVar218 = auVar31._12_4_;
            fVar216 = auVar31._16_4_;
            fVar290 = auVar31._20_4_;
            fVar237 = auVar31._24_4_;
            fVar231 = auVar267._0_4_;
            fVar235 = auVar267._4_4_;
            fVar270 = auVar267._8_4_;
            fVar274 = auVar267._12_4_;
            fVar346 = auVar267._16_4_;
            fVar234 = auVar267._20_4_;
            fVar349 = auVar267._24_4_;
            auVar307._0_4_ = fVar231 * fVar231 + fVar302 * fVar302;
            auVar307._4_4_ = fVar235 * fVar235 + fVar276 * fVar276;
            auVar307._8_4_ = fVar270 * fVar270 + fVar311 * fVar311;
            auVar307._12_4_ = fVar274 * fVar274 + fVar277 * fVar277;
            auVar307._16_4_ = fVar346 * fVar346 + fVar314 * fVar314;
            auVar307._20_4_ = fVar234 * fVar234 + fVar146 * fVar146;
            auVar307._24_4_ = fVar349 * fVar349 + fVar169 * fVar169;
            auVar307._28_4_ = auVar160._28_4_ + auVar330._28_4_;
            auVar160 = vrsqrtps_avx(auVar307);
            fVar236 = auVar160._0_4_;
            fVar309 = auVar160._4_4_;
            auVar72._4_4_ = fVar309 * 1.5;
            auVar72._0_4_ = fVar236 * 1.5;
            fVar238 = auVar160._8_4_;
            auVar72._8_4_ = fVar238 * 1.5;
            fVar313 = auVar160._12_4_;
            auVar72._12_4_ = fVar313 * 1.5;
            fVar239 = auVar160._16_4_;
            auVar72._16_4_ = fVar239 * 1.5;
            fVar166 = auVar160._20_4_;
            auVar72._20_4_ = fVar166 * 1.5;
            fVar171 = auVar160._24_4_;
            auVar72._24_4_ = fVar171 * 1.5;
            auVar72._28_4_ = auVar357._28_4_;
            auVar73._4_4_ = fVar309 * fVar309 * fVar309 * auVar307._4_4_ * 0.5;
            auVar73._0_4_ = fVar236 * fVar236 * fVar236 * auVar307._0_4_ * 0.5;
            auVar73._8_4_ = fVar238 * fVar238 * fVar238 * auVar307._8_4_ * 0.5;
            auVar73._12_4_ = fVar313 * fVar313 * fVar313 * auVar307._12_4_ * 0.5;
            auVar73._16_4_ = fVar239 * fVar239 * fVar239 * auVar307._16_4_ * 0.5;
            auVar73._20_4_ = fVar166 * fVar166 * fVar166 * auVar307._20_4_ * 0.5;
            auVar73._24_4_ = fVar171 * fVar171 * fVar171 * auVar307._24_4_ * 0.5;
            auVar73._28_4_ = auVar307._28_4_;
            auVar31 = vsubps_avx(auVar72,auVar73);
            fVar236 = auVar31._0_4_;
            fVar309 = auVar31._4_4_;
            fVar238 = auVar31._8_4_;
            fVar313 = auVar31._12_4_;
            fVar239 = auVar31._16_4_;
            fVar166 = auVar31._20_4_;
            fVar171 = auVar31._24_4_;
            fVar338 = fVar147 * fVar196 * fVar338;
            fVar343 = fVar167 * fVar172 * fVar343;
            auVar74._4_4_ = fVar343;
            auVar74._0_4_ = fVar338;
            fVar260 = fStack_818 * fVar173 * fVar260;
            auVar74._8_4_ = fVar260;
            fVar272 = fStack_814 * fVar218 * fVar272;
            auVar74._12_4_ = fVar272;
            fVar347 = fStack_810 * fVar216 * fVar347;
            auVar74._16_4_ = fVar347;
            fVar348 = fStack_80c * fVar290 * fVar348;
            auVar74._20_4_ = fVar348;
            fVar350 = fStack_808 * fVar237 * fVar350;
            auVar74._24_4_ = fVar350;
            auVar74._28_4_ = auVar160._28_4_;
            local_7a0._4_4_ = fVar343 + (float)local_5e0._4_4_;
            local_7a0._0_4_ = fVar338 + (float)local_5e0._0_4_;
            uStack_798._0_4_ = fVar260 + fStack_5d8;
            uStack_798._4_4_ = fVar272 + fStack_5d4;
            auStack_790._0_4_ = fVar347 + register0x00001450;
            auStack_790._4_4_ = fVar348 + register0x00001454;
            fStack_788 = fVar350 + register0x00001458;
            fStack_784 = auVar160._28_4_ + register0x0000145c;
            fVar338 = fVar147 * fVar196 * -fVar291;
            fVar343 = fVar167 * fVar172 * -fVar279;
            auVar75._4_4_ = fVar343;
            auVar75._0_4_ = fVar338;
            fVar260 = fStack_818 * fVar173 * -fVar308;
            auVar75._8_4_ = fVar260;
            fVar272 = fStack_814 * fVar218 * -fVar310;
            auVar75._12_4_ = fVar272;
            fVar347 = fStack_810 * fVar216 * -fVar312;
            auVar75._16_4_ = fVar347;
            fVar348 = fStack_80c * fVar290 * -fVar242;
            auVar75._20_4_ = fVar348;
            fVar350 = fStack_808 * fVar237 * -fVar255;
            auVar75._24_4_ = fVar350;
            auVar75._28_4_ = -fVar257;
            local_6c0._4_4_ = auVar228._4_4_ + fVar343;
            local_6c0._0_4_ = auVar228._0_4_ + fVar338;
            uStack_6b8._0_4_ = auVar228._8_4_ + fVar260;
            uStack_6b8._4_4_ = auVar228._12_4_ + fVar272;
            auStack_6b0._0_4_ = auVar228._16_4_ + fVar347;
            auStack_6b0._4_4_ = auVar228._20_4_ + fVar348;
            fStack_6a8 = auVar228._24_4_ + fVar350;
            fStack_6a4 = auVar228._28_4_ + -fVar257;
            fVar338 = fVar196 * 0.0 * fVar147;
            fVar343 = fVar172 * 0.0 * fVar167;
            auVar76._4_4_ = fVar343;
            auVar76._0_4_ = fVar338;
            fVar260 = fVar173 * 0.0 * fStack_818;
            auVar76._8_4_ = fVar260;
            fVar272 = fVar218 * 0.0 * fStack_814;
            auVar76._12_4_ = fVar272;
            fVar347 = fVar216 * 0.0 * fStack_810;
            auVar76._16_4_ = fVar347;
            fVar348 = fVar290 * 0.0 * fStack_80c;
            auVar76._20_4_ = fVar348;
            fVar350 = fVar237 * 0.0 * fStack_808;
            auVar76._24_4_ = fVar350;
            auVar76._28_4_ = fVar257;
            auVar223 = vsubps_avx(_local_5e0,auVar74);
            auVar385._0_4_ = fVar338 + auVar158._0_4_;
            auVar385._4_4_ = fVar343 + auVar158._4_4_;
            auVar385._8_4_ = fVar260 + auVar158._8_4_;
            auVar385._12_4_ = fVar272 + auVar158._12_4_;
            auVar385._16_4_ = fVar347 + auVar158._16_4_;
            auVar385._20_4_ = fVar348 + auVar158._20_4_;
            auVar385._24_4_ = fVar350 + auVar158._24_4_;
            auVar385._28_4_ = fVar257 + auVar158._28_4_;
            fVar338 = auVar300._0_4_ * fVar236 * fVar231;
            fVar231 = auVar300._4_4_ * fVar309 * fVar235;
            auVar77._4_4_ = fVar231;
            auVar77._0_4_ = fVar338;
            fVar343 = auVar300._8_4_ * fVar238 * fVar270;
            auVar77._8_4_ = fVar343;
            fVar235 = auVar300._12_4_ * fVar313 * fVar274;
            auVar77._12_4_ = fVar235;
            fVar260 = auVar300._16_4_ * fVar239 * fVar346;
            auVar77._16_4_ = fVar260;
            fVar270 = auVar300._20_4_ * fVar166 * fVar234;
            auVar77._20_4_ = fVar270;
            fVar272 = auVar300._24_4_ * fVar171 * fVar349;
            auVar77._24_4_ = fVar272;
            auVar77._28_4_ = fStack_804;
            auVar317 = vsubps_avx(auVar228,auVar75);
            auVar363._0_4_ = auVar372._0_4_ + fVar338;
            auVar363._4_4_ = auVar372._4_4_ + fVar231;
            auVar363._8_4_ = auVar372._8_4_ + fVar343;
            auVar363._12_4_ = auVar372._12_4_ + fVar235;
            auVar363._16_4_ = auVar372._16_4_ + fVar260;
            auVar363._20_4_ = auVar372._20_4_ + fVar270;
            auVar363._24_4_ = auVar372._24_4_ + fVar272;
            auVar363._28_4_ = auVar372._28_4_ + fStack_804;
            fVar338 = fVar236 * -fVar302 * auVar300._0_4_;
            fVar231 = fVar309 * -fVar276 * auVar300._4_4_;
            auVar78._4_4_ = fVar231;
            auVar78._0_4_ = fVar338;
            fVar343 = fVar238 * -fVar311 * auVar300._8_4_;
            auVar78._8_4_ = fVar343;
            fVar235 = fVar313 * -fVar277 * auVar300._12_4_;
            auVar78._12_4_ = fVar235;
            fVar260 = fVar239 * -fVar314 * auVar300._16_4_;
            auVar78._16_4_ = fVar260;
            fVar270 = fVar166 * -fVar146 * auVar300._20_4_;
            auVar78._20_4_ = fVar270;
            fVar272 = fVar171 * -fVar169 * auVar300._24_4_;
            auVar78._24_4_ = fVar272;
            auVar78._28_4_ = register0x0000145c;
            auVar354 = vsubps_avx(auVar158,auVar76);
            auVar250._0_4_ = auVar268._0_4_ + fVar338;
            auVar250._4_4_ = auVar268._4_4_ + fVar231;
            auVar250._8_4_ = auVar268._8_4_ + fVar343;
            auVar250._12_4_ = auVar268._12_4_ + fVar235;
            auVar250._16_4_ = auVar268._16_4_ + fVar260;
            auVar250._20_4_ = auVar268._20_4_ + fVar270;
            auVar250._24_4_ = auVar268._24_4_ + fVar272;
            auVar250._28_4_ = auVar268._28_4_ + register0x0000145c;
            fVar338 = fVar236 * 0.0 * auVar300._0_4_;
            fVar231 = fVar309 * 0.0 * auVar300._4_4_;
            auVar79._4_4_ = fVar231;
            auVar79._0_4_ = fVar338;
            fVar343 = fVar238 * 0.0 * auVar300._8_4_;
            auVar79._8_4_ = fVar343;
            fVar235 = fVar313 * 0.0 * auVar300._12_4_;
            auVar79._12_4_ = fVar235;
            fVar260 = fVar239 * 0.0 * auVar300._16_4_;
            auVar79._16_4_ = fVar260;
            fVar270 = fVar166 * 0.0 * auVar300._20_4_;
            auVar79._20_4_ = fVar270;
            fVar272 = fVar171 * 0.0 * auVar300._24_4_;
            auVar79._24_4_ = fVar272;
            auVar79._28_4_ = auVar158._28_4_;
            auVar160 = vsubps_avx(auVar372,auVar77);
            auVar127._4_4_ = fStack_6fc;
            auVar127._0_4_ = local_700;
            auVar127._8_4_ = fStack_6f8;
            auVar127._12_4_ = fStack_6f4;
            auVar127._16_4_ = fStack_6f0;
            auVar127._20_4_ = fStack_6ec;
            auVar127._24_4_ = fStack_6e8;
            auVar127._28_4_ = fStack_6e4;
            auVar320._0_4_ = local_700 + fVar338;
            auVar320._4_4_ = fStack_6fc + fVar231;
            auVar320._8_4_ = fStack_6f8 + fVar343;
            auVar320._12_4_ = fStack_6f4 + fVar235;
            auVar320._16_4_ = fStack_6f0 + fVar260;
            auVar320._20_4_ = fStack_6ec + fVar270;
            auVar320._24_4_ = fStack_6e8 + fVar272;
            auVar320._28_4_ = fStack_6e4 + auVar158._28_4_;
            auVar330 = vsubps_avx(auVar268,auVar78);
            auVar267 = vsubps_avx(auVar127,auVar79);
            auVar156 = vsubps_avx(auVar250,auVar317);
            auVar162 = vsubps_avx(auVar320,auVar354);
            auVar80._4_4_ = auVar354._4_4_ * auVar156._4_4_;
            auVar80._0_4_ = auVar354._0_4_ * auVar156._0_4_;
            auVar80._8_4_ = auVar354._8_4_ * auVar156._8_4_;
            auVar80._12_4_ = auVar354._12_4_ * auVar156._12_4_;
            auVar80._16_4_ = auVar354._16_4_ * auVar156._16_4_;
            auVar80._20_4_ = auVar354._20_4_ * auVar156._20_4_;
            auVar80._24_4_ = auVar354._24_4_ * auVar156._24_4_;
            auVar80._28_4_ = auVar357._28_4_;
            auVar81._4_4_ = auVar317._4_4_ * auVar162._4_4_;
            auVar81._0_4_ = auVar317._0_4_ * auVar162._0_4_;
            auVar81._8_4_ = auVar317._8_4_ * auVar162._8_4_;
            auVar81._12_4_ = auVar317._12_4_ * auVar162._12_4_;
            auVar81._16_4_ = auVar317._16_4_ * auVar162._16_4_;
            auVar81._20_4_ = auVar317._20_4_ * auVar162._20_4_;
            auVar81._24_4_ = auVar317._24_4_ * auVar162._24_4_;
            auVar81._28_4_ = auVar268._28_4_;
            auVar224 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = auVar223._4_4_ * auVar162._4_4_;
            auVar82._0_4_ = auVar223._0_4_ * auVar162._0_4_;
            auVar82._8_4_ = auVar223._8_4_ * auVar162._8_4_;
            auVar82._12_4_ = auVar223._12_4_ * auVar162._12_4_;
            auVar82._16_4_ = auVar223._16_4_ * auVar162._16_4_;
            auVar82._20_4_ = auVar223._20_4_ * auVar162._20_4_;
            auVar82._24_4_ = auVar223._24_4_ * auVar162._24_4_;
            auVar82._28_4_ = auVar162._28_4_;
            auVar162 = vsubps_avx(auVar363,auVar223);
            auVar83._4_4_ = auVar354._4_4_ * auVar162._4_4_;
            auVar83._0_4_ = auVar354._0_4_ * auVar162._0_4_;
            auVar83._8_4_ = auVar354._8_4_ * auVar162._8_4_;
            auVar83._12_4_ = auVar354._12_4_ * auVar162._12_4_;
            auVar83._16_4_ = auVar354._16_4_ * auVar162._16_4_;
            auVar83._20_4_ = auVar354._20_4_ * auVar162._20_4_;
            auVar83._24_4_ = auVar354._24_4_ * auVar162._24_4_;
            auVar83._28_4_ = auVar31._28_4_;
            auVar247 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar317._4_4_ * auVar162._4_4_;
            auVar84._0_4_ = auVar317._0_4_ * auVar162._0_4_;
            auVar84._8_4_ = auVar317._8_4_ * auVar162._8_4_;
            auVar84._12_4_ = auVar317._12_4_ * auVar162._12_4_;
            auVar84._16_4_ = auVar317._16_4_ * auVar162._16_4_;
            auVar84._20_4_ = auVar317._20_4_ * auVar162._20_4_;
            auVar84._24_4_ = auVar317._24_4_ * auVar162._24_4_;
            auVar84._28_4_ = auVar31._28_4_;
            auVar85._4_4_ = auVar223._4_4_ * auVar156._4_4_;
            auVar85._0_4_ = auVar223._0_4_ * auVar156._0_4_;
            auVar85._8_4_ = auVar223._8_4_ * auVar156._8_4_;
            auVar85._12_4_ = auVar223._12_4_ * auVar156._12_4_;
            auVar85._16_4_ = auVar223._16_4_ * auVar156._16_4_;
            auVar85._20_4_ = auVar223._20_4_ * auVar156._20_4_;
            auVar85._24_4_ = auVar223._24_4_ * auVar156._24_4_;
            auVar85._28_4_ = auVar156._28_4_;
            auVar31 = vsubps_avx(auVar85,auVar84);
            auVar187._0_4_ = auVar224._0_4_ * 0.0 + auVar31._0_4_ + auVar247._0_4_ * 0.0;
            auVar187._4_4_ = auVar224._4_4_ * 0.0 + auVar31._4_4_ + auVar247._4_4_ * 0.0;
            auVar187._8_4_ = auVar224._8_4_ * 0.0 + auVar31._8_4_ + auVar247._8_4_ * 0.0;
            auVar187._12_4_ = auVar224._12_4_ * 0.0 + auVar31._12_4_ + auVar247._12_4_ * 0.0;
            auVar187._16_4_ = auVar224._16_4_ * 0.0 + auVar31._16_4_ + auVar247._16_4_ * 0.0;
            auVar187._20_4_ = auVar224._20_4_ * 0.0 + auVar31._20_4_ + auVar247._20_4_ * 0.0;
            auVar187._24_4_ = auVar224._24_4_ * 0.0 + auVar31._24_4_ + auVar247._24_4_ * 0.0;
            auVar187._28_4_ = auVar224._28_4_ + auVar31._28_4_ + auVar247._28_4_;
            auVar298 = vcmpps_avx(auVar187,ZEXT832(0) << 0x20,2);
            auVar160 = vblendvps_avx(auVar160,_local_7a0,auVar298);
            auVar229 = ZEXT3264(auVar160);
            auVar31 = vblendvps_avx(auVar330,_local_6c0,auVar298);
            auVar330 = vblendvps_avx(auVar267,auVar385,auVar298);
            auVar267 = vblendvps_avx(auVar223,auVar363,auVar298);
            auVar156 = vblendvps_avx(auVar317,auVar250,auVar298);
            auVar162 = vblendvps_avx(auVar354,auVar320,auVar298);
            auVar223 = vblendvps_avx(auVar363,auVar223,auVar298);
            auVar224 = vblendvps_avx(auVar250,auVar317,auVar298);
            auVar247 = vblendvps_avx(auVar320,auVar354,auVar298);
            local_840 = vandps_avx(auVar163,auVar209);
            auVar223 = vsubps_avx(auVar223,auVar160);
            auVar35 = vsubps_avx(auVar224,auVar31);
            auVar247 = vsubps_avx(auVar247,auVar330);
            auVar36 = vsubps_avx(auVar31,auVar156);
            fVar338 = auVar35._0_4_;
            fVar193 = auVar330._0_4_;
            fVar274 = auVar35._4_4_;
            fVar194 = auVar330._4_4_;
            auVar86._4_4_ = fVar194 * fVar274;
            auVar86._0_4_ = fVar193 * fVar338;
            fVar302 = auVar35._8_4_;
            fVar195 = auVar330._8_4_;
            auVar86._8_4_ = fVar195 * fVar302;
            fVar313 = auVar35._12_4_;
            fVar197 = auVar330._12_4_;
            auVar86._12_4_ = fVar197 * fVar313;
            fVar196 = auVar35._16_4_;
            fVar198 = auVar330._16_4_;
            auVar86._16_4_ = fVar198 * fVar196;
            fVar291 = auVar35._20_4_;
            fVar210 = auVar330._20_4_;
            auVar86._20_4_ = fVar210 * fVar291;
            fVar257 = auVar35._24_4_;
            fVar211 = auVar330._24_4_;
            auVar86._24_4_ = fVar211 * fVar257;
            auVar86._28_4_ = auVar224._28_4_;
            fVar231 = auVar31._0_4_;
            fVar212 = auVar247._0_4_;
            fVar347 = auVar31._4_4_;
            fVar213 = auVar247._4_4_;
            auVar87._4_4_ = fVar213 * fVar347;
            auVar87._0_4_ = fVar212 * fVar231;
            fVar236 = auVar31._8_4_;
            fVar214 = auVar247._8_4_;
            auVar87._8_4_ = fVar214 * fVar236;
            fVar314 = auVar31._12_4_;
            fVar215 = auVar247._12_4_;
            auVar87._12_4_ = fVar215 * fVar314;
            fVar172 = auVar31._16_4_;
            fVar261 = auVar247._16_4_;
            auVar87._16_4_ = fVar261 * fVar172;
            fVar279 = auVar31._20_4_;
            fVar271 = auVar247._20_4_;
            auVar87._20_4_ = fVar271 * fVar279;
            fVar259 = auVar31._24_4_;
            fVar273 = auVar247._24_4_;
            uVar13 = auVar317._28_4_;
            auVar87._24_4_ = fVar273 * fVar259;
            auVar87._28_4_ = uVar13;
            auVar224 = vsubps_avx(auVar87,auVar86);
            fVar343 = auVar160._0_4_;
            fVar346 = auVar160._4_4_;
            auVar88._4_4_ = fVar213 * fVar346;
            auVar88._0_4_ = fVar212 * fVar343;
            fVar276 = auVar160._8_4_;
            auVar88._8_4_ = fVar214 * fVar276;
            fVar239 = auVar160._12_4_;
            auVar88._12_4_ = fVar215 * fVar239;
            fVar173 = auVar160._16_4_;
            auVar88._16_4_ = fVar261 * fVar173;
            fVar308 = auVar160._20_4_;
            auVar88._20_4_ = fVar271 * fVar308;
            fVar145 = auVar160._24_4_;
            auVar88._24_4_ = fVar273 * fVar145;
            auVar88._28_4_ = uVar13;
            fVar235 = auVar223._0_4_;
            fVar348 = auVar223._4_4_;
            auVar89._4_4_ = fVar194 * fVar348;
            auVar89._0_4_ = fVar193 * fVar235;
            fVar309 = auVar223._8_4_;
            auVar89._8_4_ = fVar195 * fVar309;
            fVar146 = auVar223._12_4_;
            auVar89._12_4_ = fVar197 * fVar146;
            fVar218 = auVar223._16_4_;
            auVar89._16_4_ = fVar198 * fVar218;
            fVar310 = auVar223._20_4_;
            auVar89._20_4_ = fVar210 * fVar310;
            fVar165 = auVar223._24_4_;
            auVar89._24_4_ = fVar211 * fVar165;
            auVar89._28_4_ = auVar363._28_4_;
            auVar317 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = fVar347 * fVar348;
            auVar90._0_4_ = fVar231 * fVar235;
            auVar90._8_4_ = fVar236 * fVar309;
            auVar90._12_4_ = fVar314 * fVar146;
            auVar90._16_4_ = fVar172 * fVar218;
            auVar90._20_4_ = fVar279 * fVar310;
            auVar90._24_4_ = fVar259 * fVar165;
            auVar90._28_4_ = uVar13;
            auVar91._4_4_ = fVar346 * fVar274;
            auVar91._0_4_ = fVar343 * fVar338;
            auVar91._8_4_ = fVar276 * fVar302;
            auVar91._12_4_ = fVar239 * fVar313;
            auVar91._16_4_ = fVar173 * fVar196;
            auVar91._20_4_ = fVar308 * fVar291;
            auVar91._24_4_ = fVar145 * fVar257;
            auVar91._28_4_ = auVar354._28_4_;
            auVar354 = vsubps_avx(auVar91,auVar90);
            auVar37 = vsubps_avx(auVar330,auVar162);
            fVar270 = auVar354._28_4_ + auVar317._28_4_;
            auVar329._0_4_ = auVar354._0_4_ + auVar317._0_4_ * 0.0 + auVar224._0_4_ * 0.0;
            auVar329._4_4_ = auVar354._4_4_ + auVar317._4_4_ * 0.0 + auVar224._4_4_ * 0.0;
            auVar329._8_4_ = auVar354._8_4_ + auVar317._8_4_ * 0.0 + auVar224._8_4_ * 0.0;
            auVar329._12_4_ = auVar354._12_4_ + auVar317._12_4_ * 0.0 + auVar224._12_4_ * 0.0;
            auVar329._16_4_ = auVar354._16_4_ + auVar317._16_4_ * 0.0 + auVar224._16_4_ * 0.0;
            auVar329._20_4_ = auVar354._20_4_ + auVar317._20_4_ * 0.0 + auVar224._20_4_ * 0.0;
            auVar329._24_4_ = auVar354._24_4_ + auVar317._24_4_ * 0.0 + auVar224._24_4_ * 0.0;
            auVar329._28_4_ = fVar270 + auVar224._28_4_;
            fVar260 = auVar36._0_4_;
            fVar234 = auVar36._4_4_;
            auVar92._4_4_ = auVar162._4_4_ * fVar234;
            auVar92._0_4_ = auVar162._0_4_ * fVar260;
            fVar311 = auVar36._8_4_;
            auVar92._8_4_ = auVar162._8_4_ * fVar311;
            fVar166 = auVar36._12_4_;
            auVar92._12_4_ = auVar162._12_4_ * fVar166;
            fVar216 = auVar36._16_4_;
            auVar92._16_4_ = auVar162._16_4_ * fVar216;
            fVar312 = auVar36._20_4_;
            auVar92._20_4_ = auVar162._20_4_ * fVar312;
            fVar168 = auVar36._24_4_;
            auVar92._24_4_ = auVar162._24_4_ * fVar168;
            auVar92._28_4_ = fVar270;
            fVar270 = auVar37._0_4_;
            fVar350 = auVar37._4_4_;
            auVar93._4_4_ = auVar156._4_4_ * fVar350;
            auVar93._0_4_ = auVar156._0_4_ * fVar270;
            fVar238 = auVar37._8_4_;
            auVar93._8_4_ = auVar156._8_4_ * fVar238;
            fVar169 = auVar37._12_4_;
            auVar93._12_4_ = auVar156._12_4_ * fVar169;
            fVar290 = auVar37._16_4_;
            auVar93._16_4_ = auVar156._16_4_ * fVar290;
            fVar242 = auVar37._20_4_;
            auVar93._20_4_ = auVar156._20_4_ * fVar242;
            fVar170 = auVar37._24_4_;
            auVar93._24_4_ = auVar156._24_4_ * fVar170;
            auVar93._28_4_ = auVar354._28_4_;
            auVar317 = vsubps_avx(auVar93,auVar92);
            auVar354 = vsubps_avx(auVar160,auVar267);
            fVar272 = auVar354._0_4_;
            fVar349 = auVar354._4_4_;
            auVar94._4_4_ = auVar162._4_4_ * fVar349;
            auVar94._0_4_ = auVar162._0_4_ * fVar272;
            fVar277 = auVar354._8_4_;
            auVar94._8_4_ = auVar162._8_4_ * fVar277;
            fVar171 = auVar354._12_4_;
            auVar94._12_4_ = auVar162._12_4_ * fVar171;
            fVar237 = auVar354._16_4_;
            auVar94._16_4_ = auVar162._16_4_ * fVar237;
            fVar255 = auVar354._20_4_;
            auVar94._20_4_ = auVar162._20_4_ * fVar255;
            fVar174 = auVar354._24_4_;
            auVar94._24_4_ = auVar162._24_4_ * fVar174;
            auVar94._28_4_ = auVar162._28_4_;
            auVar95._4_4_ = fVar350 * auVar267._4_4_;
            auVar95._0_4_ = fVar270 * auVar267._0_4_;
            auVar95._8_4_ = fVar238 * auVar267._8_4_;
            auVar95._12_4_ = fVar169 * auVar267._12_4_;
            auVar95._16_4_ = fVar290 * auVar267._16_4_;
            auVar95._20_4_ = fVar242 * auVar267._20_4_;
            auVar95._24_4_ = fVar170 * auVar267._24_4_;
            auVar95._28_4_ = auVar224._28_4_;
            auVar162 = vsubps_avx(auVar94,auVar95);
            auVar386 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar96._4_4_ = auVar156._4_4_ * fVar349;
            auVar96._0_4_ = auVar156._0_4_ * fVar272;
            auVar96._8_4_ = auVar156._8_4_ * fVar277;
            auVar96._12_4_ = auVar156._12_4_ * fVar171;
            auVar96._16_4_ = auVar156._16_4_ * fVar237;
            auVar96._20_4_ = auVar156._20_4_ * fVar255;
            auVar96._24_4_ = auVar156._24_4_ * fVar174;
            auVar96._28_4_ = auVar156._28_4_;
            auVar97._4_4_ = fVar234 * auVar267._4_4_;
            auVar97._0_4_ = fVar260 * auVar267._0_4_;
            auVar97._8_4_ = fVar311 * auVar267._8_4_;
            auVar97._12_4_ = fVar166 * auVar267._12_4_;
            auVar97._16_4_ = fVar216 * auVar267._16_4_;
            auVar97._20_4_ = fVar312 * auVar267._20_4_;
            auVar97._24_4_ = fVar168 * auVar267._24_4_;
            auVar97._28_4_ = auVar267._28_4_;
            auVar267 = vsubps_avx(auVar97,auVar96);
            auVar224 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar159._0_4_ = auVar317._0_4_ * 0.0 + auVar267._0_4_ + auVar162._0_4_ * 0.0;
            auVar159._4_4_ = auVar317._4_4_ * 0.0 + auVar267._4_4_ + auVar162._4_4_ * 0.0;
            auVar159._8_4_ = auVar317._8_4_ * 0.0 + auVar267._8_4_ + auVar162._8_4_ * 0.0;
            auVar159._12_4_ = auVar317._12_4_ * 0.0 + auVar267._12_4_ + auVar162._12_4_ * 0.0;
            auVar159._16_4_ = auVar317._16_4_ * 0.0 + auVar267._16_4_ + auVar162._16_4_ * 0.0;
            auVar159._20_4_ = auVar317._20_4_ * 0.0 + auVar267._20_4_ + auVar162._20_4_ * 0.0;
            auVar159._24_4_ = auVar317._24_4_ * 0.0 + auVar267._24_4_ + auVar162._24_4_ * 0.0;
            auVar159._28_4_ = auVar162._28_4_ + auVar267._28_4_ + auVar162._28_4_;
            auVar164 = ZEXT3264(auVar159);
            auVar267 = vmaxps_avx(auVar329,auVar159);
            auVar267 = vcmpps_avx(auVar267,auVar224,2);
            auVar156 = local_840 & auVar267;
            if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar156 >> 0x7f,0) == '\0') &&
                  (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar156 >> 0xbf,0) == '\0') &&
                (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar156[0x1f]) {
LAB_010806dd:
              auVar189._8_8_ = uStack_538;
              auVar189._0_8_ = local_540;
              auVar189._16_8_ = uStack_530;
              auVar189._24_8_ = uStack_528;
              auVar252 = ZEXT3264(_local_4e0);
              auVar331 = ZEXT3264(local_4c0);
              auVar341._4_4_ = fVar167;
              auVar341._0_4_ = fVar147;
              auVar341._8_4_ = fStack_818;
              auVar341._12_4_ = fStack_814;
              auVar341._16_4_ = fStack_810;
              auVar341._20_4_ = fStack_80c;
              auVar341._24_4_ = fStack_808;
              auVar341._28_4_ = fStack_804;
            }
            else {
              auVar156 = vandps_avx(auVar267,local_840);
              auVar98._4_4_ = fVar350 * fVar274;
              auVar98._0_4_ = fVar270 * fVar338;
              auVar98._8_4_ = fVar238 * fVar302;
              auVar98._12_4_ = fVar169 * fVar313;
              auVar98._16_4_ = fVar290 * fVar196;
              auVar98._20_4_ = fVar242 * fVar291;
              auVar98._24_4_ = fVar170 * fVar257;
              auVar98._28_4_ = local_840._28_4_;
              auVar99._4_4_ = fVar234 * fVar213;
              auVar99._0_4_ = fVar260 * fVar212;
              auVar99._8_4_ = fVar311 * fVar214;
              auVar99._12_4_ = fVar166 * fVar215;
              auVar99._16_4_ = fVar216 * fVar261;
              auVar99._20_4_ = fVar312 * fVar271;
              auVar99._24_4_ = fVar168 * fVar273;
              auVar99._28_4_ = auVar267._28_4_;
              auVar162 = vsubps_avx(auVar99,auVar98);
              auVar100._4_4_ = fVar349 * fVar213;
              auVar100._0_4_ = fVar272 * fVar212;
              auVar100._8_4_ = fVar277 * fVar214;
              auVar100._12_4_ = fVar171 * fVar215;
              auVar100._16_4_ = fVar237 * fVar261;
              auVar100._20_4_ = fVar255 * fVar271;
              auVar100._24_4_ = fVar174 * fVar273;
              auVar100._28_4_ = auVar247._28_4_;
              auVar101._4_4_ = fVar350 * fVar348;
              auVar101._0_4_ = fVar270 * fVar235;
              auVar101._8_4_ = fVar238 * fVar309;
              auVar101._12_4_ = fVar169 * fVar146;
              auVar101._16_4_ = fVar290 * fVar218;
              auVar101._20_4_ = fVar242 * fVar310;
              auVar101._24_4_ = fVar170 * fVar165;
              auVar101._28_4_ = auVar37._28_4_;
              auVar247 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar234 * fVar348;
              auVar102._0_4_ = fVar260 * fVar235;
              auVar102._8_4_ = fVar311 * fVar309;
              auVar102._12_4_ = fVar166 * fVar146;
              auVar102._16_4_ = fVar216 * fVar218;
              auVar102._20_4_ = fVar312 * fVar310;
              auVar102._24_4_ = fVar168 * fVar165;
              auVar102._28_4_ = auVar223._28_4_;
              auVar103._4_4_ = fVar349 * fVar274;
              auVar103._0_4_ = fVar272 * fVar338;
              auVar103._8_4_ = fVar277 * fVar302;
              auVar103._12_4_ = fVar171 * fVar313;
              auVar103._16_4_ = fVar237 * fVar196;
              auVar103._20_4_ = fVar255 * fVar291;
              auVar103._24_4_ = fVar174 * fVar257;
              auVar103._28_4_ = auVar35._28_4_;
              auVar317 = vsubps_avx(auVar103,auVar102);
              auVar188._0_4_ = auVar162._0_4_ * 0.0 + auVar317._0_4_ + auVar247._0_4_ * 0.0;
              auVar188._4_4_ = auVar162._4_4_ * 0.0 + auVar317._4_4_ + auVar247._4_4_ * 0.0;
              auVar188._8_4_ = auVar162._8_4_ * 0.0 + auVar317._8_4_ + auVar247._8_4_ * 0.0;
              auVar188._12_4_ = auVar162._12_4_ * 0.0 + auVar317._12_4_ + auVar247._12_4_ * 0.0;
              auVar188._16_4_ = auVar162._16_4_ * 0.0 + auVar317._16_4_ + auVar247._16_4_ * 0.0;
              auVar188._20_4_ = auVar162._20_4_ * 0.0 + auVar317._20_4_ + auVar247._20_4_ * 0.0;
              auVar188._24_4_ = auVar162._24_4_ * 0.0 + auVar317._24_4_ + auVar247._24_4_ * 0.0;
              auVar188._28_4_ = auVar35._28_4_ + auVar317._28_4_ + auVar223._28_4_;
              auVar267 = vrcpps_avx(auVar188);
              fVar338 = auVar267._0_4_;
              fVar235 = auVar267._4_4_;
              auVar104._4_4_ = auVar188._4_4_ * fVar235;
              auVar104._0_4_ = auVar188._0_4_ * fVar338;
              fVar260 = auVar267._8_4_;
              auVar104._8_4_ = auVar188._8_4_ * fVar260;
              fVar270 = auVar267._12_4_;
              auVar104._12_4_ = auVar188._12_4_ * fVar270;
              fVar272 = auVar267._16_4_;
              auVar104._16_4_ = auVar188._16_4_ * fVar272;
              fVar274 = auVar267._20_4_;
              auVar104._20_4_ = auVar188._20_4_ * fVar274;
              fVar348 = auVar267._24_4_;
              auVar104._24_4_ = auVar188._24_4_ * fVar348;
              auVar104._28_4_ = auVar37._28_4_;
              auVar358._8_4_ = 0x3f800000;
              auVar358._0_8_ = &DAT_3f8000003f800000;
              auVar358._12_4_ = 0x3f800000;
              auVar358._16_4_ = 0x3f800000;
              auVar358._20_4_ = 0x3f800000;
              auVar358._24_4_ = 0x3f800000;
              auVar358._28_4_ = 0x3f800000;
              auVar267 = vsubps_avx(auVar358,auVar104);
              fVar338 = auVar267._0_4_ * fVar338 + fVar338;
              fVar235 = auVar267._4_4_ * fVar235 + fVar235;
              fVar260 = auVar267._8_4_ * fVar260 + fVar260;
              fVar270 = auVar267._12_4_ * fVar270 + fVar270;
              fVar272 = auVar267._16_4_ * fVar272 + fVar272;
              fVar274 = auVar267._20_4_ * fVar274 + fVar274;
              fVar348 = auVar267._24_4_ * fVar348 + fVar348;
              auVar105._4_4_ =
                   (fVar346 * auVar162._4_4_ + auVar247._4_4_ * fVar347 + auVar317._4_4_ * fVar194)
                   * fVar235;
              auVar105._0_4_ =
                   (fVar343 * auVar162._0_4_ + auVar247._0_4_ * fVar231 + auVar317._0_4_ * fVar193)
                   * fVar338;
              auVar105._8_4_ =
                   (fVar276 * auVar162._8_4_ + auVar247._8_4_ * fVar236 + auVar317._8_4_ * fVar195)
                   * fVar260;
              auVar105._12_4_ =
                   (fVar239 * auVar162._12_4_ +
                   auVar247._12_4_ * fVar314 + auVar317._12_4_ * fVar197) * fVar270;
              auVar105._16_4_ =
                   (fVar173 * auVar162._16_4_ +
                   auVar247._16_4_ * fVar172 + auVar317._16_4_ * fVar198) * fVar272;
              auVar105._20_4_ =
                   (fVar308 * auVar162._20_4_ +
                   auVar247._20_4_ * fVar279 + auVar317._20_4_ * fVar210) * fVar274;
              auVar105._24_4_ =
                   (fVar145 * auVar162._24_4_ +
                   auVar247._24_4_ * fVar259 + auVar317._24_4_ * fVar211) * fVar348;
              auVar105._28_4_ = auVar160._28_4_ + auVar31._28_4_ + auVar330._28_4_;
              auVar229 = ZEXT3264(auVar105);
              uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar251._4_4_ = uVar13;
              auVar251._0_4_ = uVar13;
              auVar251._8_4_ = uVar13;
              auVar251._12_4_ = uVar13;
              auVar251._16_4_ = uVar13;
              auVar251._20_4_ = uVar13;
              auVar251._24_4_ = uVar13;
              auVar251._28_4_ = uVar13;
              auVar160 = vcmpps_avx(_local_1c0,auVar105,2);
              auVar31 = vcmpps_avx(auVar105,auVar251,2);
              auVar160 = vandps_avx(auVar160,auVar31);
              auVar31 = auVar156 & auVar160;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar31 >> 0x7f,0) == '\0') &&
                    (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar31 >> 0xbf,0) == '\0') &&
                  (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar31[0x1f]) goto LAB_010806dd;
              auVar160 = vandps_avx(auVar156,auVar160);
              auVar31 = vcmpps_avx(auVar224,auVar188,4);
              auVar330 = auVar160 & auVar31;
              auVar189._8_8_ = uStack_538;
              auVar189._0_8_ = local_540;
              auVar189._16_8_ = uStack_530;
              auVar189._24_8_ = uStack_528;
              auVar252 = ZEXT3264(_local_4e0);
              auVar331 = ZEXT3264(local_4c0);
              auVar341._4_4_ = fVar167;
              auVar341._0_4_ = fVar147;
              auVar341._8_4_ = fStack_818;
              auVar341._12_4_ = fStack_814;
              auVar341._16_4_ = fStack_810;
              auVar341._20_4_ = fStack_80c;
              auVar341._24_4_ = fStack_808;
              auVar341._28_4_ = fStack_804;
              if ((((((((auVar330 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar330 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar330 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar330 >> 0x7f,0) != '\0') ||
                    (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar330 >> 0xbf,0) != '\0') ||
                  (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar330[0x1f] < '\0') {
                auVar189 = vandps_avx(auVar31,auVar160);
                auVar106._4_4_ = auVar329._4_4_ * fVar235;
                auVar106._0_4_ = auVar329._0_4_ * fVar338;
                auVar106._8_4_ = auVar329._8_4_ * fVar260;
                auVar106._12_4_ = auVar329._12_4_ * fVar270;
                auVar106._16_4_ = auVar329._16_4_ * fVar272;
                auVar106._20_4_ = auVar329._20_4_ * fVar274;
                auVar106._24_4_ = auVar329._24_4_ * fVar348;
                auVar106._28_4_ = local_4e0._28_4_;
                auVar107._4_4_ = auVar159._4_4_ * fVar235;
                auVar107._0_4_ = auVar159._0_4_ * fVar338;
                auVar107._8_4_ = auVar159._8_4_ * fVar260;
                auVar107._12_4_ = auVar159._12_4_ * fVar270;
                auVar107._16_4_ = auVar159._16_4_ * fVar272;
                auVar107._20_4_ = auVar159._20_4_ * fVar274;
                auVar107._24_4_ = auVar159._24_4_ * fVar348;
                auVar107._28_4_ = auVar159._28_4_;
                auVar164 = ZEXT3264(auVar107);
                auVar286._8_4_ = 0x3f800000;
                auVar286._0_8_ = &DAT_3f8000003f800000;
                auVar286._12_4_ = 0x3f800000;
                auVar286._16_4_ = 0x3f800000;
                auVar286._20_4_ = 0x3f800000;
                auVar286._24_4_ = 0x3f800000;
                auVar286._28_4_ = 0x3f800000;
                auVar160 = vsubps_avx(auVar286,auVar106);
                local_220 = vblendvps_avx(auVar160,auVar106,auVar298);
                auVar160 = vsubps_avx(auVar286,auVar107);
                auVar160 = vblendvps_avx(auVar160,auVar107,auVar298);
                auVar252 = ZEXT3264(auVar160);
                auVar331 = ZEXT3264(auVar105);
              }
            }
            local_4c0 = auVar331._0_32_;
            _local_4e0 = auVar252._0_32_;
            if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar189 >> 0x7f,0) == '\0') &&
                  (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar189 >> 0xbf,0) == '\0') &&
                (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar189[0x1f]) {
              auVar301 = ZEXT3264(_local_740);
            }
            else {
              auVar160 = vsubps_avx(auVar300,auVar341);
              fVar231 = auVar341._0_4_ + local_220._0_4_ * auVar160._0_4_;
              fVar343 = auVar341._4_4_ + local_220._4_4_ * auVar160._4_4_;
              fVar235 = auVar341._8_4_ + local_220._8_4_ * auVar160._8_4_;
              fVar260 = auVar341._12_4_ + local_220._12_4_ * auVar160._12_4_;
              fVar270 = auVar341._16_4_ + local_220._16_4_ * auVar160._16_4_;
              fVar272 = auVar341._20_4_ + local_220._20_4_ * auVar160._20_4_;
              fVar274 = auVar341._24_4_ + local_220._24_4_ * auVar160._24_4_;
              fVar347 = auVar341._28_4_ + auVar160._28_4_;
              fVar338 = *(float *)((long)local_848->ray_space + k * 4 + -0x10);
              auVar108._4_4_ = (fVar343 + fVar343) * fVar338;
              auVar108._0_4_ = (fVar231 + fVar231) * fVar338;
              auVar108._8_4_ = (fVar235 + fVar235) * fVar338;
              auVar108._12_4_ = (fVar260 + fVar260) * fVar338;
              auVar108._16_4_ = (fVar270 + fVar270) * fVar338;
              auVar108._20_4_ = (fVar272 + fVar272) * fVar338;
              auVar108._24_4_ = (fVar274 + fVar274) * fVar338;
              auVar108._28_4_ = fVar347 + fVar347;
              auVar160 = vcmpps_avx(local_4c0,auVar108,6);
              auVar164 = ZEXT3264(auVar160);
              auVar31 = auVar189 & auVar160;
              auVar301 = ZEXT3264(_local_740);
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                local_2a0 = vandps_avx(auVar160,auVar189);
                auVar164 = ZEXT3264(local_2a0);
                local_340 = auVar252._0_4_ + auVar252._0_4_ + -1.0;
                fStack_33c = auVar252._4_4_ + auVar252._4_4_ + -1.0;
                fStack_338 = auVar252._8_4_ + auVar252._8_4_ + -1.0;
                fStack_334 = auVar252._12_4_ + auVar252._12_4_ + -1.0;
                fStack_330 = auVar252._16_4_ + auVar252._16_4_ + -1.0;
                fStack_32c = auVar252._20_4_ + auVar252._20_4_ + -1.0;
                fStack_328 = auVar252._24_4_ + auVar252._24_4_ + -1.0;
                fStack_324 = auVar252._28_4_ + auVar252._28_4_ + -1.0;
                local_360 = local_220;
                local_320 = local_4c0;
                local_2fc = uVar16;
                local_2f0 = auVar245._0_8_;
                uStack_2e8 = uStack_868;
                local_2e0 = local_650;
                uStack_2d8 = uStack_648;
                local_2d0 = local_660;
                uStack_2c8 = uStack_658;
                local_2c0 = local_670;
                uStack_2b8 = uStack_668;
                pGVar144 = (context->scene->geometries).items[uVar140].ptr;
                local_4e0._4_4_ = fStack_33c;
                local_4e0._0_4_ = local_340;
                fStack_4d8 = fStack_338;
                fStack_4d4 = fStack_334;
                fStack_4d0 = fStack_330;
                fStack_4cc = fStack_32c;
                fStack_4c8 = fStack_328;
                fStack_4c4 = fStack_324;
                if ((pGVar144->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar203._0_4_ = (float)(int)local_300;
                  auVar203._4_8_ = SUB128(ZEXT812(0),4);
                  auVar203._12_4_ = 0;
                  auVar180 = vshufps_avx(auVar203,auVar203,0);
                  local_280[0] = (auVar180._0_4_ + local_220._0_4_ + 0.0) * (float)local_480._0_4_;
                  local_280[1] = (auVar180._4_4_ + local_220._4_4_ + 1.0) * (float)local_480._4_4_;
                  local_280[2] = (auVar180._8_4_ + local_220._8_4_ + 2.0) * fStack_478;
                  local_280[3] = (auVar180._12_4_ + local_220._12_4_ + 3.0) * fStack_474;
                  fStack_270 = (auVar180._0_4_ + local_220._16_4_ + 4.0) * fStack_470;
                  fStack_26c = (auVar180._4_4_ + local_220._20_4_ + 5.0) * fStack_46c;
                  fStack_268 = (auVar180._8_4_ + local_220._24_4_ + 6.0) * fStack_468;
                  fStack_264 = auVar180._12_4_ + local_220._28_4_ + 7.0;
                  local_260 = CONCAT44(fStack_33c,local_340);
                  uStack_258 = CONCAT44(fStack_334,fStack_338);
                  uStack_250 = CONCAT44(fStack_32c,fStack_330);
                  uStack_248 = CONCAT44(fStack_324,fStack_328);
                  local_240 = local_4c0;
                  auVar190._8_4_ = 0x7f800000;
                  auVar190._0_8_ = 0x7f8000007f800000;
                  auVar190._12_4_ = 0x7f800000;
                  auVar190._16_4_ = 0x7f800000;
                  auVar190._20_4_ = 0x7f800000;
                  auVar190._24_4_ = 0x7f800000;
                  auVar190._28_4_ = 0x7f800000;
                  auVar160 = vblendvps_avx(auVar190,local_4c0,local_2a0);
                  auVar31 = vshufps_avx(auVar160,auVar160,0xb1);
                  auVar31 = vminps_avx(auVar160,auVar31);
                  auVar330 = vshufpd_avx(auVar31,auVar31,5);
                  auVar31 = vminps_avx(auVar31,auVar330);
                  auVar330 = vperm2f128_avx(auVar31,auVar31,1);
                  auVar31 = vminps_avx(auVar31,auVar330);
                  auVar31 = vcmpps_avx(auVar160,auVar31,0);
                  auVar330 = local_2a0 & auVar31;
                  auVar160 = local_2a0;
                  if ((((((((auVar330 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar330 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar330 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar330 >> 0x7f,0) != '\0') ||
                        (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar330 >> 0xbf,0) != '\0') ||
                      (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar330[0x1f] < '\0') {
                    auVar160 = vandps_avx(auVar31,local_2a0);
                  }
                  uVar138 = vmovmskps_avx(auVar160);
                  uVar21 = 0;
                  if (uVar138 != 0) {
                    for (; (uVar138 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar139 = (ulong)uVar21;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar144->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar338 = local_280[uVar139];
                    auVar164 = ZEXT464((uint)fVar338);
                    fVar235 = 1.0 - fVar338;
                    fVar343 = fVar338 * 3.0;
                    fVar231 = (fVar338 + fVar338) * (fVar343 + -5.0) + fVar338 * fVar343;
                    auVar252 = ZEXT464((uint)fVar231);
                    auVar180 = ZEXT416((uint)((fVar235 * -2.0 * fVar338 + fVar338 * fVar338) * 0.5))
                    ;
                    auVar180 = vshufps_avx(auVar180,auVar180,0);
                    auVar204 = ZEXT416((uint)(((fVar235 + fVar235) * (fVar343 + 2.0) +
                                              fVar235 * fVar235 * -3.0) * 0.5));
                    auVar204 = vshufps_avx(auVar204,auVar204,0);
                    auVar205 = ZEXT416((uint)(fVar231 * 0.5));
                    auVar205 = vshufps_avx(auVar205,auVar205,0);
                    uVar13 = *(undefined4 *)((long)&local_260 + uVar139 * 4);
                    auVar222 = ZEXT416((uint)((fVar338 * (fVar235 + fVar235) - fVar235 * fVar235) *
                                             0.5));
                    auVar222 = vshufps_avx(auVar222,auVar222,0);
                    auVar181._0_4_ =
                         auVar222._0_4_ * fVar241 +
                         auVar205._0_4_ * (float)local_650._0_4_ +
                         auVar180._0_4_ * (float)local_670._0_4_ +
                         auVar204._0_4_ * (float)local_660._0_4_;
                    auVar181._4_4_ =
                         auVar222._4_4_ * fVar254 +
                         auVar205._4_4_ * (float)local_650._4_4_ +
                         auVar180._4_4_ * (float)local_670._4_4_ +
                         auVar204._4_4_ * (float)local_660._4_4_;
                    auVar181._8_4_ =
                         auVar222._8_4_ * auVar245._8_4_ +
                         auVar205._8_4_ * (float)uStack_648 +
                         auVar180._8_4_ * (float)uStack_668 + auVar204._8_4_ * (float)uStack_658;
                    auVar181._12_4_ =
                         auVar222._12_4_ * auVar245._12_4_ +
                         auVar205._12_4_ * uStack_648._4_4_ +
                         auVar180._12_4_ * uStack_668._4_4_ + auVar204._12_4_ * uStack_658._4_4_;
                    auVar229 = ZEXT464(*(uint *)(local_240 + uVar139 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_240 + uVar139 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar181._0_4_;
                    uVar17 = vextractps_avx(auVar181,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar17;
                    uVar17 = vextractps_avx(auVar181,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar17;
                    *(float *)(ray + k * 4 + 0xf0) = fVar338;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar13;
                    *(uint *)(ray + k * 4 + 0x110) = uVar15;
                    *(uint *)(ray + k * 4 + 0x120) = uVar140;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    _local_5e0 = _local_650;
                    auStack_750 = auVar268._16_16_;
                    _local_760 = _local_660;
                    _local_7a0 = _local_670;
                    _auStack_770 = auVar163._16_16_;
                    _local_780 = *local_708;
                    _auStack_7b8 = auVar372._8_24_;
                    local_7c0 = pGVar144;
                    _local_6e0 = auVar209;
                    _local_640 = auVar300;
                    local_580 = local_2a0;
                    do {
                      local_840._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_3c0 = local_280[uVar139];
                      local_3b0 = *(undefined4 *)((long)&local_260 + uVar139 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_240 + uVar139 * 4)
                      ;
                      fVar231 = 1.0 - local_3c0;
                      fVar343 = local_3c0 * (fVar231 + fVar231) - fVar231 * fVar231;
                      auVar252 = ZEXT464((uint)fVar343);
                      fVar338 = local_3c0 * 3.0;
                      auVar180 = ZEXT416((uint)((fVar231 * -2.0 * local_3c0 + local_3c0 * local_3c0)
                                               * 0.5));
                      auVar180 = vshufps_avx(auVar180,auVar180,0);
                      auVar204 = ZEXT416((uint)(((fVar231 + fVar231) * (fVar338 + 2.0) +
                                                fVar231 * fVar231 * -3.0) * 0.5));
                      auVar204 = vshufps_avx(auVar204,auVar204,0);
                      auVar205 = ZEXT416((uint)(((local_3c0 + local_3c0) * (fVar338 + -5.0) +
                                                local_3c0 * fVar338) * 0.5));
                      auVar205 = vshufps_avx(auVar205,auVar205,0);
                      local_7f0.context = context->user;
                      auVar222 = vshufps_avx(ZEXT416((uint)(fVar343 * 0.5)),
                                             ZEXT416((uint)(fVar343 * 0.5)),0);
                      auVar206._0_4_ =
                           auVar222._0_4_ * fVar241 +
                           auVar205._0_4_ * (float)local_5e0._0_4_ +
                           auVar180._0_4_ * (float)local_7a0._0_4_ +
                           auVar204._0_4_ * (float)local_760._0_4_;
                      auVar206._4_4_ =
                           auVar222._4_4_ * fVar254 +
                           auVar205._4_4_ * (float)local_5e0._4_4_ +
                           auVar180._4_4_ * (float)local_7a0._4_4_ +
                           auVar204._4_4_ * (float)local_760._4_4_;
                      auVar206._8_4_ =
                           auVar222._8_4_ * auVar245._8_4_ +
                           auVar205._8_4_ * fStack_5d8 +
                           auVar180._8_4_ * (float)uStack_798 + auVar204._8_4_ * fStack_758;
                      auVar206._12_4_ =
                           auVar222._12_4_ * auVar245._12_4_ +
                           auVar205._12_4_ * fStack_5d4 +
                           auVar180._12_4_ * uStack_798._4_4_ + auVar204._12_4_ * fStack_754;
                      auVar180 = vshufps_avx(auVar206,auVar206,0);
                      local_3f0[0] = (RTCHitN)auVar180[0];
                      local_3f0[1] = (RTCHitN)auVar180[1];
                      local_3f0[2] = (RTCHitN)auVar180[2];
                      local_3f0[3] = (RTCHitN)auVar180[3];
                      local_3f0[4] = (RTCHitN)auVar180[4];
                      local_3f0[5] = (RTCHitN)auVar180[5];
                      local_3f0[6] = (RTCHitN)auVar180[6];
                      local_3f0[7] = (RTCHitN)auVar180[7];
                      local_3f0[8] = (RTCHitN)auVar180[8];
                      local_3f0[9] = (RTCHitN)auVar180[9];
                      local_3f0[10] = (RTCHitN)auVar180[10];
                      local_3f0[0xb] = (RTCHitN)auVar180[0xb];
                      local_3f0[0xc] = (RTCHitN)auVar180[0xc];
                      local_3f0[0xd] = (RTCHitN)auVar180[0xd];
                      local_3f0[0xe] = (RTCHitN)auVar180[0xe];
                      local_3f0[0xf] = (RTCHitN)auVar180[0xf];
                      local_3e0 = vshufps_avx(auVar206,auVar206,0x55);
                      auVar229 = ZEXT1664(local_3e0);
                      local_3d0 = vshufps_avx(auVar206,auVar206,0xaa);
                      fStack_3bc = local_3c0;
                      fStack_3b8 = local_3c0;
                      fStack_3b4 = local_3c0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      local_3a0 = local_140._0_8_;
                      uStack_398 = local_140._8_8_;
                      local_390 = local_1e0._0_8_;
                      uStack_388 = local_1e0._8_8_;
                      vcmpps_avx(auVar386._0_32_,auVar386._0_32_,0xf);
                      uStack_37c = (local_7f0.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_7f0.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_860 = local_780;
                      uStack_858 = uStack_778;
                      local_7f0.valid = (int *)&local_860;
                      local_7f0.geometryUserPtr = pGVar144->userPtr;
                      local_7f0.hit = local_3f0;
                      local_7f0.N = 4;
                      local_820 = (uint)uVar139;
                      uStack_81c = (undefined4)(uVar139 >> 0x20);
                      local_7f0.ray = (RTCRayN *)ray;
                      if (pGVar144->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar229 = ZEXT1664(local_3e0);
                        auVar252 = ZEXT464((uint)fVar343);
                        (*pGVar144->intersectionFilterN)(&local_7f0);
                        uVar139 = CONCAT44(uStack_81c,local_820);
                        auVar331 = ZEXT3264(local_4c0);
                        auVar386 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar144 = local_7c0;
                      }
                      auVar180 = auVar229._0_16_;
                      auVar117._8_8_ = uStack_858;
                      auVar117._0_8_ = local_860;
                      if (auVar117 == (undefined1  [16])0x0) {
                        auVar180 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar180 = auVar180 ^ _DAT_01febe20;
                        auVar301 = ZEXT3264(_local_740);
                      }
                      else {
                        p_Var20 = context->args->filter;
                        if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar144->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar252 = ZEXT1664(auVar252._0_16_);
                          (*p_Var20)(&local_7f0);
                          uVar139 = CONCAT44(uStack_81c,local_820);
                          auVar331 = ZEXT3264(local_4c0);
                          auVar386 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar144 = local_7c0;
                        }
                        auVar118._8_8_ = uStack_858;
                        auVar118._0_8_ = local_860;
                        auVar204 = vpcmpeqd_avx(auVar118,_DAT_01feba10);
                        auVar205 = vpcmpeqd_avx(auVar180,auVar180);
                        auVar229 = ZEXT1664(auVar205);
                        auVar180 = auVar204 ^ auVar205;
                        auVar301 = ZEXT3264(_local_740);
                        if (auVar118 != (undefined1  [16])0x0) {
                          auVar204 = auVar204 ^ auVar205;
                          auVar205 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])local_7f0.hit);
                          *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar205;
                          auVar205 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar205;
                          auVar205 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar205;
                          auVar205 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar205;
                          auVar205 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar205;
                          auVar205 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar205;
                          auVar205 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar205;
                          auVar205 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar205;
                          auVar204 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar204;
                        }
                      }
                      auVar182._8_8_ = 0x100000001;
                      auVar182._0_8_ = 0x100000001;
                      if ((auVar182 & auVar180) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_840._0_4_;
                      }
                      *(undefined4 *)(local_580 + uVar139 * 4) = 0;
                      uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar161._4_4_ = uVar13;
                      auVar161._0_4_ = uVar13;
                      auVar161._8_4_ = uVar13;
                      auVar161._12_4_ = uVar13;
                      auVar161._16_4_ = uVar13;
                      auVar161._20_4_ = uVar13;
                      auVar161._24_4_ = uVar13;
                      auVar161._28_4_ = uVar13;
                      auVar160 = vcmpps_avx(auVar331._0_32_,auVar161,2);
                      auVar163 = vandps_avx(auVar160,local_580);
                      auVar164 = ZEXT3264(auVar163);
                      local_580 = local_580 & auVar160;
                      bVar115 = (local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar116 = (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar114 = (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar113 = SUB321(local_580 >> 0x7f,0) != '\0';
                      bVar112 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar111 = SUB321(local_580 >> 0xbf,0) != '\0';
                      bVar110 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar109 = local_580[0x1f] < '\0';
                      if (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111)
                          || bVar110) || bVar109) {
                        auVar191._8_4_ = 0x7f800000;
                        auVar191._0_8_ = 0x7f8000007f800000;
                        auVar191._12_4_ = 0x7f800000;
                        auVar191._16_4_ = 0x7f800000;
                        auVar191._20_4_ = 0x7f800000;
                        auVar191._24_4_ = 0x7f800000;
                        auVar191._28_4_ = 0x7f800000;
                        auVar160 = vblendvps_avx(auVar191,auVar331._0_32_,auVar163);
                        auVar31 = vshufps_avx(auVar160,auVar160,0xb1);
                        auVar31 = vminps_avx(auVar160,auVar31);
                        auVar330 = vshufpd_avx(auVar31,auVar31,5);
                        auVar31 = vminps_avx(auVar31,auVar330);
                        auVar330 = vperm2f128_avx(auVar31,auVar31,1);
                        auVar229 = ZEXT3264(auVar330);
                        auVar31 = vminps_avx(auVar31,auVar330);
                        auVar160 = vcmpps_avx(auVar160,auVar31,0);
                        auVar31 = auVar163 & auVar160;
                        if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar31 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar31 >> 0x7f,0) != '\0') ||
                              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar31 >> 0xbf,0) != '\0') ||
                            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar31[0x1f] < '\0') {
                          auVar160 = vandps_avx(auVar160,auVar163);
                          auVar164 = ZEXT3264(auVar160);
                        }
                        uVar138 = vmovmskps_avx(auVar164._0_32_);
                        uVar21 = 0;
                        if (uVar138 != 0) {
                          for (; (uVar138 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                          }
                        }
                        uVar139 = (ulong)uVar21;
                      }
                      local_580 = auVar163;
                    } while (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) ||
                              bVar111) || bVar110) || bVar109);
                  }
                }
                fVar217 = (float)local_620._0_4_;
                fVar230 = (float)local_620._4_4_;
                fVar232 = fStack_618;
                fVar233 = fStack_614;
                fVar240 = fStack_610;
                fVar253 = fStack_60c;
                fVar256 = fStack_608;
                fVar258 = fStack_604;
              }
            }
          }
          lVar142 = lVar142 + 8;
          fVar242 = (float)local_5c0._0_4_;
          fVar255 = (float)local_5c0._4_4_;
          fVar257 = fStack_5b8;
          fVar259 = fStack_5b4;
          fVar338 = fStack_5b0;
          fVar231 = fStack_5ac;
          fVar343 = fStack_5a8;
          fVar235 = fStack_5a4;
        } while ((int)lVar142 < (int)uVar16);
      }
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar151._4_4_ = uVar13;
      auVar151._0_4_ = uVar13;
      auVar151._8_4_ = uVar13;
      auVar151._12_4_ = uVar13;
      auVar180 = vcmpps_avx(local_130,auVar151,2);
      uVar140 = vmovmskps_avx(auVar180);
      uVar137 = uVar137 & uVar137 + 0xf & uVar140;
    } while (uVar137 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }